

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

void embree::avx::CurveNiIntersectorK<8,4>::
     intersect_t<embree::avx::SweepCurve1IntersectorK<embree::BezierCurveT,4>,embree::avx::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  undefined4 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  Primitive PVar6;
  Geometry *pGVar7;
  RTCFilterFunctionN p_Var8;
  long lVar9;
  long lVar10;
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [16];
  float fVar17;
  float fVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  uint uVar74;
  uint uVar75;
  long lVar76;
  ulong uVar77;
  uint uVar78;
  uint uVar79;
  ulong uVar80;
  ulong uVar81;
  bool bVar82;
  float fVar83;
  float fVar114;
  float fVar116;
  __m128 a;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar89 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  float fVar120;
  float fVar121;
  float fVar122;
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  float fVar118;
  undefined1 auVar101 [32];
  float fVar84;
  undefined1 auVar102 [32];
  float fVar115;
  float fVar117;
  float fVar119;
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar113 [32];
  float fVar123;
  undefined8 extraout_XMM1_Qa;
  undefined8 extraout_XMM1_Qa_00;
  float fVar155;
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  float fVar154;
  float fVar156;
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  float fVar173;
  float fVar175;
  float fVar176;
  float fVar177;
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  float fVar174;
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar161 [16];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [28];
  float fVar220;
  float fVar221;
  undefined1 auVar210 [32];
  float fVar219;
  float fVar222;
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  float fVar257;
  float fVar258;
  float fVar259;
  undefined1 auVar261 [16];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  float fVar223;
  float fVar224;
  float fVar244;
  float fVar246;
  undefined1 auVar225 [16];
  float fVar248;
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [28];
  float fVar250;
  float fVar252;
  undefined1 auVar233 [32];
  float fVar245;
  float fVar247;
  float fVar249;
  float fVar251;
  float fVar253;
  float fVar254;
  float fVar255;
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  float fVar256;
  undefined1 auVar260 [16];
  float fVar275;
  float fVar276;
  float fVar279;
  float fVar280;
  float fVar283;
  float fVar284;
  float fVar287;
  float fVar288;
  float fVar291;
  float fVar292;
  float fVar295;
  float fVar296;
  float fVar298;
  undefined1 auVar269 [32];
  float fVar277;
  float fVar281;
  float fVar285;
  float fVar289;
  float fVar293;
  float fVar297;
  undefined1 auVar270 [32];
  undefined1 auVar271 [32];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [28];
  float fVar274;
  float fVar278;
  float fVar286;
  float fVar290;
  undefined1 auVar265 [32];
  undefined1 auVar266 [32];
  float fVar282;
  float fVar294;
  undefined1 auVar267 [32];
  undefined1 auVar268 [32];
  undefined1 auVar272 [32];
  undefined1 auVar273 [64];
  float fVar299;
  undefined1 auVar300 [16];
  float fVar310;
  float fVar311;
  float fVar313;
  float fVar314;
  float fVar315;
  undefined1 auVar301 [32];
  undefined1 auVar302 [32];
  undefined1 auVar303 [32];
  float fVar312;
  undefined1 auVar304 [32];
  undefined1 auVar305 [32];
  undefined1 auVar306 [32];
  undefined1 auVar307 [32];
  undefined1 auVar308 [32];
  undefined1 auVar309 [32];
  undefined1 auVar316 [16];
  float fVar322;
  float fVar323;
  undefined1 auVar317 [32];
  undefined1 auVar318 [32];
  undefined1 auVar319 [32];
  undefined1 auVar320 [32];
  undefined1 auVar321 [32];
  undefined1 auVar324 [32];
  undefined1 auVar325 [32];
  undefined1 auVar326 [32];
  undefined1 auVar327 [32];
  undefined1 auVar330 [32];
  float fVar328;
  undefined1 auVar331 [32];
  float fVar333;
  float fVar334;
  float fVar335;
  float fVar336;
  float fVar337;
  float fVar338;
  undefined1 auVar329 [32];
  undefined1 auVar332 [64];
  float fVar339;
  float fVar347;
  float fVar348;
  float fVar349;
  float fVar350;
  float fVar351;
  float fVar352;
  undefined1 auVar340 [32];
  undefined1 auVar341 [32];
  undefined1 auVar342 [32];
  undefined1 auVar343 [32];
  undefined1 auVar344 [32];
  undefined1 auVar345 [32];
  undefined1 auVar346 [64];
  undefined1 auVar354 [16];
  float fVar353;
  float fVar359;
  float fVar360;
  float fVar362;
  float fVar363;
  float fVar364;
  float in_register_0000151c;
  undefined1 auVar355 [32];
  float fVar361;
  float fVar365;
  undefined1 auVar356 [32];
  undefined1 auVar357 [32];
  undefined1 auVar358 [32];
  float fVar366;
  float fVar367;
  undefined1 auVar368 [16];
  float fVar371;
  float fVar373;
  float fVar377;
  float fVar379;
  float fVar381;
  undefined1 auVar369 [32];
  float fVar372;
  float fVar374;
  float fVar375;
  float fVar376;
  float fVar378;
  float fVar380;
  float fVar382;
  float fVar383;
  undefined1 auVar370 [32];
  undefined1 auVar384 [16];
  float in_register_0000159c;
  undefined1 auVar385 [32];
  undefined1 auVar386 [32];
  undefined1 auVar387 [64];
  float fVar389;
  undefined1 auVar388 [28];
  float in_register_000015dc;
  RTCFilterFunctionNArguments args;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  uint local_ca8;
  undefined1 local_c80 [8];
  float fStack_c78;
  float fStack_c74;
  float fStack_c70;
  float fStack_c6c;
  float fStack_c68;
  float local_b90;
  float fStack_b8c;
  float fStack_b88;
  float fStack_b84;
  float local_b80;
  float fStack_b7c;
  float fStack_b78;
  float fStack_b74;
  float local_b70;
  float fStack_b6c;
  float fStack_b68;
  float fStack_b64;
  float local_b60;
  float fStack_b5c;
  float fStack_b58;
  float fStack_b54;
  RTCFilterFunctionNArguments local_b50;
  undefined1 local_b20 [8];
  float fStack_b18;
  float fStack_b14;
  float fStack_b10;
  float fStack_b0c;
  float fStack_b08;
  undefined1 local_b00 [32];
  undefined1 local_ae0 [32];
  undefined1 local_ac0 [32];
  undefined1 (*local_a88) [16];
  undefined1 local_a80 [8];
  float fStack_a78;
  float fStack_a74;
  float fStack_a70;
  float fStack_a6c;
  float fStack_a68;
  float fStack_a64;
  undefined1 local_a60 [32];
  undefined1 local_a40 [32];
  undefined1 local_a20 [32];
  undefined1 local_a00 [16];
  undefined1 local_9f0 [8];
  float fStack_9e8;
  float fStack_9e4;
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  undefined1 local_8f0 [16];
  undefined1 local_8e0 [16];
  Primitive *local_8c8;
  ulong local_8c0;
  undefined1 auStack_8b8 [24];
  undefined1 local_8a0 [8];
  float fStack_898;
  float fStack_894;
  float fStack_890;
  float fStack_88c;
  float fStack_888;
  float fStack_884;
  undefined1 local_880 [8];
  float fStack_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  float fStack_864;
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [8];
  float fStack_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float fStack_808;
  float fStack_804;
  undefined1 local_800 [8];
  float fStack_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  float fStack_7e8;
  float fStack_7e4;
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [16];
  undefined1 local_7b0 [16];
  RTCHitN local_7a0 [16];
  undefined1 auStack_790 [16];
  undefined1 local_780 [16];
  undefined1 local_770 [16];
  undefined1 local_760 [16];
  undefined8 local_750;
  undefined8 uStack_748;
  undefined1 local_740 [16];
  uint local_730;
  uint uStack_72c;
  uint uStack_728;
  uint uStack_724;
  undefined1 auStack_720 [16];
  undefined1 local_700 [32];
  undefined1 local_6e0 [8];
  float fStack_6d8;
  float fStack_6d4;
  float fStack_6d0;
  float fStack_6cc;
  float fStack_6c8;
  float fStack_6c4;
  undefined1 local_6c0 [8];
  float fStack_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float fStack_6a8;
  undefined4 uStack_6a4;
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_610 [16];
  undefined1 local_600 [32];
  float local_5e0;
  float fStack_5dc;
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  float fStack_5c4;
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  float fStack_484;
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  float local_440;
  float fStack_43c;
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  float fStack_424;
  float local_420;
  float fStack_41c;
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  float fStack_404;
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [8];
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  undefined1 local_280 [8];
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  undefined1 local_260 [8];
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  undefined1 local_240 [8];
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  undefined1 local_220 [8];
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float local_1c0 [4];
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  float local_1a0 [4];
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  ulong uStack_140;
  uint auStack_138 [66];
  
  PVar6 = prim[1];
  uVar81 = (ulong)(byte)PVar6;
  fVar299 = *(float *)(prim + uVar81 * 0x19 + 0x12);
  auVar16 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar16 = vinsertps_avx(auVar16,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar126 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar126 = vinsertps_avx(auVar126,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar16 = vsubps_avx(auVar16,*(undefined1 (*) [16])(prim + uVar81 * 0x19 + 6));
  auVar124._0_4_ = fVar299 * auVar16._0_4_;
  auVar124._4_4_ = fVar299 * auVar16._4_4_;
  auVar124._8_4_ = fVar299 * auVar16._8_4_;
  auVar124._12_4_ = fVar299 * auVar16._12_4_;
  auVar225._0_4_ = fVar299 * auVar126._0_4_;
  auVar225._4_4_ = fVar299 * auVar126._4_4_;
  auVar225._8_4_ = fVar299 * auVar126._8_4_;
  auVar225._12_4_ = fVar299 * auVar126._12_4_;
  auVar16 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar81 * 4 + 6)));
  auVar126 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar81 * 4 + 10)));
  auVar96._16_16_ = auVar126;
  auVar96._0_16_ = auVar16;
  auVar16 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar81 * 5 + 6)));
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar126 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar81 * 5 + 10)));
  auVar162._16_16_ = auVar126;
  auVar162._0_16_ = auVar16;
  auVar108 = vcvtdq2ps_avx(auVar162);
  auVar16 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar81 * 6 + 6)));
  auVar126 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar81 * 6 + 10)));
  auVar192._16_16_ = auVar126;
  auVar192._0_16_ = auVar16;
  auVar16 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar81 * 0xb + 6)));
  auVar126 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar81 * 0xb + 10)));
  auVar11 = vcvtdq2ps_avx(auVar192);
  auVar193._16_16_ = auVar126;
  auVar193._0_16_ = auVar16;
  auVar12 = vcvtdq2ps_avx(auVar193);
  auVar16 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar81 * 0xc + 6)));
  auVar126 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar81 * 0xc + 10)));
  auVar265._16_16_ = auVar126;
  auVar265._0_16_ = auVar16;
  auVar16 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar81 * 0xd + 6)));
  auVar13 = vcvtdq2ps_avx(auVar265);
  auVar126 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar81 * 0xd + 10)));
  auVar301._16_16_ = auVar126;
  auVar301._0_16_ = auVar16;
  auVar14 = vcvtdq2ps_avx(auVar301);
  auVar16 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar81 * 0x12 + 6)));
  auVar126 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar81 * 0x12 + 10)));
  auVar302._16_16_ = auVar126;
  auVar302._0_16_ = auVar16;
  auVar16 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar81 * 0x13 + 6)));
  auVar126 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar81 * 0x13 + 10)));
  auVar212 = vcvtdq2ps_avx(auVar302);
  auVar324._16_16_ = auVar126;
  auVar324._0_16_ = auVar16;
  auVar15 = vcvtdq2ps_avx(auVar324);
  auVar16 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar81 * 0x14 + 6)));
  auVar126 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar81 * 0x14 + 10)));
  auVar329._16_16_ = auVar126;
  auVar329._0_16_ = auVar16;
  auVar213 = vcvtdq2ps_avx(auVar329);
  auVar16 = vshufps_avx(auVar225,auVar225,0);
  auVar126 = vshufps_avx(auVar225,auVar225,0x55);
  auVar19 = vshufps_avx(auVar225,auVar225,0xaa);
  fVar299 = auVar19._0_4_;
  fVar310 = auVar19._4_4_;
  fVar311 = auVar19._8_4_;
  fVar312 = auVar19._12_4_;
  fVar313 = auVar126._0_4_;
  fVar314 = auVar126._4_4_;
  fVar315 = auVar126._8_4_;
  fVar256 = auVar126._12_4_;
  fVar223 = auVar16._0_4_;
  fVar274 = auVar16._4_4_;
  fVar244 = auVar16._8_4_;
  fVar278 = auVar16._12_4_;
  auVar355._0_4_ = fVar223 * auVar96._0_4_ + fVar313 * auVar108._0_4_ + fVar299 * auVar11._0_4_;
  auVar355._4_4_ = fVar274 * auVar96._4_4_ + fVar314 * auVar108._4_4_ + fVar310 * auVar11._4_4_;
  auVar355._8_4_ = fVar244 * auVar96._8_4_ + fVar315 * auVar108._8_4_ + fVar311 * auVar11._8_4_;
  auVar355._12_4_ = fVar278 * auVar96._12_4_ + fVar256 * auVar108._12_4_ + fVar312 * auVar11._12_4_;
  auVar355._16_4_ = fVar223 * auVar96._16_4_ + fVar313 * auVar108._16_4_ + fVar299 * auVar11._16_4_;
  auVar355._20_4_ = fVar274 * auVar96._20_4_ + fVar314 * auVar108._20_4_ + fVar310 * auVar11._20_4_;
  auVar355._24_4_ = fVar244 * auVar96._24_4_ + fVar315 * auVar108._24_4_ + fVar311 * auVar11._24_4_;
  auVar355._28_4_ = fVar256 + in_register_000015dc + in_register_0000151c;
  auVar340._0_4_ = fVar223 * auVar12._0_4_ + fVar313 * auVar13._0_4_ + auVar14._0_4_ * fVar299;
  auVar340._4_4_ = fVar274 * auVar12._4_4_ + fVar314 * auVar13._4_4_ + auVar14._4_4_ * fVar310;
  auVar340._8_4_ = fVar244 * auVar12._8_4_ + fVar315 * auVar13._8_4_ + auVar14._8_4_ * fVar311;
  auVar340._12_4_ = fVar278 * auVar12._12_4_ + fVar256 * auVar13._12_4_ + auVar14._12_4_ * fVar312;
  auVar340._16_4_ = fVar223 * auVar12._16_4_ + fVar313 * auVar13._16_4_ + auVar14._16_4_ * fVar299;
  auVar340._20_4_ = fVar274 * auVar12._20_4_ + fVar314 * auVar13._20_4_ + auVar14._20_4_ * fVar310;
  auVar340._24_4_ = fVar244 * auVar12._24_4_ + fVar315 * auVar13._24_4_ + auVar14._24_4_ * fVar311;
  auVar340._28_4_ = fVar256 + in_register_000015dc + in_register_0000159c;
  auVar233._0_4_ = fVar223 * auVar212._0_4_ + fVar313 * auVar15._0_4_ + auVar213._0_4_ * fVar299;
  auVar233._4_4_ = fVar274 * auVar212._4_4_ + fVar314 * auVar15._4_4_ + auVar213._4_4_ * fVar310;
  auVar233._8_4_ = fVar244 * auVar212._8_4_ + fVar315 * auVar15._8_4_ + auVar213._8_4_ * fVar311;
  auVar233._12_4_ = fVar278 * auVar212._12_4_ + fVar256 * auVar15._12_4_ + auVar213._12_4_ * fVar312
  ;
  auVar233._16_4_ = fVar223 * auVar212._16_4_ + fVar313 * auVar15._16_4_ + auVar213._16_4_ * fVar299
  ;
  auVar233._20_4_ = fVar274 * auVar212._20_4_ + fVar314 * auVar15._20_4_ + auVar213._20_4_ * fVar310
  ;
  auVar233._24_4_ = fVar244 * auVar212._24_4_ + fVar315 * auVar15._24_4_ + auVar213._24_4_ * fVar311
  ;
  auVar233._28_4_ = fVar278 + fVar256 + fVar312;
  auVar16 = vshufps_avx(auVar124,auVar124,0);
  auVar126 = vshufps_avx(auVar124,auVar124,0x55);
  auVar19 = vshufps_avx(auVar124,auVar124,0xaa);
  fVar310 = auVar19._0_4_;
  fVar311 = auVar19._4_4_;
  fVar312 = auVar19._8_4_;
  fVar313 = auVar19._12_4_;
  fVar274 = auVar126._0_4_;
  fVar244 = auVar126._4_4_;
  fVar278 = auVar126._8_4_;
  fVar246 = auVar126._12_4_;
  fVar314 = auVar16._0_4_;
  fVar315 = auVar16._4_4_;
  fVar256 = auVar16._8_4_;
  fVar223 = auVar16._12_4_;
  fVar299 = auVar96._28_4_;
  auVar140._0_4_ = fVar314 * auVar96._0_4_ + fVar274 * auVar108._0_4_ + fVar310 * auVar11._0_4_;
  auVar140._4_4_ = fVar315 * auVar96._4_4_ + fVar244 * auVar108._4_4_ + fVar311 * auVar11._4_4_;
  auVar140._8_4_ = fVar256 * auVar96._8_4_ + fVar278 * auVar108._8_4_ + fVar312 * auVar11._8_4_;
  auVar140._12_4_ = fVar223 * auVar96._12_4_ + fVar246 * auVar108._12_4_ + fVar313 * auVar11._12_4_;
  auVar140._16_4_ = fVar314 * auVar96._16_4_ + fVar274 * auVar108._16_4_ + fVar310 * auVar11._16_4_;
  auVar140._20_4_ = fVar315 * auVar96._20_4_ + fVar244 * auVar108._20_4_ + fVar311 * auVar11._20_4_;
  auVar140._24_4_ = fVar256 * auVar96._24_4_ + fVar278 * auVar108._24_4_ + fVar312 * auVar11._24_4_;
  auVar140._28_4_ = fVar299 + auVar108._28_4_ + auVar11._28_4_;
  auVar210._0_4_ = fVar314 * auVar12._0_4_ + auVar14._0_4_ * fVar310 + fVar274 * auVar13._0_4_;
  auVar210._4_4_ = fVar315 * auVar12._4_4_ + auVar14._4_4_ * fVar311 + fVar244 * auVar13._4_4_;
  auVar210._8_4_ = fVar256 * auVar12._8_4_ + auVar14._8_4_ * fVar312 + fVar278 * auVar13._8_4_;
  auVar210._12_4_ = fVar223 * auVar12._12_4_ + auVar14._12_4_ * fVar313 + fVar246 * auVar13._12_4_;
  auVar210._16_4_ = fVar314 * auVar12._16_4_ + auVar14._16_4_ * fVar310 + fVar274 * auVar13._16_4_;
  auVar210._20_4_ = fVar315 * auVar12._20_4_ + auVar14._20_4_ * fVar311 + fVar244 * auVar13._20_4_;
  auVar210._24_4_ = fVar256 * auVar12._24_4_ + auVar14._24_4_ * fVar312 + fVar278 * auVar13._24_4_;
  auVar210._28_4_ = fVar299 + auVar14._28_4_ + auVar11._28_4_;
  auVar194._0_4_ = fVar314 * auVar212._0_4_ + fVar274 * auVar15._0_4_ + auVar213._0_4_ * fVar310;
  auVar194._4_4_ = fVar315 * auVar212._4_4_ + fVar244 * auVar15._4_4_ + auVar213._4_4_ * fVar311;
  auVar194._8_4_ = fVar256 * auVar212._8_4_ + fVar278 * auVar15._8_4_ + auVar213._8_4_ * fVar312;
  auVar194._12_4_ = fVar223 * auVar212._12_4_ + fVar246 * auVar15._12_4_ + auVar213._12_4_ * fVar313
  ;
  auVar194._16_4_ = fVar314 * auVar212._16_4_ + fVar274 * auVar15._16_4_ + auVar213._16_4_ * fVar310
  ;
  auVar194._20_4_ = fVar315 * auVar212._20_4_ + fVar244 * auVar15._20_4_ + auVar213._20_4_ * fVar311
  ;
  auVar194._24_4_ = fVar256 * auVar212._24_4_ + fVar278 * auVar15._24_4_ + auVar213._24_4_ * fVar312
  ;
  auVar194._28_4_ = fVar299 + auVar13._28_4_ + fVar313;
  auVar266._8_4_ = 0x7fffffff;
  auVar266._0_8_ = 0x7fffffff7fffffff;
  auVar266._12_4_ = 0x7fffffff;
  auVar266._16_4_ = 0x7fffffff;
  auVar266._20_4_ = 0x7fffffff;
  auVar266._24_4_ = 0x7fffffff;
  auVar266._28_4_ = 0x7fffffff;
  auVar303._8_4_ = 0x219392ef;
  auVar303._0_8_ = 0x219392ef219392ef;
  auVar303._12_4_ = 0x219392ef;
  auVar303._16_4_ = 0x219392ef;
  auVar303._20_4_ = 0x219392ef;
  auVar303._24_4_ = 0x219392ef;
  auVar303._28_4_ = 0x219392ef;
  auVar96 = vandps_avx(auVar355,auVar266);
  auVar96 = vcmpps_avx(auVar96,auVar303,1);
  auVar108 = vblendvps_avx(auVar355,auVar303,auVar96);
  auVar96 = vandps_avx(auVar340,auVar266);
  auVar96 = vcmpps_avx(auVar96,auVar303,1);
  auVar11 = vblendvps_avx(auVar340,auVar303,auVar96);
  auVar96 = vandps_avx(auVar233,auVar266);
  auVar96 = vcmpps_avx(auVar96,auVar303,1);
  auVar96 = vblendvps_avx(auVar233,auVar303,auVar96);
  auVar12 = vrcpps_avx(auVar108);
  fVar299 = auVar12._0_4_;
  fVar310 = auVar12._4_4_;
  auVar13._4_4_ = auVar108._4_4_ * fVar310;
  auVar13._0_4_ = auVar108._0_4_ * fVar299;
  fVar311 = auVar12._8_4_;
  auVar13._8_4_ = auVar108._8_4_ * fVar311;
  fVar312 = auVar12._12_4_;
  auVar13._12_4_ = auVar108._12_4_ * fVar312;
  fVar313 = auVar12._16_4_;
  auVar13._16_4_ = auVar108._16_4_ * fVar313;
  fVar314 = auVar12._20_4_;
  auVar13._20_4_ = auVar108._20_4_ * fVar314;
  fVar315 = auVar12._24_4_;
  auVar13._24_4_ = auVar108._24_4_ * fVar315;
  auVar13._28_4_ = auVar108._28_4_;
  auVar317._8_4_ = 0x3f800000;
  auVar317._0_8_ = 0x3f8000003f800000;
  auVar317._12_4_ = 0x3f800000;
  auVar317._16_4_ = 0x3f800000;
  auVar317._20_4_ = 0x3f800000;
  auVar317._24_4_ = 0x3f800000;
  auVar317._28_4_ = 0x3f800000;
  auVar108 = vsubps_avx(auVar317,auVar13);
  fVar299 = fVar299 + fVar299 * auVar108._0_4_;
  fVar310 = fVar310 + fVar310 * auVar108._4_4_;
  fVar311 = fVar311 + fVar311 * auVar108._8_4_;
  fVar312 = fVar312 + fVar312 * auVar108._12_4_;
  fVar313 = fVar313 + fVar313 * auVar108._16_4_;
  fVar314 = fVar314 + fVar314 * auVar108._20_4_;
  fVar315 = fVar315 + fVar315 * auVar108._24_4_;
  auVar108 = vrcpps_avx(auVar11);
  fVar256 = auVar108._0_4_;
  fVar274 = auVar108._4_4_;
  auVar12._4_4_ = fVar274 * auVar11._4_4_;
  auVar12._0_4_ = fVar256 * auVar11._0_4_;
  fVar278 = auVar108._8_4_;
  auVar12._8_4_ = fVar278 * auVar11._8_4_;
  fVar282 = auVar108._12_4_;
  auVar12._12_4_ = fVar282 * auVar11._12_4_;
  fVar286 = auVar108._16_4_;
  auVar12._16_4_ = fVar286 * auVar11._16_4_;
  fVar290 = auVar108._20_4_;
  auVar12._20_4_ = fVar290 * auVar11._20_4_;
  fVar294 = auVar108._24_4_;
  auVar12._24_4_ = fVar294 * auVar11._24_4_;
  auVar12._28_4_ = auVar11._28_4_;
  auVar11 = vsubps_avx(auVar317,auVar12);
  fVar256 = fVar256 + fVar256 * auVar11._0_4_;
  fVar274 = fVar274 + fVar274 * auVar11._4_4_;
  fVar278 = fVar278 + fVar278 * auVar11._8_4_;
  fVar282 = fVar282 + fVar282 * auVar11._12_4_;
  fVar286 = fVar286 + fVar286 * auVar11._16_4_;
  fVar290 = fVar290 + fVar290 * auVar11._20_4_;
  fVar294 = fVar294 + fVar294 * auVar11._24_4_;
  auVar108 = vrcpps_avx(auVar96);
  fVar223 = auVar108._0_4_;
  fVar244 = auVar108._4_4_;
  auVar14._4_4_ = fVar244 * auVar96._4_4_;
  auVar14._0_4_ = fVar223 * auVar96._0_4_;
  fVar246 = auVar108._8_4_;
  auVar14._8_4_ = fVar246 * auVar96._8_4_;
  fVar248 = auVar108._12_4_;
  auVar14._12_4_ = fVar248 * auVar96._12_4_;
  fVar250 = auVar108._16_4_;
  auVar14._16_4_ = fVar250 * auVar96._16_4_;
  fVar252 = auVar108._20_4_;
  auVar14._20_4_ = fVar252 * auVar96._20_4_;
  fVar254 = auVar108._24_4_;
  auVar14._24_4_ = fVar254 * auVar96._24_4_;
  auVar14._28_4_ = auVar11._28_4_;
  auVar96 = vsubps_avx(auVar317,auVar14);
  fVar223 = fVar223 + fVar223 * auVar96._0_4_;
  fVar244 = fVar244 + fVar244 * auVar96._4_4_;
  fVar246 = fVar246 + fVar246 * auVar96._8_4_;
  fVar248 = fVar248 + fVar248 * auVar96._12_4_;
  fVar250 = fVar250 + fVar250 * auVar96._16_4_;
  fVar252 = fVar252 + fVar252 * auVar96._20_4_;
  fVar254 = fVar254 + fVar254 * auVar96._24_4_;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar81 * 7 + 6);
  auVar16 = vpmovsxwd_avx(auVar16);
  auVar126._8_8_ = 0;
  auVar126._0_8_ = *(ulong *)(prim + uVar81 * 7 + 0xe);
  auVar126 = vpmovsxwd_avx(auVar126);
  auVar97._16_16_ = auVar126;
  auVar97._0_16_ = auVar16;
  auVar96 = vcvtdq2ps_avx(auVar97);
  auVar96 = vsubps_avx(auVar96,auVar140);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar81 * 9 + 6);
  auVar16 = vpmovsxwd_avx(auVar19);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = *(ulong *)(prim + uVar81 * 9 + 0xe);
  auVar126 = vpmovsxwd_avx(auVar2);
  auVar85._0_4_ = fVar299 * auVar96._0_4_;
  auVar85._4_4_ = fVar310 * auVar96._4_4_;
  auVar85._8_4_ = fVar311 * auVar96._8_4_;
  auVar85._12_4_ = fVar312 * auVar96._12_4_;
  auVar11._16_4_ = fVar313 * auVar96._16_4_;
  auVar11._0_16_ = auVar85;
  auVar11._20_4_ = fVar314 * auVar96._20_4_;
  auVar11._24_4_ = fVar315 * auVar96._24_4_;
  auVar11._28_4_ = auVar96._28_4_;
  auVar163._16_16_ = auVar126;
  auVar163._0_16_ = auVar16;
  auVar96 = vcvtdq2ps_avx(auVar163);
  auVar96 = vsubps_avx(auVar96,auVar140);
  auVar125._0_4_ = fVar299 * auVar96._0_4_;
  auVar125._4_4_ = fVar310 * auVar96._4_4_;
  auVar125._8_4_ = fVar311 * auVar96._8_4_;
  auVar125._12_4_ = fVar312 * auVar96._12_4_;
  auVar212._16_4_ = fVar313 * auVar96._16_4_;
  auVar212._0_16_ = auVar125;
  auVar212._20_4_ = fVar314 * auVar96._20_4_;
  auVar212._24_4_ = fVar315 * auVar96._24_4_;
  auVar212._28_4_ = auVar96._28_4_;
  auVar182._8_8_ = 0;
  auVar182._0_8_ = *(ulong *)(prim + uVar81 * 0xe + 6);
  auVar16 = vpmovsxwd_avx(auVar182);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = *(ulong *)(prim + uVar81 * 0xe + 0xe);
  auVar126 = vpmovsxwd_avx(auVar3);
  auVar164._16_16_ = auVar126;
  auVar164._0_16_ = auVar16;
  auVar96 = vcvtdq2ps_avx(auVar164);
  auVar96 = vsubps_avx(auVar96,auVar210);
  auVar94._0_4_ = fVar256 * auVar96._0_4_;
  auVar94._4_4_ = fVar274 * auVar96._4_4_;
  auVar94._8_4_ = fVar278 * auVar96._8_4_;
  auVar94._12_4_ = fVar282 * auVar96._12_4_;
  auVar15._16_4_ = fVar286 * auVar96._16_4_;
  auVar15._0_16_ = auVar94;
  auVar15._20_4_ = fVar290 * auVar96._20_4_;
  auVar15._24_4_ = fVar294 * auVar96._24_4_;
  auVar15._28_4_ = auVar96._28_4_;
  auVar261._8_8_ = 0;
  auVar261._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar6 * 0x10 + 6);
  auVar16 = vpmovsxwd_avx(auVar261);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar6 * 0x10 + 0xe);
  auVar126 = vpmovsxwd_avx(auVar4);
  auVar304._16_16_ = auVar126;
  auVar304._0_16_ = auVar16;
  auVar96 = vcvtdq2ps_avx(auVar304);
  auVar96 = vsubps_avx(auVar96,auVar210);
  auVar200._0_4_ = fVar256 * auVar96._0_4_;
  auVar200._4_4_ = fVar274 * auVar96._4_4_;
  auVar200._8_4_ = fVar278 * auVar96._8_4_;
  auVar200._12_4_ = fVar282 * auVar96._12_4_;
  auVar213._16_4_ = fVar286 * auVar96._16_4_;
  auVar213._0_16_ = auVar200;
  auVar213._20_4_ = fVar290 * auVar96._20_4_;
  auVar213._24_4_ = fVar294 * auVar96._24_4_;
  auVar213._28_4_ = auVar96._28_4_;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + uVar81 * 0x15 + 6);
  auVar16 = vpmovsxwd_avx(auVar5);
  auVar185._8_8_ = 0;
  auVar185._0_8_ = *(ulong *)(prim + uVar81 * 0x15 + 0xe);
  auVar126 = vpmovsxwd_avx(auVar185);
  auVar267._16_16_ = auVar126;
  auVar267._0_16_ = auVar16;
  auVar96 = vcvtdq2ps_avx(auVar267);
  auVar96 = vsubps_avx(auVar96,auVar194);
  auVar260._0_4_ = fVar223 * auVar96._0_4_;
  auVar260._4_4_ = fVar244 * auVar96._4_4_;
  auVar260._8_4_ = fVar246 * auVar96._8_4_;
  auVar260._12_4_ = fVar248 * auVar96._12_4_;
  auVar20._16_4_ = fVar250 * auVar96._16_4_;
  auVar20._0_16_ = auVar260;
  auVar20._20_4_ = fVar252 * auVar96._20_4_;
  auVar20._24_4_ = fVar254 * auVar96._24_4_;
  auVar20._28_4_ = auVar96._28_4_;
  auVar88._8_8_ = 0;
  auVar88._0_8_ = *(ulong *)(prim + uVar81 * 0x17 + 6);
  auVar16 = vpmovsxwd_avx(auVar88);
  auVar157._8_8_ = 0;
  auVar157._0_8_ = *(ulong *)(prim + uVar81 * 0x17 + 0xe);
  auVar126 = vpmovsxwd_avx(auVar157);
  auVar305._16_16_ = auVar126;
  auVar305._0_16_ = auVar16;
  auVar96 = vcvtdq2ps_avx(auVar305);
  auVar96 = vsubps_avx(auVar96,auVar194);
  auVar90._0_4_ = fVar223 * auVar96._0_4_;
  auVar90._4_4_ = fVar244 * auVar96._4_4_;
  auVar90._8_4_ = fVar246 * auVar96._8_4_;
  auVar90._12_4_ = fVar248 * auVar96._12_4_;
  auVar21._16_4_ = fVar250 * auVar96._16_4_;
  auVar21._0_16_ = auVar90;
  auVar21._20_4_ = fVar252 * auVar96._20_4_;
  auVar21._24_4_ = fVar254 * auVar96._24_4_;
  auVar21._28_4_ = auVar96._28_4_;
  auVar16 = vpminsd_avx(auVar11._16_16_,auVar212._16_16_);
  auVar126 = vpminsd_avx(auVar85,auVar125);
  auVar318._16_16_ = auVar16;
  auVar318._0_16_ = auVar126;
  auVar16 = vpminsd_avx(auVar15._16_16_,auVar213._16_16_);
  auVar126 = vpminsd_avx(auVar94,auVar200);
  auVar325._16_16_ = auVar16;
  auVar325._0_16_ = auVar126;
  auVar96 = vmaxps_avx(auVar318,auVar325);
  auVar16 = vpminsd_avx(auVar20._16_16_,auVar21._16_16_);
  auVar126 = vpminsd_avx(auVar260,auVar90);
  auVar369._16_16_ = auVar16;
  auVar369._0_16_ = auVar126;
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar385._4_4_ = uVar1;
  auVar385._0_4_ = uVar1;
  auVar385._8_4_ = uVar1;
  auVar385._12_4_ = uVar1;
  auVar385._16_4_ = uVar1;
  auVar385._20_4_ = uVar1;
  auVar385._24_4_ = uVar1;
  auVar385._28_4_ = uVar1;
  auVar108 = vmaxps_avx(auVar369,auVar385);
  auVar96 = vmaxps_avx(auVar96,auVar108);
  local_400._4_4_ = auVar96._4_4_ * 0.99999964;
  local_400._0_4_ = auVar96._0_4_ * 0.99999964;
  local_400._8_4_ = auVar96._8_4_ * 0.99999964;
  local_400._12_4_ = auVar96._12_4_ * 0.99999964;
  local_400._16_4_ = auVar96._16_4_ * 0.99999964;
  local_400._20_4_ = auVar96._20_4_ * 0.99999964;
  local_400._24_4_ = auVar96._24_4_ * 0.99999964;
  local_400._28_4_ = auVar96._28_4_;
  auVar16 = vpmaxsd_avx(auVar11._16_16_,auVar212._16_16_);
  auVar126 = vpmaxsd_avx(auVar85,auVar125);
  auVar98._16_16_ = auVar16;
  auVar98._0_16_ = auVar126;
  auVar16 = vpmaxsd_avx(auVar15._16_16_,auVar213._16_16_);
  auVar126 = vpmaxsd_avx(auVar94,auVar200);
  auVar141._16_16_ = auVar16;
  auVar141._0_16_ = auVar126;
  auVar96 = vminps_avx(auVar98,auVar141);
  auVar16 = vpmaxsd_avx(auVar20._16_16_,auVar21._16_16_);
  auVar126 = vpmaxsd_avx(auVar260,auVar90);
  auVar142._16_16_ = auVar16;
  auVar142._0_16_ = auVar126;
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar165._4_4_ = uVar1;
  auVar165._0_4_ = uVar1;
  auVar165._8_4_ = uVar1;
  auVar165._12_4_ = uVar1;
  auVar165._16_4_ = uVar1;
  auVar165._20_4_ = uVar1;
  auVar165._24_4_ = uVar1;
  auVar165._28_4_ = uVar1;
  auVar108 = vminps_avx(auVar142,auVar165);
  auVar96 = vminps_avx(auVar96,auVar108);
  auVar108._4_4_ = auVar96._4_4_ * 1.0000004;
  auVar108._0_4_ = auVar96._0_4_ * 1.0000004;
  auVar108._8_4_ = auVar96._8_4_ * 1.0000004;
  auVar108._12_4_ = auVar96._12_4_ * 1.0000004;
  auVar108._16_4_ = auVar96._16_4_ * 1.0000004;
  auVar108._20_4_ = auVar96._20_4_ * 1.0000004;
  auVar108._24_4_ = auVar96._24_4_ * 1.0000004;
  auVar108._28_4_ = auVar96._28_4_;
  auVar96 = vcmpps_avx(local_400,auVar108,2);
  auVar16 = vpshufd_avx(ZEXT116((byte)PVar6),0);
  auVar143._16_16_ = auVar16;
  auVar143._0_16_ = auVar16;
  auVar108 = vcvtdq2ps_avx(auVar143);
  auVar108 = vcmpps_avx(_DAT_01f7b060,auVar108,1);
  auVar96 = vandps_avx(auVar96,auVar108);
  uVar74 = vmovmskps_avx(auVar96);
  auVar99._16_16_ = mm_lookupmask_ps._240_16_;
  auVar99._0_16_ = mm_lookupmask_ps._240_16_;
  local_520 = vblendps_avx(auVar99,ZEXT832(0) << 0x20,0x80);
  local_a88 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  local_8c8 = prim;
LAB_00a324e5:
  uVar81 = (ulong)uVar74;
  if (uVar81 == 0) {
    return;
  }
  lVar76 = 0;
  if (uVar81 != 0) {
    for (; (uVar74 >> lVar76 & 1) == 0; lVar76 = lVar76 + 1) {
    }
  }
  uVar81 = uVar81 - 1 & uVar81;
  uVar74 = *(uint *)(local_8c8 + 2);
  local_8c0 = (ulong)*(uint *)(local_8c8 + lVar76 * 4 + 6);
  pGVar7 = (context->scene->geometries).items[uVar74].ptr;
  uVar80 = (ulong)*(uint *)(*(long *)&pGVar7->field_0x58 +
                           pGVar7[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * local_8c0);
  p_Var8 = pGVar7[1].intersectionFilterN;
  lVar9 = *(long *)&pGVar7[1].time_range.upper;
  auVar16 = *(undefined1 (*) [16])(lVar9 + (long)p_Var8 * uVar80);
  auVar126 = *(undefined1 (*) [16])(lVar9 + (uVar80 + 1) * (long)p_Var8);
  auVar19 = *(undefined1 (*) [16])(lVar9 + (uVar80 + 2) * (long)p_Var8);
  lVar10 = 0;
  if (uVar81 != 0) {
    for (; (uVar81 >> lVar10 & 1) == 0; lVar10 = lVar10 + 1) {
    }
  }
  auVar2 = *(undefined1 (*) [16])(lVar9 + (uVar80 + 3) * (long)p_Var8);
  if (((uVar81 != 0) && (uVar80 = uVar81 - 1 & uVar81, uVar80 != 0)) && (lVar9 = 0, uVar80 != 0)) {
    for (; (uVar80 >> lVar9 & 1) == 0; lVar9 = lVar9 + 1) {
    }
  }
  auVar182 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x1c);
  auVar3 = vinsertps_avx(auVar182,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  fVar299 = *(float *)(ray + k * 4 + 0x40);
  auVar354._4_4_ = fVar299;
  auVar354._0_4_ = fVar299;
  auVar354._8_4_ = fVar299;
  auVar354._12_4_ = fVar299;
  fStack_a70 = fVar299;
  _local_a80 = auVar354;
  fStack_a6c = fVar299;
  fStack_a68 = fVar299;
  fStack_a64 = fVar299;
  fVar310 = *(float *)(ray + k * 4 + 0x50);
  auVar368._4_4_ = fVar310;
  auVar368._0_4_ = fVar310;
  auVar368._8_4_ = fVar310;
  auVar368._12_4_ = fVar310;
  fStack_6d0 = fVar310;
  _local_6e0 = auVar368;
  fStack_6cc = fVar310;
  fStack_6c8 = fVar310;
  fStack_6c4 = fVar310;
  auVar182 = vunpcklps_avx(auVar354,auVar368);
  fVar311 = *(float *)(ray + k * 4 + 0x60);
  auVar384._4_4_ = fVar311;
  auVar384._0_4_ = fVar311;
  auVar384._8_4_ = fVar311;
  auVar384._12_4_ = fVar311;
  fStack_870 = fVar311;
  _local_880 = auVar384;
  fStack_86c = fVar311;
  fStack_868 = fVar311;
  fStack_864 = fVar311;
  _local_9f0 = vinsertps_avx(auVar182,auVar384,0x28);
  auVar86._0_4_ = (auVar16._0_4_ + auVar126._0_4_ + auVar19._0_4_ + auVar2._0_4_) * 0.25;
  auVar86._4_4_ = (auVar16._4_4_ + auVar126._4_4_ + auVar19._4_4_ + auVar2._4_4_) * 0.25;
  auVar86._8_4_ = (auVar16._8_4_ + auVar126._8_4_ + auVar19._8_4_ + auVar2._8_4_) * 0.25;
  auVar86._12_4_ = (auVar16._12_4_ + auVar126._12_4_ + auVar19._12_4_ + auVar2._12_4_) * 0.25;
  auVar182 = vsubps_avx(auVar86,auVar3);
  auVar182 = vdpps_avx(auVar182,_local_9f0,0x7f);
  local_a00 = vdpps_avx(_local_9f0,_local_9f0,0x7f);
  auVar261 = vrcpss_avx(local_a00,local_a00);
  fVar312 = auVar182._0_4_ * auVar261._0_4_ * (2.0 - local_a00._0_4_ * auVar261._0_4_);
  auVar261 = vshufps_avx(ZEXT416((uint)fVar312),ZEXT416((uint)fVar312),0);
  auVar226._0_4_ = auVar3._0_4_ + local_9f0._0_4_ * auVar261._0_4_;
  auVar226._4_4_ = auVar3._4_4_ + local_9f0._4_4_ * auVar261._4_4_;
  auVar226._8_4_ = auVar3._8_4_ + local_9f0._8_4_ * auVar261._8_4_;
  auVar226._12_4_ = auVar3._12_4_ + local_9f0._12_4_ * auVar261._12_4_;
  auVar182 = vblendps_avx(auVar226,_DAT_01f45a50,8);
  auVar3 = vsubps_avx(auVar16,auVar182);
  auVar4 = vsubps_avx(auVar19,auVar182);
  auVar5 = vsubps_avx(auVar126,auVar182);
  auVar2 = vsubps_avx(auVar2,auVar182);
  auVar16 = vshufps_avx(auVar3,auVar3,0);
  register0x00001250 = auVar16;
  _local_1e0 = auVar16;
  auVar16 = vshufps_avx(auVar3,auVar3,0x55);
  local_a20._16_16_ = auVar16;
  local_a20._0_16_ = auVar16;
  auVar16 = vshufps_avx(auVar3,auVar3,0xaa);
  local_380._16_16_ = auVar16;
  local_380._0_16_ = auVar16;
  auVar16 = vshufps_avx(auVar3,auVar3,0xff);
  auVar126 = vshufps_avx(auVar5,auVar5,0);
  auVar268._16_16_ = auVar126;
  auVar268._0_16_ = auVar126;
  auVar126 = vshufps_avx(auVar5,auVar5,0x55);
  local_960._16_16_ = auVar126;
  local_960._0_16_ = auVar126;
  auVar126 = vshufps_avx(auVar5,auVar5,0xaa);
  auVar345._16_16_ = auVar126;
  auVar345._0_16_ = auVar126;
  auVar126 = vshufps_avx(auVar5,auVar5,0xff);
  local_9a0._16_16_ = auVar126;
  local_9a0._0_16_ = auVar126;
  auVar126 = vshufps_avx(auVar4,auVar4,0);
  local_3a0._16_16_ = auVar126;
  local_3a0._0_16_ = auVar126;
  auVar126 = vshufps_avx(auVar4,auVar4,0x55);
  local_3c0._16_16_ = auVar126;
  local_3c0._0_16_ = auVar126;
  auVar126 = vshufps_avx(auVar4,auVar4,0xaa);
  register0x00001290 = auVar126;
  _local_200 = auVar126;
  auVar126 = vshufps_avx(auVar4,auVar4,0xff);
  register0x00001290 = auVar126;
  _local_220 = auVar126;
  auVar126 = vshufps_avx(auVar2,auVar2,0);
  register0x00001290 = auVar126;
  _local_240 = auVar126;
  auVar126 = vshufps_avx(auVar2,auVar2,0x55);
  register0x00001290 = auVar126;
  _local_260 = auVar126;
  auVar126 = vshufps_avx(auVar2,auVar2,0xaa);
  register0x00001290 = auVar126;
  _local_280 = auVar126;
  auVar126 = vshufps_avx(auVar2,auVar2,0xff);
  register0x00001290 = auVar126;
  _local_2a0 = auVar126;
  auVar126 = ZEXT416((uint)(fVar299 * fVar299 + fVar310 * fVar310 + fVar311 * fVar311));
  auVar126 = vshufps_avx(auVar126,auVar126,0);
  local_2c0._16_16_ = auVar126;
  local_2c0._0_16_ = auVar126;
  fVar299 = *(float *)(ray + k * 4 + 0x30);
  local_8f0 = ZEXT416((uint)fVar312);
  auVar387 = ZEXT3264(local_960);
  auVar126 = vshufps_avx(ZEXT416((uint)(fVar299 - fVar312)),ZEXT416((uint)(fVar299 - fVar312)),0);
  local_3e0._16_16_ = auVar126;
  local_3e0._0_16_ = auVar126;
  local_7b0 = vpshufd_avx(ZEXT416(uVar74),0);
  local_7c0 = vpshufd_avx(ZEXT416(*(uint *)(local_8c8 + lVar76 * 4 + 6)),0);
  register0x00001210 = auVar261;
  _local_8a0 = auVar261;
  uVar80 = 0;
  local_ca8 = 1;
  auVar100._8_4_ = 0x7fffffff;
  auVar100._0_8_ = 0x7fffffff7fffffff;
  auVar100._12_4_ = 0x7fffffff;
  auVar100._16_4_ = 0x7fffffff;
  auVar100._20_4_ = 0x7fffffff;
  auVar100._24_4_ = 0x7fffffff;
  auVar100._28_4_ = 0x7fffffff;
  local_5c0 = vandps_avx(local_2c0,auVar100);
  auVar126 = vsqrtss_avx(local_a00,local_a00);
  auVar19 = vsqrtss_avx(local_a00,local_a00);
  auVar332 = ZEXT3264(local_a20);
  auVar273 = ZEXT3264(local_9a0);
  local_610 = ZEXT816(0x3f80000000000000);
  local_5a0 = auVar268;
  local_b00 = auVar345;
  do {
    auVar195._8_4_ = 0x3f800000;
    auVar195._0_8_ = 0x3f8000003f800000;
    auVar195._12_4_ = 0x3f800000;
    auVar195._16_4_ = 0x3f800000;
    auVar195._20_4_ = 0x3f800000;
    auVar195._24_4_ = 0x3f800000;
    auVar195._28_4_ = 0x3f800000;
    auVar182 = vmovshdup_avx(local_610);
    auVar185 = vsubps_avx(auVar182,local_610);
    auVar182 = vshufps_avx(local_610,local_610,0);
    auVar261 = vshufps_avx(auVar185,auVar185,0);
    fVar123 = auVar261._0_4_;
    fVar154 = auVar261._4_4_;
    fVar155 = auVar261._8_4_;
    fVar156 = auVar261._12_4_;
    fVar83 = auVar182._0_4_;
    auVar144._0_4_ = fVar83 + fVar123 * 0.0;
    fVar114 = auVar182._4_4_;
    auVar144._4_4_ = fVar114 + fVar154 * 0.14285715;
    fVar116 = auVar182._8_4_;
    auVar144._8_4_ = fVar116 + fVar155 * 0.2857143;
    fVar118 = auVar182._12_4_;
    auVar144._12_4_ = fVar118 + fVar156 * 0.42857146;
    auVar144._16_4_ = fVar83 + fVar123 * 0.5714286;
    auVar144._20_4_ = fVar114 + fVar154 * 0.71428573;
    auVar144._24_4_ = fVar116 + fVar155 * 0.8571429;
    auVar144._28_4_ = fVar118 + fVar156;
    auVar96 = vsubps_avx(auVar195,auVar144);
    fVar310 = auVar268._28_4_;
    fVar312 = auVar96._0_4_;
    fVar313 = auVar96._4_4_;
    fVar314 = auVar96._8_4_;
    fVar315 = auVar96._12_4_;
    fVar256 = auVar96._16_4_;
    fVar223 = auVar96._20_4_;
    fVar274 = auVar96._24_4_;
    fVar290 = auVar273._28_4_ + fVar310 + auVar345._28_4_ + 1.0 + 1.0;
    fVar311 = local_380._28_4_;
    fVar257 = local_3a0._0_4_ * auVar144._0_4_ + auVar268._0_4_ * fVar312;
    fVar275 = local_3a0._4_4_ * auVar144._4_4_ + auVar268._4_4_ * fVar313;
    fVar279 = local_3a0._8_4_ * auVar144._8_4_ + auVar268._8_4_ * fVar314;
    fVar283 = local_3a0._12_4_ * auVar144._12_4_ + auVar268._12_4_ * fVar315;
    fVar287 = local_3a0._16_4_ * auVar144._16_4_ + auVar268._16_4_ * fVar256;
    fVar291 = local_3a0._20_4_ * auVar144._20_4_ + auVar268._20_4_ * fVar223;
    fVar295 = local_3a0._24_4_ * auVar144._24_4_ + auVar268._24_4_ * fVar274;
    fVar244 = local_3c0._0_4_ * auVar144._0_4_ + auVar387._0_4_ * fVar312;
    fVar278 = local_3c0._4_4_ * auVar144._4_4_ + auVar387._4_4_ * fVar313;
    fVar246 = local_3c0._8_4_ * auVar144._8_4_ + auVar387._8_4_ * fVar314;
    fVar282 = local_3c0._12_4_ * auVar144._12_4_ + auVar387._12_4_ * fVar315;
    fVar248 = local_3c0._16_4_ * auVar144._16_4_ + auVar387._16_4_ * fVar256;
    fVar286 = local_3c0._20_4_ * auVar144._20_4_ + auVar387._20_4_ * fVar223;
    fVar250 = local_3c0._24_4_ * auVar144._24_4_ + auVar387._24_4_ * fVar274;
    fVar252 = (float)local_200._0_4_ * auVar144._0_4_ + auVar345._0_4_ * fVar312;
    fVar294 = (float)local_200._4_4_ * auVar144._4_4_ + auVar345._4_4_ * fVar313;
    fVar254 = fStack_1f8 * auVar144._8_4_ + auVar345._8_4_ * fVar314;
    fVar219 = fStack_1f4 * auVar144._12_4_ + auVar345._12_4_ * fVar315;
    fVar220 = fStack_1f0 * auVar144._16_4_ + auVar345._16_4_ * fVar256;
    fVar221 = fStack_1ec * auVar144._20_4_ + auVar345._20_4_ * fVar223;
    fVar222 = fStack_1e8 * auVar144._24_4_ + auVar345._24_4_ * fVar274;
    fVar224 = (float)local_220._0_4_ * auVar144._0_4_ + auVar273._0_4_ * fVar312;
    fVar245 = (float)local_220._4_4_ * auVar144._4_4_ + auVar273._4_4_ * fVar313;
    fVar247 = fStack_218 * auVar144._8_4_ + auVar273._8_4_ * fVar314;
    fVar249 = fStack_214 * auVar144._12_4_ + auVar273._12_4_ * fVar315;
    fVar251 = fStack_210 * auVar144._16_4_ + auVar273._16_4_ * fVar256;
    fVar253 = fStack_20c * auVar144._20_4_ + auVar273._20_4_ * fVar223;
    fVar255 = fStack_208 * auVar144._24_4_ + auVar273._24_4_ * fVar274;
    fVar383 = fVar311 + fVar310;
    fVar365 = auVar16._12_4_ + fVar311;
    auVar319._0_4_ =
         fVar312 * (auVar268._0_4_ * auVar144._0_4_ + fVar312 * (float)local_1e0._0_4_) +
         auVar144._0_4_ * fVar257;
    auVar319._4_4_ =
         fVar313 * (auVar268._4_4_ * auVar144._4_4_ + fVar313 * (float)local_1e0._4_4_) +
         auVar144._4_4_ * fVar275;
    auVar319._8_4_ =
         fVar314 * (auVar268._8_4_ * auVar144._8_4_ + fVar314 * fStack_1d8) +
         auVar144._8_4_ * fVar279;
    auVar319._12_4_ =
         fVar315 * (auVar268._12_4_ * auVar144._12_4_ + fVar315 * fStack_1d4) +
         auVar144._12_4_ * fVar283;
    auVar319._16_4_ =
         fVar256 * (auVar268._16_4_ * auVar144._16_4_ + fVar256 * fStack_1d0) +
         auVar144._16_4_ * fVar287;
    auVar319._20_4_ =
         fVar223 * (auVar268._20_4_ * auVar144._20_4_ + fVar223 * fStack_1cc) +
         auVar144._20_4_ * fVar291;
    auVar319._24_4_ =
         fVar274 * (auVar268._24_4_ * auVar144._24_4_ + fVar274 * fStack_1c8) +
         auVar144._24_4_ * fVar295;
    auVar319._28_4_ = local_3a0._28_4_ + fVar311;
    auVar330._0_4_ =
         fVar312 * (auVar387._0_4_ * auVar144._0_4_ + auVar332._0_4_ * fVar312) +
         auVar144._0_4_ * fVar244;
    auVar330._4_4_ =
         fVar313 * (auVar387._4_4_ * auVar144._4_4_ + auVar332._4_4_ * fVar313) +
         auVar144._4_4_ * fVar278;
    auVar330._8_4_ =
         fVar314 * (auVar387._8_4_ * auVar144._8_4_ + auVar332._8_4_ * fVar314) +
         auVar144._8_4_ * fVar246;
    auVar330._12_4_ =
         fVar315 * (auVar387._12_4_ * auVar144._12_4_ + auVar332._12_4_ * fVar315) +
         auVar144._12_4_ * fVar282;
    auVar330._16_4_ =
         fVar256 * (auVar387._16_4_ * auVar144._16_4_ + auVar332._16_4_ * fVar256) +
         auVar144._16_4_ * fVar248;
    auVar330._20_4_ =
         fVar223 * (auVar387._20_4_ * auVar144._20_4_ + auVar332._20_4_ * fVar223) +
         auVar144._20_4_ * fVar286;
    auVar330._24_4_ =
         fVar274 * (auVar387._24_4_ * auVar144._24_4_ + auVar332._24_4_ * fVar274) +
         auVar144._24_4_ * fVar250;
    auVar330._28_4_ = local_3c0._28_4_ + fVar311;
    auVar341._0_4_ =
         fVar312 * (auVar345._0_4_ * auVar144._0_4_ + local_380._0_4_ * fVar312) +
         auVar144._0_4_ * fVar252;
    auVar341._4_4_ =
         fVar313 * (auVar345._4_4_ * auVar144._4_4_ + local_380._4_4_ * fVar313) +
         auVar144._4_4_ * fVar294;
    auVar341._8_4_ =
         fVar314 * (auVar345._8_4_ * auVar144._8_4_ + local_380._8_4_ * fVar314) +
         auVar144._8_4_ * fVar254;
    auVar341._12_4_ =
         fVar315 * (auVar345._12_4_ * auVar144._12_4_ + local_380._12_4_ * fVar315) +
         auVar144._12_4_ * fVar219;
    auVar341._16_4_ =
         fVar256 * (auVar345._16_4_ * auVar144._16_4_ + local_380._16_4_ * fVar256) +
         auVar144._16_4_ * fVar220;
    auVar341._20_4_ =
         fVar223 * (auVar345._20_4_ * auVar144._20_4_ + local_380._20_4_ * fVar223) +
         auVar144._20_4_ * fVar221;
    auVar341._24_4_ =
         fVar274 * (auVar345._24_4_ * auVar144._24_4_ + local_380._24_4_ * fVar274) +
         auVar144._24_4_ * fVar222;
    auVar341._28_4_ = fStack_1e4 + fVar311;
    auVar306._0_4_ =
         auVar144._0_4_ * fVar224 +
         fVar312 * (auVar273._0_4_ * auVar144._0_4_ + auVar16._0_4_ * fVar312);
    auVar306._4_4_ =
         auVar144._4_4_ * fVar245 +
         fVar313 * (auVar273._4_4_ * auVar144._4_4_ + auVar16._4_4_ * fVar313);
    auVar306._8_4_ =
         auVar144._8_4_ * fVar247 +
         fVar314 * (auVar273._8_4_ * auVar144._8_4_ + auVar16._8_4_ * fVar314);
    auVar306._12_4_ =
         auVar144._12_4_ * fVar249 +
         fVar315 * (auVar273._12_4_ * auVar144._12_4_ + auVar16._12_4_ * fVar315);
    auVar306._16_4_ =
         auVar144._16_4_ * fVar251 +
         fVar256 * (auVar273._16_4_ * auVar144._16_4_ + auVar16._0_4_ * fVar256);
    auVar306._20_4_ =
         auVar144._20_4_ * fVar253 +
         fVar223 * (auVar273._20_4_ * auVar144._20_4_ + auVar16._4_4_ * fVar223);
    auVar306._24_4_ =
         auVar144._24_4_ * fVar255 +
         fVar274 * (auVar273._24_4_ * auVar144._24_4_ + auVar16._8_4_ * fVar274);
    auVar306._28_4_ = fStack_1e4 + fStack_204;
    auVar101._0_4_ =
         (auVar144._0_4_ * (float)local_240._0_4_ + local_3a0._0_4_ * fVar312) * auVar144._0_4_ +
         fVar312 * fVar257;
    auVar101._4_4_ =
         (auVar144._4_4_ * (float)local_240._4_4_ + local_3a0._4_4_ * fVar313) * auVar144._4_4_ +
         fVar313 * fVar275;
    auVar101._8_4_ =
         (auVar144._8_4_ * fStack_238 + local_3a0._8_4_ * fVar314) * auVar144._8_4_ +
         fVar314 * fVar279;
    auVar101._12_4_ =
         (auVar144._12_4_ * fStack_234 + local_3a0._12_4_ * fVar315) * auVar144._12_4_ +
         fVar315 * fVar283;
    auVar101._16_4_ =
         (auVar144._16_4_ * fStack_230 + local_3a0._16_4_ * fVar256) * auVar144._16_4_ +
         fVar256 * fVar287;
    auVar101._20_4_ =
         (auVar144._20_4_ * fStack_22c + local_3a0._20_4_ * fVar223) * auVar144._20_4_ +
         fVar223 * fVar291;
    auVar101._24_4_ =
         (auVar144._24_4_ * fStack_228 + local_3a0._24_4_ * fVar274) * auVar144._24_4_ +
         fVar274 * fVar295;
    auVar101._28_4_ = fStack_1e4 + fVar290 + auVar273._28_4_;
    auVar196._0_4_ =
         (auVar144._0_4_ * (float)local_260._0_4_ + local_3c0._0_4_ * fVar312) * auVar144._0_4_ +
         fVar312 * fVar244;
    auVar196._4_4_ =
         (auVar144._4_4_ * (float)local_260._4_4_ + local_3c0._4_4_ * fVar313) * auVar144._4_4_ +
         fVar313 * fVar278;
    auVar196._8_4_ =
         (auVar144._8_4_ * fStack_258 + local_3c0._8_4_ * fVar314) * auVar144._8_4_ +
         fVar314 * fVar246;
    auVar196._12_4_ =
         (auVar144._12_4_ * fStack_254 + local_3c0._12_4_ * fVar315) * auVar144._12_4_ +
         fVar315 * fVar282;
    auVar196._16_4_ =
         (auVar144._16_4_ * fStack_250 + local_3c0._16_4_ * fVar256) * auVar144._16_4_ +
         fVar256 * fVar248;
    auVar196._20_4_ =
         (auVar144._20_4_ * fStack_24c + local_3c0._20_4_ * fVar223) * auVar144._20_4_ +
         fVar223 * fVar286;
    auVar196._24_4_ =
         (auVar144._24_4_ * fStack_248 + local_3c0._24_4_ * fVar274) * auVar144._24_4_ +
         fVar274 * fVar250;
    auVar196._28_4_ = fStack_1e4 + fVar290 + 1.0;
    auVar211._0_4_ =
         (auVar144._0_4_ * (float)local_280._0_4_ + (float)local_200._0_4_ * fVar312) *
         auVar144._0_4_ + fVar312 * fVar252;
    auVar211._4_4_ =
         (auVar144._4_4_ * (float)local_280._4_4_ + (float)local_200._4_4_ * fVar313) *
         auVar144._4_4_ + fVar313 * fVar294;
    auVar211._8_4_ =
         (auVar144._8_4_ * fStack_278 + fStack_1f8 * fVar314) * auVar144._8_4_ + fVar314 * fVar254;
    auVar211._12_4_ =
         (auVar144._12_4_ * fStack_274 + fStack_1f4 * fVar315) * auVar144._12_4_ + fVar315 * fVar219
    ;
    auVar211._16_4_ =
         (auVar144._16_4_ * fStack_270 + fStack_1f0 * fVar256) * auVar144._16_4_ + fVar256 * fVar220
    ;
    auVar211._20_4_ =
         (auVar144._20_4_ * fStack_26c + fStack_1ec * fVar223) * auVar144._20_4_ + fVar223 * fVar221
    ;
    auVar211._24_4_ =
         (auVar144._24_4_ * fStack_268 + fStack_1e8 * fVar274) * auVar144._24_4_ + fVar274 * fVar222
    ;
    auVar211._28_4_ = fVar365 + fVar310 + 1.0;
    auVar234._0_4_ =
         (auVar144._0_4_ * (float)local_2a0._0_4_ + (float)local_220._0_4_ * fVar312) *
         auVar144._0_4_ + fVar312 * fVar224;
    auVar234._4_4_ =
         (auVar144._4_4_ * (float)local_2a0._4_4_ + (float)local_220._4_4_ * fVar313) *
         auVar144._4_4_ + fVar313 * fVar245;
    auVar234._8_4_ =
         (auVar144._8_4_ * fStack_298 + fStack_218 * fVar314) * auVar144._8_4_ + fVar314 * fVar247;
    auVar234._12_4_ =
         (auVar144._12_4_ * fStack_294 + fStack_214 * fVar315) * auVar144._12_4_ + fVar315 * fVar249
    ;
    auVar234._16_4_ =
         (auVar144._16_4_ * fStack_290 + fStack_210 * fVar256) * auVar144._16_4_ + fVar256 * fVar251
    ;
    auVar234._20_4_ =
         (auVar144._20_4_ * fStack_28c + fStack_20c * fVar223) * auVar144._20_4_ + fVar223 * fVar253
    ;
    auVar234._24_4_ =
         (auVar144._24_4_ * fStack_288 + fStack_208 * fVar274) * auVar144._24_4_ + fVar274 * fVar255
    ;
    auVar234._28_4_ = fVar383 + fVar311 + fVar310;
    fVar258 = auVar319._0_4_ * fVar312 + auVar144._0_4_ * auVar101._0_4_;
    fVar276 = auVar319._4_4_ * fVar313 + auVar144._4_4_ * auVar101._4_4_;
    fVar280 = auVar319._8_4_ * fVar314 + auVar144._8_4_ * auVar101._8_4_;
    fVar284 = auVar319._12_4_ * fVar315 + auVar144._12_4_ * auVar101._12_4_;
    fVar288 = auVar319._16_4_ * fVar256 + auVar144._16_4_ * auVar101._16_4_;
    fVar292 = auVar319._20_4_ * fVar223 + auVar144._20_4_ * auVar101._20_4_;
    fVar296 = auVar319._24_4_ * fVar274 + auVar144._24_4_ * auVar101._24_4_;
    fVar298 = fVar383 + fStack_1e4;
    local_a60._0_4_ = auVar330._0_4_ * fVar312 + auVar144._0_4_ * auVar196._0_4_;
    local_a60._4_4_ = auVar330._4_4_ * fVar313 + auVar144._4_4_ * auVar196._4_4_;
    local_a60._8_4_ = auVar330._8_4_ * fVar314 + auVar144._8_4_ * auVar196._8_4_;
    local_a60._12_4_ = auVar330._12_4_ * fVar315 + auVar144._12_4_ * auVar196._12_4_;
    local_a60._16_4_ = auVar330._16_4_ * fVar256 + auVar144._16_4_ * auVar196._16_4_;
    local_a60._20_4_ = auVar330._20_4_ * fVar223 + auVar144._20_4_ * auVar196._20_4_;
    local_a60._24_4_ = auVar330._24_4_ * fVar274 + auVar144._24_4_ * auVar196._24_4_;
    local_a60._28_4_ = fStack_1e4 + fVar365;
    local_300._0_4_ = auVar341._0_4_ * fVar312 + auVar144._0_4_ * auVar211._0_4_;
    local_300._4_4_ = auVar341._4_4_ * fVar313 + auVar144._4_4_ * auVar211._4_4_;
    local_300._8_4_ = auVar341._8_4_ * fVar314 + auVar144._8_4_ * auVar211._8_4_;
    local_300._12_4_ = auVar341._12_4_ * fVar315 + auVar144._12_4_ * auVar211._12_4_;
    local_300._16_4_ = auVar341._16_4_ * fVar256 + auVar144._16_4_ * auVar211._16_4_;
    local_300._20_4_ = auVar341._20_4_ * fVar223 + auVar144._20_4_ * auVar211._20_4_;
    local_300._24_4_ = auVar341._24_4_ * fVar274 + auVar144._24_4_ * auVar211._24_4_;
    local_300._28_4_ = fVar365 + fStack_1e4;
    local_c80._0_4_ = auVar185._0_4_;
    auVar269._0_4_ = fVar312 * auVar306._0_4_ + auVar144._0_4_ * auVar234._0_4_;
    auVar269._4_4_ = fVar313 * auVar306._4_4_ + auVar144._4_4_ * auVar234._4_4_;
    auVar269._8_4_ = fVar314 * auVar306._8_4_ + auVar144._8_4_ * auVar234._8_4_;
    auVar269._12_4_ = fVar315 * auVar306._12_4_ + auVar144._12_4_ * auVar234._12_4_;
    auVar269._16_4_ = fVar256 * auVar306._16_4_ + auVar144._16_4_ * auVar234._16_4_;
    auVar269._20_4_ = fVar223 * auVar306._20_4_ + auVar144._20_4_ * auVar234._20_4_;
    auVar269._24_4_ = fVar274 * auVar306._24_4_ + auVar144._24_4_ * auVar234._24_4_;
    auVar269._28_4_ = auVar96._28_4_ + auVar144._28_4_;
    auVar96 = vsubps_avx(auVar101,auVar319);
    auVar11 = vsubps_avx(auVar196,auVar330);
    auVar108 = vsubps_avx(auVar211,auVar341);
    auVar12 = vsubps_avx(auVar234,auVar306);
    auVar182 = vshufps_avx(ZEXT416((uint)((float)local_c80._0_4_ * 0.04761905)),
                           ZEXT416((uint)((float)local_c80._0_4_ * 0.04761905)),0);
    fVar252 = auVar182._0_4_;
    fVar353 = fVar252 * auVar96._0_4_ * 3.0;
    fVar294 = auVar182._4_4_;
    fVar359 = fVar294 * auVar96._4_4_ * 3.0;
    local_980._4_4_ = fVar359;
    local_980._0_4_ = fVar353;
    fVar222 = auVar182._8_4_;
    fVar360 = fVar222 * auVar96._8_4_ * 3.0;
    local_980._8_4_ = fVar360;
    fVar282 = auVar182._12_4_;
    fVar361 = fVar282 * auVar96._12_4_ * 3.0;
    local_980._12_4_ = fVar361;
    fVar362 = fVar252 * auVar96._16_4_ * 3.0;
    local_980._16_4_ = fVar362;
    fVar363 = fVar294 * auVar96._20_4_ * 3.0;
    local_980._20_4_ = fVar363;
    fVar364 = fVar222 * auVar96._24_4_ * 3.0;
    local_980._24_4_ = fVar364;
    local_980._28_4_ = fVar365;
    fVar339 = fVar252 * auVar11._0_4_ * 3.0;
    fVar347 = fVar294 * auVar11._4_4_ * 3.0;
    auVar22._4_4_ = fVar347;
    auVar22._0_4_ = fVar339;
    fVar348 = fVar222 * auVar11._8_4_ * 3.0;
    auVar22._8_4_ = fVar348;
    fVar349 = fVar282 * auVar11._12_4_ * 3.0;
    auVar22._12_4_ = fVar349;
    fVar350 = fVar252 * auVar11._16_4_ * 3.0;
    auVar22._16_4_ = fVar350;
    fVar351 = fVar294 * auVar11._20_4_ * 3.0;
    auVar22._20_4_ = fVar351;
    fVar352 = fVar222 * auVar11._24_4_ * 3.0;
    auVar22._24_4_ = fVar352;
    auVar22._28_4_ = auVar341._28_4_;
    fVar366 = fVar252 * auVar108._0_4_ * 3.0;
    fVar371 = fVar294 * auVar108._4_4_ * 3.0;
    auVar23._4_4_ = fVar371;
    auVar23._0_4_ = fVar366;
    fVar373 = fVar222 * auVar108._8_4_ * 3.0;
    auVar23._8_4_ = fVar373;
    fVar375 = fVar282 * auVar108._12_4_ * 3.0;
    auVar23._12_4_ = fVar375;
    fVar377 = fVar252 * auVar108._16_4_ * 3.0;
    auVar23._16_4_ = fVar377;
    fVar379 = fVar294 * auVar108._20_4_ * 3.0;
    auVar23._20_4_ = fVar379;
    fVar381 = fVar222 * auVar108._24_4_ * 3.0;
    auVar23._24_4_ = fVar381;
    auVar23._28_4_ = fVar383;
    fVar315 = fVar252 * auVar12._0_4_ * 3.0;
    fVar256 = fVar294 * auVar12._4_4_ * 3.0;
    auVar24._4_4_ = fVar256;
    auVar24._0_4_ = fVar315;
    fVar246 = fVar222 * auVar12._8_4_ * 3.0;
    auVar24._8_4_ = fVar246;
    fVar282 = fVar282 * auVar12._12_4_ * 3.0;
    auVar24._12_4_ = fVar282;
    fVar252 = fVar252 * auVar12._16_4_ * 3.0;
    auVar24._16_4_ = fVar252;
    fVar294 = fVar294 * auVar12._20_4_ * 3.0;
    auVar24._20_4_ = fVar294;
    fVar222 = fVar222 * auVar12._24_4_ * 3.0;
    auVar24._24_4_ = fVar222;
    auVar24._28_4_ = auVar11._28_4_;
    auVar96 = vperm2f128_avx(local_a60,local_a60,1);
    auVar96 = vshufps_avx(auVar96,local_a60,0x30);
    auVar12 = vshufps_avx(local_a60,auVar96,0x29);
    auVar96 = vperm2f128_avx(local_300,local_300,1);
    auVar96 = vshufps_avx(auVar96,local_300,0x30);
    auVar13 = vshufps_avx(local_300,auVar96,0x29);
    auVar108 = vsubps_avx(auVar269,auVar24);
    auVar96 = vperm2f128_avx(auVar108,auVar108,1);
    auVar96 = vshufps_avx(auVar96,auVar108,0x30);
    local_640 = vshufps_avx(auVar108,auVar96,0x29);
    local_540 = vsubps_avx(auVar12,local_a60);
    local_320 = vsubps_avx(auVar13,local_300);
    fVar311 = local_540._0_4_;
    fVar223 = local_540._4_4_;
    auVar25._4_4_ = fVar371 * fVar223;
    auVar25._0_4_ = fVar366 * fVar311;
    fVar248 = local_540._8_4_;
    auVar25._8_4_ = fVar373 * fVar248;
    fVar254 = local_540._12_4_;
    auVar25._12_4_ = fVar375 * fVar254;
    fVar245 = local_540._16_4_;
    auVar25._16_4_ = fVar377 * fVar245;
    fVar257 = local_540._20_4_;
    auVar25._20_4_ = fVar379 * fVar257;
    fVar295 = local_540._24_4_;
    auVar25._24_4_ = fVar381 * fVar295;
    auVar25._28_4_ = auVar108._28_4_;
    fVar312 = local_320._0_4_;
    fVar274 = local_320._4_4_;
    auVar26._4_4_ = fVar347 * fVar274;
    auVar26._0_4_ = fVar339 * fVar312;
    fVar286 = local_320._8_4_;
    auVar26._8_4_ = fVar348 * fVar286;
    fVar219 = local_320._12_4_;
    auVar26._12_4_ = fVar349 * fVar219;
    fVar247 = local_320._16_4_;
    auVar26._16_4_ = fVar350 * fVar247;
    fVar275 = local_320._20_4_;
    auVar26._20_4_ = fVar351 * fVar275;
    fVar17 = local_320._24_4_;
    auVar26._24_4_ = fVar352 * fVar17;
    auVar26._28_4_ = auVar96._28_4_;
    auVar212 = vsubps_avx(auVar26,auVar25);
    auVar70._4_4_ = fVar276;
    auVar70._0_4_ = fVar258;
    auVar70._8_4_ = fVar280;
    auVar70._12_4_ = fVar284;
    auVar70._16_4_ = fVar288;
    auVar70._20_4_ = fVar292;
    auVar70._24_4_ = fVar296;
    auVar70._28_4_ = fVar298;
    auVar96 = vperm2f128_avx(auVar70,auVar70,1);
    auVar96 = vshufps_avx(auVar96,auVar70,0x30);
    auVar14 = vshufps_avx(auVar70,auVar96,0x29);
    local_560 = vsubps_avx(auVar14,auVar70);
    auVar27._4_4_ = fVar359 * fVar274;
    auVar27._0_4_ = fVar353 * fVar312;
    auVar27._8_4_ = fVar360 * fVar286;
    auVar27._12_4_ = fVar361 * fVar219;
    auVar27._16_4_ = fVar362 * fVar247;
    auVar27._20_4_ = fVar363 * fVar275;
    auVar27._24_4_ = fVar364 * fVar17;
    auVar27._28_4_ = auVar14._28_4_;
    fVar313 = local_560._0_4_;
    fVar244 = local_560._4_4_;
    auVar28._4_4_ = fVar371 * fVar244;
    auVar28._0_4_ = fVar366 * fVar313;
    fVar250 = local_560._8_4_;
    auVar28._8_4_ = fVar373 * fVar250;
    fVar220 = local_560._12_4_;
    auVar28._12_4_ = fVar375 * fVar220;
    fVar249 = local_560._16_4_;
    auVar28._16_4_ = fVar377 * fVar249;
    fVar279 = local_560._20_4_;
    auVar28._20_4_ = fVar379 * fVar279;
    fVar18 = local_560._24_4_;
    auVar28._24_4_ = fVar381 * fVar18;
    auVar28._28_4_ = auVar319._28_4_;
    auVar15 = vsubps_avx(auVar28,auVar27);
    auVar29._4_4_ = fVar347 * fVar244;
    auVar29._0_4_ = fVar339 * fVar313;
    auVar29._8_4_ = fVar348 * fVar250;
    auVar29._12_4_ = fVar349 * fVar220;
    auVar29._16_4_ = fVar350 * fVar249;
    auVar29._20_4_ = fVar351 * fVar279;
    auVar29._24_4_ = fVar352 * fVar18;
    auVar29._28_4_ = auVar319._28_4_;
    auVar30._4_4_ = fVar359 * fVar223;
    auVar30._0_4_ = fVar353 * fVar311;
    auVar30._8_4_ = fVar360 * fVar248;
    auVar30._12_4_ = fVar361 * fVar254;
    auVar30._16_4_ = fVar362 * fVar245;
    auVar30._20_4_ = fVar363 * fVar257;
    auVar30._24_4_ = fVar364 * fVar295;
    auVar30._28_4_ = auVar330._28_4_;
    auVar213 = vsubps_avx(auVar30,auVar29);
    fVar310 = auVar213._28_4_;
    auVar197._0_4_ = fVar313 * fVar313 + fVar311 * fVar311 + fVar312 * fVar312;
    auVar197._4_4_ = fVar244 * fVar244 + fVar223 * fVar223 + fVar274 * fVar274;
    auVar197._8_4_ = fVar250 * fVar250 + fVar248 * fVar248 + fVar286 * fVar286;
    auVar197._12_4_ = fVar220 * fVar220 + fVar254 * fVar254 + fVar219 * fVar219;
    auVar197._16_4_ = fVar249 * fVar249 + fVar245 * fVar245 + fVar247 * fVar247;
    auVar197._20_4_ = fVar279 * fVar279 + fVar257 * fVar257 + fVar275 * fVar275;
    auVar197._24_4_ = fVar18 * fVar18 + fVar295 * fVar295 + fVar17 * fVar17;
    auVar197._28_4_ = fVar310 + fVar310 + auVar212._28_4_;
    auVar96 = vrcpps_avx(auVar197);
    fVar224 = auVar96._0_4_;
    fVar253 = auVar96._4_4_;
    auVar31._4_4_ = fVar253 * auVar197._4_4_;
    auVar31._0_4_ = fVar224 * auVar197._0_4_;
    fVar255 = auVar96._8_4_;
    auVar31._8_4_ = fVar255 * auVar197._8_4_;
    fVar287 = auVar96._12_4_;
    auVar31._12_4_ = fVar287 * auVar197._12_4_;
    fVar291 = auVar96._16_4_;
    auVar31._16_4_ = fVar291 * auVar197._16_4_;
    fVar322 = auVar96._20_4_;
    auVar31._20_4_ = fVar322 * auVar197._20_4_;
    fVar323 = auVar96._24_4_;
    auVar31._24_4_ = fVar323 * auVar197._24_4_;
    auVar31._28_4_ = auVar330._28_4_;
    auVar102._8_4_ = 0x3f800000;
    auVar102._0_8_ = 0x3f8000003f800000;
    auVar102._12_4_ = 0x3f800000;
    auVar102._16_4_ = 0x3f800000;
    auVar102._20_4_ = 0x3f800000;
    auVar102._24_4_ = 0x3f800000;
    auVar102._28_4_ = 0x3f800000;
    auVar20 = vsubps_avx(auVar102,auVar31);
    fVar224 = fVar224 + fVar224 * auVar20._0_4_;
    fVar253 = fVar253 + fVar253 * auVar20._4_4_;
    fVar255 = fVar255 + fVar255 * auVar20._8_4_;
    fVar287 = fVar287 + fVar287 * auVar20._12_4_;
    fVar291 = fVar291 + fVar291 * auVar20._16_4_;
    fVar322 = fVar322 + fVar322 * auVar20._20_4_;
    fVar323 = fVar323 + fVar323 * auVar20._24_4_;
    auVar108 = vperm2f128_avx(auVar22,auVar22,1);
    auVar108 = vshufps_avx(auVar108,auVar22,0x30);
    local_ae0 = vshufps_avx(auVar22,auVar108,0x29);
    auVar108 = vperm2f128_avx(auVar23,auVar23,1);
    auVar108 = vshufps_avx(auVar108,auVar23,0x30);
    local_a40 = vshufps_avx(auVar23,auVar108,0x29);
    fVar84 = local_a40._0_4_;
    fVar115 = local_a40._4_4_;
    auVar32._4_4_ = fVar115 * fVar223;
    auVar32._0_4_ = fVar84 * fVar311;
    fVar117 = local_a40._8_4_;
    auVar32._8_4_ = fVar117 * fVar248;
    fVar119 = local_a40._12_4_;
    auVar32._12_4_ = fVar119 * fVar254;
    fVar120 = local_a40._16_4_;
    auVar32._16_4_ = fVar120 * fVar245;
    fVar121 = local_a40._20_4_;
    auVar32._20_4_ = fVar121 * fVar257;
    fVar122 = local_a40._24_4_;
    auVar32._24_4_ = fVar122 * fVar295;
    auVar32._28_4_ = auVar108._28_4_;
    fVar314 = local_ae0._0_4_;
    fVar278 = local_ae0._4_4_;
    auVar33._4_4_ = fVar274 * fVar278;
    auVar33._0_4_ = fVar312 * fVar314;
    fVar290 = local_ae0._8_4_;
    auVar33._8_4_ = fVar286 * fVar290;
    fVar221 = local_ae0._12_4_;
    auVar33._12_4_ = fVar219 * fVar221;
    fVar251 = local_ae0._16_4_;
    auVar33._16_4_ = fVar247 * fVar251;
    fVar283 = local_ae0._20_4_;
    auVar33._20_4_ = fVar275 * fVar283;
    fVar389 = local_ae0._24_4_;
    auVar33._24_4_ = fVar17 * fVar389;
    auVar33._28_4_ = auVar341._28_4_;
    auVar21 = vsubps_avx(auVar33,auVar32);
    auVar108 = vperm2f128_avx(local_980,local_980,1);
    auVar108 = vshufps_avx(auVar108,local_980,0x30);
    local_920 = vshufps_avx(local_980,auVar108,0x29);
    fVar367 = local_920._0_4_;
    fVar372 = local_920._4_4_;
    auVar34._4_4_ = fVar372 * fVar274;
    auVar34._0_4_ = fVar367 * fVar312;
    fVar374 = local_920._8_4_;
    auVar34._8_4_ = fVar374 * fVar286;
    fVar376 = local_920._12_4_;
    auVar34._12_4_ = fVar376 * fVar219;
    fVar378 = local_920._16_4_;
    auVar34._16_4_ = fVar378 * fVar247;
    fVar380 = local_920._20_4_;
    auVar34._20_4_ = fVar380 * fVar275;
    fVar382 = local_920._24_4_;
    auVar34._24_4_ = fVar382 * fVar17;
    auVar34._28_4_ = auVar108._28_4_;
    auVar35._4_4_ = fVar244 * fVar115;
    auVar35._0_4_ = fVar313 * fVar84;
    auVar35._8_4_ = fVar250 * fVar117;
    auVar35._12_4_ = fVar220 * fVar119;
    auVar35._16_4_ = fVar249 * fVar120;
    auVar35._20_4_ = fVar279 * fVar121;
    auVar35._24_4_ = fVar18 * fVar122;
    auVar35._28_4_ = fVar365;
    auVar108 = vsubps_avx(auVar35,auVar34);
    auVar36._4_4_ = fVar244 * fVar278;
    auVar36._0_4_ = fVar313 * fVar314;
    auVar36._8_4_ = fVar250 * fVar290;
    auVar36._12_4_ = fVar220 * fVar221;
    auVar36._16_4_ = fVar249 * fVar251;
    auVar36._20_4_ = fVar279 * fVar283;
    auVar36._24_4_ = fVar18 * fVar389;
    auVar36._28_4_ = fVar365;
    auVar37._4_4_ = fVar372 * fVar223;
    auVar37._0_4_ = fVar367 * fVar311;
    auVar37._8_4_ = fVar374 * fVar248;
    auVar37._12_4_ = fVar376 * fVar254;
    auVar37._16_4_ = fVar378 * fVar245;
    auVar37._20_4_ = fVar380 * fVar257;
    fVar365 = local_920._28_4_;
    auVar37._24_4_ = fVar382 * fVar295;
    auVar37._28_4_ = fVar365;
    auVar97 = vsubps_avx(auVar37,auVar36);
    auVar38._4_4_ =
         fVar253 * (auVar212._4_4_ * auVar212._4_4_ +
                   auVar213._4_4_ * auVar213._4_4_ + auVar15._4_4_ * auVar15._4_4_);
    auVar38._0_4_ =
         fVar224 * (auVar212._0_4_ * auVar212._0_4_ +
                   auVar213._0_4_ * auVar213._0_4_ + auVar15._0_4_ * auVar15._0_4_);
    auVar38._8_4_ =
         fVar255 * (auVar212._8_4_ * auVar212._8_4_ +
                   auVar213._8_4_ * auVar213._8_4_ + auVar15._8_4_ * auVar15._8_4_);
    auVar38._12_4_ =
         fVar287 * (auVar212._12_4_ * auVar212._12_4_ +
                   auVar213._12_4_ * auVar213._12_4_ + auVar15._12_4_ * auVar15._12_4_);
    auVar38._16_4_ =
         fVar291 * (auVar212._16_4_ * auVar212._16_4_ +
                   auVar213._16_4_ * auVar213._16_4_ + auVar15._16_4_ * auVar15._16_4_);
    auVar38._20_4_ =
         fVar322 * (auVar212._20_4_ * auVar212._20_4_ +
                   auVar213._20_4_ * auVar213._20_4_ + auVar15._20_4_ * auVar15._20_4_);
    auVar38._24_4_ =
         fVar323 * (auVar212._24_4_ * auVar212._24_4_ +
                   auVar213._24_4_ * auVar213._24_4_ + auVar15._24_4_ * auVar15._24_4_);
    auVar38._28_4_ = auVar212._28_4_ + fVar310 + auVar15._28_4_;
    auVar39._4_4_ =
         (auVar21._4_4_ * auVar21._4_4_ +
         auVar108._4_4_ * auVar108._4_4_ + auVar97._4_4_ * auVar97._4_4_) * fVar253;
    auVar39._0_4_ =
         (auVar21._0_4_ * auVar21._0_4_ +
         auVar108._0_4_ * auVar108._0_4_ + auVar97._0_4_ * auVar97._0_4_) * fVar224;
    auVar39._8_4_ =
         (auVar21._8_4_ * auVar21._8_4_ +
         auVar108._8_4_ * auVar108._8_4_ + auVar97._8_4_ * auVar97._8_4_) * fVar255;
    auVar39._12_4_ =
         (auVar21._12_4_ * auVar21._12_4_ +
         auVar108._12_4_ * auVar108._12_4_ + auVar97._12_4_ * auVar97._12_4_) * fVar287;
    auVar39._16_4_ =
         (auVar21._16_4_ * auVar21._16_4_ +
         auVar108._16_4_ * auVar108._16_4_ + auVar97._16_4_ * auVar97._16_4_) * fVar291;
    auVar39._20_4_ =
         (auVar21._20_4_ * auVar21._20_4_ +
         auVar108._20_4_ * auVar108._20_4_ + auVar97._20_4_ * auVar97._20_4_) * fVar322;
    auVar39._24_4_ =
         (auVar21._24_4_ * auVar21._24_4_ +
         auVar108._24_4_ * auVar108._24_4_ + auVar97._24_4_ * auVar97._24_4_) * fVar323;
    auVar39._28_4_ = auVar96._28_4_ + auVar20._28_4_;
    auVar96 = vmaxps_avx(auVar38,auVar39);
    auVar108 = vperm2f128_avx(auVar269,auVar269,1);
    auVar108 = vshufps_avx(auVar108,auVar269,0x30);
    local_660 = vshufps_avx(auVar269,auVar108,0x29);
    auVar166._0_4_ = auVar269._0_4_ + fVar315;
    auVar166._4_4_ = auVar269._4_4_ + fVar256;
    auVar166._8_4_ = auVar269._8_4_ + fVar246;
    auVar166._12_4_ = auVar269._12_4_ + fVar282;
    auVar166._16_4_ = auVar269._16_4_ + fVar252;
    auVar166._20_4_ = auVar269._20_4_ + fVar294;
    auVar166._24_4_ = auVar269._24_4_ + fVar222;
    auVar166._28_4_ = auVar269._28_4_ + auVar11._28_4_;
    auVar108 = vmaxps_avx(auVar269,auVar166);
    auVar11 = vmaxps_avx(local_640,local_660);
    auVar108 = vmaxps_avx(auVar108,auVar11);
    auVar11 = vrsqrtps_avx(auVar197);
    fVar310 = auVar11._0_4_;
    fVar315 = auVar11._4_4_;
    fVar256 = auVar11._8_4_;
    fVar246 = auVar11._12_4_;
    fVar282 = auVar11._16_4_;
    fVar252 = auVar11._20_4_;
    fVar294 = auVar11._24_4_;
    local_5e0 = fVar310 * 1.5 + fVar310 * fVar310 * fVar310 * auVar197._0_4_ * -0.5;
    fStack_5dc = fVar315 * 1.5 + fVar315 * fVar315 * fVar315 * auVar197._4_4_ * -0.5;
    fStack_5d8 = fVar256 * 1.5 + fVar256 * fVar256 * fVar256 * auVar197._8_4_ * -0.5;
    fStack_5d4 = fVar246 * 1.5 + fVar246 * fVar246 * fVar246 * auVar197._12_4_ * -0.5;
    fStack_5d0 = fVar282 * 1.5 + fVar282 * fVar282 * fVar282 * auVar197._16_4_ * -0.5;
    fStack_5cc = fVar252 * 1.5 + fVar252 * fVar252 * fVar252 * auVar197._20_4_ * -0.5;
    fStack_5c8 = fVar294 * 1.5 + fVar294 * fVar294 * fVar294 * auVar197._24_4_ * -0.5;
    auVar212 = ZEXT1232(ZEXT412(0)) << 0x20;
    local_7e0 = vsubps_avx(auVar212,local_a60);
    auVar212 = vsubps_avx(auVar212,local_300);
    fVar328 = auVar212._0_4_;
    fVar333 = auVar212._4_4_;
    fVar334 = auVar212._8_4_;
    fVar335 = auVar212._12_4_;
    fVar336 = auVar212._16_4_;
    fVar337 = auVar212._20_4_;
    fVar338 = auVar212._24_4_;
    fVar315 = local_7e0._0_4_;
    fVar246 = local_7e0._4_4_;
    fVar252 = local_7e0._8_4_;
    fVar222 = local_7e0._12_4_;
    fVar253 = local_7e0._16_4_;
    fVar287 = local_7e0._20_4_;
    fVar322 = local_7e0._24_4_;
    auVar71._4_4_ = fVar276;
    auVar71._0_4_ = fVar258;
    auVar71._8_4_ = fVar280;
    auVar71._12_4_ = fVar284;
    auVar71._16_4_ = fVar288;
    auVar71._20_4_ = fVar292;
    auVar71._24_4_ = fVar296;
    auVar71._28_4_ = fVar298;
    auVar213 = ZEXT1232(ZEXT412(0)) << 0x20;
    auVar212 = vsubps_avx(auVar213,auVar71);
    fVar256 = auVar212._0_4_;
    fVar282 = auVar212._4_4_;
    fVar294 = auVar212._8_4_;
    fVar224 = auVar212._12_4_;
    fVar255 = auVar212._16_4_;
    fVar291 = auVar212._20_4_;
    fVar323 = auVar212._24_4_;
    auVar356._0_4_ =
         (float)local_a80._0_4_ * fVar256 +
         (float)local_6e0._0_4_ * fVar315 + fVar328 * (float)local_880._0_4_;
    auVar356._4_4_ =
         (float)local_a80._4_4_ * fVar282 +
         (float)local_6e0._4_4_ * fVar246 + fVar333 * (float)local_880._4_4_;
    auVar356._8_4_ = fStack_a78 * fVar294 + fStack_6d8 * fVar252 + fVar334 * fStack_878;
    auVar356._12_4_ = fStack_a74 * fVar224 + fStack_6d4 * fVar222 + fVar335 * fStack_874;
    auVar356._16_4_ = fStack_a70 * fVar255 + fStack_6d0 * fVar253 + fVar336 * fStack_870;
    auVar356._20_4_ = fStack_a6c * fVar291 + fStack_6cc * fVar287 + fVar337 * fStack_86c;
    auVar356._24_4_ = fStack_a68 * fVar323 + fStack_6c8 * fVar322 + fVar338 * fStack_868;
    auVar356._28_4_ = fVar365 + auVar97._28_4_ + auVar197._28_4_;
    auVar370._0_4_ = fVar256 * fVar256 + fVar315 * fVar315 + fVar328 * fVar328;
    auVar370._4_4_ = fVar282 * fVar282 + fVar246 * fVar246 + fVar333 * fVar333;
    auVar370._8_4_ = fVar294 * fVar294 + fVar252 * fVar252 + fVar334 * fVar334;
    auVar370._12_4_ = fVar224 * fVar224 + fVar222 * fVar222 + fVar335 * fVar335;
    auVar370._16_4_ = fVar255 * fVar255 + fVar253 * fVar253 + fVar336 * fVar336;
    auVar370._20_4_ = fVar291 * fVar291 + fVar287 * fVar287 + fVar337 * fVar337;
    auVar370._24_4_ = fVar323 * fVar323 + fVar322 * fVar322 + fVar338 * fVar338;
    auVar370._28_4_ = local_300._28_4_ + local_300._28_4_ + fVar365;
    local_580._0_4_ =
         (float)local_a80._0_4_ * fVar313 * local_5e0 +
         local_5e0 * fVar311 * (float)local_6e0._0_4_ + fVar312 * local_5e0 * (float)local_880._0_4_
    ;
    local_580._4_4_ =
         (float)local_a80._4_4_ * fVar244 * fStack_5dc +
         fStack_5dc * fVar223 * (float)local_6e0._4_4_ +
         fVar274 * fStack_5dc * (float)local_880._4_4_;
    local_580._8_4_ =
         fStack_a78 * fVar250 * fStack_5d8 +
         fStack_5d8 * fVar248 * fStack_6d8 + fVar286 * fStack_5d8 * fStack_878;
    local_580._12_4_ =
         fStack_a74 * fVar220 * fStack_5d4 +
         fStack_5d4 * fVar254 * fStack_6d4 + fVar219 * fStack_5d4 * fStack_874;
    local_580._16_4_ =
         fStack_a70 * fVar249 * fStack_5d0 +
         fStack_5d0 * fVar245 * fStack_6d0 + fVar247 * fStack_5d0 * fStack_870;
    local_580._20_4_ =
         fStack_a6c * fVar279 * fStack_5cc +
         fStack_5cc * fVar257 * fStack_6cc + fVar275 * fStack_5cc * fStack_86c;
    local_580._24_4_ =
         fStack_a68 * fVar18 * fStack_5c8 +
         fStack_5c8 * fVar295 * fStack_6c8 + fVar17 * fStack_5c8 * fStack_868;
    local_580._28_4_ = fStack_a64 + fStack_6c4 + fStack_864;
    fVar310 = fStack_a64 + fStack_6c4 + fStack_864;
    local_600._0_4_ =
         fVar256 * fVar313 * local_5e0 +
         local_5e0 * fVar311 * fVar315 + fVar328 * fVar312 * local_5e0;
    local_600._4_4_ =
         fVar282 * fVar244 * fStack_5dc +
         fStack_5dc * fVar223 * fVar246 + fVar333 * fVar274 * fStack_5dc;
    local_600._8_4_ =
         fVar294 * fVar250 * fStack_5d8 +
         fStack_5d8 * fVar248 * fVar252 + fVar334 * fVar286 * fStack_5d8;
    local_600._12_4_ =
         fVar224 * fVar220 * fStack_5d4 +
         fStack_5d4 * fVar254 * fVar222 + fVar335 * fVar219 * fStack_5d4;
    local_600._16_4_ =
         fVar255 * fVar249 * fStack_5d0 +
         fStack_5d0 * fVar245 * fVar253 + fVar336 * fVar247 * fStack_5d0;
    local_600._20_4_ =
         fVar291 * fVar279 * fStack_5cc +
         fStack_5cc * fVar257 * fVar287 + fVar337 * fVar275 * fStack_5cc;
    local_600._24_4_ =
         fVar323 * fVar18 * fStack_5c8 +
         fStack_5c8 * fVar295 * fVar322 + fVar338 * fVar17 * fStack_5c8;
    local_600._28_4_ = fStack_6c4 + fVar310;
    auVar40._4_4_ = local_580._4_4_ * local_600._4_4_;
    auVar40._0_4_ = local_580._0_4_ * local_600._0_4_;
    auVar40._8_4_ = local_580._8_4_ * local_600._8_4_;
    auVar40._12_4_ = local_580._12_4_ * local_600._12_4_;
    auVar40._16_4_ = local_580._16_4_ * local_600._16_4_;
    auVar40._20_4_ = local_580._20_4_ * local_600._20_4_;
    auVar40._24_4_ = local_580._24_4_ * local_600._24_4_;
    auVar40._28_4_ = fVar310;
    auVar212 = vsubps_avx(auVar356,auVar40);
    auVar41._4_4_ = local_600._4_4_ * local_600._4_4_;
    auVar41._0_4_ = local_600._0_4_ * local_600._0_4_;
    auVar41._8_4_ = local_600._8_4_ * local_600._8_4_;
    auVar41._12_4_ = local_600._12_4_ * local_600._12_4_;
    auVar41._16_4_ = local_600._16_4_ * local_600._16_4_;
    auVar41._20_4_ = local_600._20_4_ * local_600._20_4_;
    auVar41._24_4_ = local_600._24_4_ * local_600._24_4_;
    auVar41._28_4_ = fStack_6c4;
    local_680 = vsubps_avx(auVar370,auVar41);
    local_2e0 = vsqrtps_avx(auVar96);
    fVar310 = (local_2e0._0_4_ + auVar108._0_4_) * 1.0000002;
    fVar365 = (local_2e0._4_4_ + auVar108._4_4_) * 1.0000002;
    fVar173 = (local_2e0._8_4_ + auVar108._8_4_) * 1.0000002;
    fVar174 = (local_2e0._12_4_ + auVar108._12_4_) * 1.0000002;
    fVar175 = (local_2e0._16_4_ + auVar108._16_4_) * 1.0000002;
    fVar176 = (local_2e0._20_4_ + auVar108._20_4_) * 1.0000002;
    fVar177 = (local_2e0._24_4_ + auVar108._24_4_) * 1.0000002;
    auVar42._4_4_ = fVar365 * fVar365;
    auVar42._0_4_ = fVar310 * fVar310;
    auVar42._8_4_ = fVar173 * fVar173;
    auVar42._12_4_ = fVar174 * fVar174;
    auVar42._16_4_ = fVar175 * fVar175;
    auVar42._20_4_ = fVar176 * fVar176;
    auVar42._24_4_ = fVar177 * fVar177;
    auVar42._28_4_ = local_2e0._28_4_ + auVar108._28_4_;
    local_9e0._0_4_ = auVar212._0_4_ + auVar212._0_4_;
    local_9e0._4_4_ = auVar212._4_4_ + auVar212._4_4_;
    local_9e0._8_4_ = auVar212._8_4_ + auVar212._8_4_;
    local_9e0._12_4_ = auVar212._12_4_ + auVar212._12_4_;
    local_9e0._16_4_ = auVar212._16_4_ + auVar212._16_4_;
    local_9e0._20_4_ = auVar212._20_4_ + auVar212._20_4_;
    local_9e0._24_4_ = auVar212._24_4_ + auVar212._24_4_;
    fVar310 = auVar212._28_4_;
    local_9e0._28_4_ = fVar310 + fVar310;
    auVar108 = vsubps_avx(local_680,auVar42);
    auVar43._4_4_ = local_580._4_4_ * local_580._4_4_;
    auVar43._0_4_ = local_580._0_4_ * local_580._0_4_;
    auVar43._8_4_ = local_580._8_4_ * local_580._8_4_;
    auVar43._12_4_ = local_580._12_4_ * local_580._12_4_;
    auVar43._16_4_ = local_580._16_4_ * local_580._16_4_;
    auVar43._20_4_ = local_580._20_4_ * local_580._20_4_;
    auVar43._24_4_ = local_580._24_4_ * local_580._24_4_;
    auVar43._28_4_ = fVar310;
    auVar212 = vsubps_avx(local_2c0,auVar43);
    local_6a0._4_4_ = local_9e0._4_4_ * local_9e0._4_4_;
    local_6a0._0_4_ = (float)local_9e0._0_4_ * (float)local_9e0._0_4_;
    local_6a0._8_4_ = local_9e0._8_4_ * local_9e0._8_4_;
    local_6a0._12_4_ = local_9e0._12_4_ * local_9e0._12_4_;
    local_6a0._16_4_ = local_9e0._16_4_ * local_9e0._16_4_;
    local_6a0._20_4_ = local_9e0._20_4_ * local_9e0._20_4_;
    local_6a0._24_4_ = local_9e0._24_4_ * local_9e0._24_4_;
    local_6a0._28_4_ = local_2c0._28_4_;
    fVar310 = auVar212._0_4_;
    local_6c0._0_4_ = fVar310 * 4.0;
    fVar365 = auVar212._4_4_;
    local_6c0._4_4_ = fVar365 * 4.0;
    fVar173 = auVar212._8_4_;
    fStack_6b8 = fVar173 * 4.0;
    fVar174 = auVar212._12_4_;
    fStack_6b4 = fVar174 * 4.0;
    fVar175 = auVar212._16_4_;
    fStack_6b0 = fVar175 * 4.0;
    fVar176 = auVar212._20_4_;
    fStack_6ac = fVar176 * 4.0;
    fVar177 = auVar212._24_4_;
    fStack_6a8 = fVar177 * 4.0;
    uStack_6a4 = 0x40800000;
    auVar44._4_4_ = auVar108._4_4_ * (float)local_6c0._4_4_;
    auVar44._0_4_ = auVar108._0_4_ * (float)local_6c0._0_4_;
    auVar44._8_4_ = auVar108._8_4_ * fStack_6b8;
    auVar44._12_4_ = auVar108._12_4_ * fStack_6b4;
    auVar44._16_4_ = auVar108._16_4_ * fStack_6b0;
    auVar44._20_4_ = auVar108._20_4_ * fStack_6ac;
    auVar44._24_4_ = auVar108._24_4_ * fStack_6a8;
    auVar44._28_4_ = 0x40800000;
    auVar15 = vsubps_avx(local_6a0,auVar44);
    auVar96 = vcmpps_avx(auVar15,auVar213,5);
    auVar103._8_4_ = 0x7fffffff;
    auVar103._0_8_ = 0x7fffffff7fffffff;
    auVar103._12_4_ = 0x7fffffff;
    auVar103._16_4_ = 0x7fffffff;
    auVar103._20_4_ = 0x7fffffff;
    auVar103._24_4_ = 0x7fffffff;
    auVar103._28_4_ = 0x7fffffff;
    local_460 = vandps_avx(auVar43,auVar103);
    local_360._0_4_ = fVar310 + fVar310;
    local_360._4_4_ = fVar365 + fVar365;
    local_360._8_4_ = fVar173 + fVar173;
    local_360._12_4_ = fVar174 + fVar174;
    local_360._16_4_ = fVar175 + fVar175;
    local_360._20_4_ = fVar176 + fVar176;
    local_360._24_4_ = fVar177 + fVar177;
    local_360._28_4_ = auVar212._28_4_ + auVar212._28_4_;
    local_9c0 = vandps_avx(auVar212,auVar103);
    uVar77 = CONCAT44(local_9e0._4_4_,local_9e0._0_4_);
    local_340._0_8_ = uVar77 ^ 0x8000000080000000;
    local_340._8_4_ = -local_9e0._8_4_;
    local_340._12_4_ = -local_9e0._12_4_;
    local_340._16_4_ = -local_9e0._16_4_;
    local_340._20_4_ = -local_9e0._20_4_;
    local_340._24_4_ = -local_9e0._24_4_;
    local_340._28_4_ = -local_9e0._28_4_;
    if ((((((((auVar96 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar96 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar96 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar96 >> 0x7f,0) == '\0') &&
          (auVar96 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar96 >> 0xbf,0) == '\0') &&
        (auVar96 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar96[0x1f]) {
      local_940._8_4_ = 0x7f800000;
      local_940._0_8_ = 0x7f8000007f800000;
      local_940._12_4_ = 0x7f800000;
      local_940._16_4_ = 0x7f800000;
      local_940._20_4_ = 0x7f800000;
      local_940._24_4_ = 0x7f800000;
      local_940._28_4_ = 0x7f800000;
      auVar167._8_4_ = 0xff800000;
      auVar167._0_8_ = 0xff800000ff800000;
      auVar167._12_4_ = 0xff800000;
      auVar167._16_4_ = 0xff800000;
      auVar167._20_4_ = 0xff800000;
      auVar167._24_4_ = 0xff800000;
      auVar167._28_4_ = 0xff800000;
    }
    else {
      auVar21 = vsqrtps_avx(auVar15);
      auVar20 = vrcpps_avx(local_360);
      auVar212 = vcmpps_avx(auVar15,auVar213,5);
      fVar310 = auVar20._0_4_;
      fVar365 = auVar20._4_4_;
      auVar45._4_4_ = local_360._4_4_ * fVar365;
      auVar45._0_4_ = local_360._0_4_ * fVar310;
      fVar173 = auVar20._8_4_;
      auVar45._8_4_ = local_360._8_4_ * fVar173;
      fVar174 = auVar20._12_4_;
      auVar45._12_4_ = local_360._12_4_ * fVar174;
      fVar175 = auVar20._16_4_;
      auVar45._16_4_ = local_360._16_4_ * fVar175;
      fVar176 = auVar20._20_4_;
      auVar45._20_4_ = local_360._20_4_ * fVar176;
      fVar177 = auVar20._24_4_;
      auVar45._24_4_ = local_360._24_4_ * fVar177;
      auVar45._28_4_ = auVar15._28_4_;
      auVar104._8_4_ = 0x3f800000;
      auVar104._0_8_ = 0x3f8000003f800000;
      auVar104._12_4_ = 0x3f800000;
      auVar104._16_4_ = 0x3f800000;
      auVar104._20_4_ = 0x3f800000;
      auVar104._24_4_ = 0x3f800000;
      auVar104._28_4_ = 0x3f800000;
      auVar15 = vsubps_avx(auVar104,auVar45);
      fVar310 = fVar310 + fVar310 * auVar15._0_4_;
      fVar365 = fVar365 + fVar365 * auVar15._4_4_;
      fVar173 = fVar173 + fVar173 * auVar15._8_4_;
      fVar174 = fVar174 + fVar174 * auVar15._12_4_;
      fVar175 = fVar175 + fVar175 * auVar15._16_4_;
      fVar176 = fVar176 + fVar176 * auVar15._20_4_;
      fVar177 = fVar177 + fVar177 * auVar15._24_4_;
      auVar213 = vsubps_avx(local_340,auVar21);
      fVar259 = auVar213._0_4_ * fVar310;
      fVar277 = auVar213._4_4_ * fVar365;
      auVar46._4_4_ = fVar277;
      auVar46._0_4_ = fVar259;
      fVar281 = auVar213._8_4_ * fVar173;
      auVar46._8_4_ = fVar281;
      fVar285 = auVar213._12_4_ * fVar174;
      auVar46._12_4_ = fVar285;
      fVar289 = auVar213._16_4_ * fVar175;
      auVar46._16_4_ = fVar289;
      fVar293 = auVar213._20_4_ * fVar176;
      auVar46._20_4_ = fVar293;
      fVar297 = auVar213._24_4_ * fVar177;
      auVar46._24_4_ = fVar297;
      auVar46._28_4_ = auVar213._28_4_;
      auVar213 = vsubps_avx(auVar21,local_9e0);
      fVar310 = auVar213._0_4_ * fVar310;
      fVar365 = auVar213._4_4_ * fVar365;
      auVar47._4_4_ = fVar365;
      auVar47._0_4_ = fVar310;
      fVar173 = auVar213._8_4_ * fVar173;
      auVar47._8_4_ = fVar173;
      fVar174 = auVar213._12_4_ * fVar174;
      auVar47._12_4_ = fVar174;
      fVar175 = auVar213._16_4_ * fVar175;
      auVar47._16_4_ = fVar175;
      fVar176 = auVar213._20_4_ * fVar176;
      auVar47._20_4_ = fVar176;
      fVar177 = auVar213._24_4_ * fVar177;
      auVar47._24_4_ = fVar177;
      auVar47._28_4_ = auVar20._28_4_ + auVar15._28_4_;
      fStack_424 = local_600._28_4_ + auVar213._28_4_;
      local_440 = local_5e0 * (local_600._0_4_ + local_580._0_4_ * fVar259);
      fStack_43c = fStack_5dc * (local_600._4_4_ + local_580._4_4_ * fVar277);
      fStack_438 = fStack_5d8 * (local_600._8_4_ + local_580._8_4_ * fVar281);
      fStack_434 = fStack_5d4 * (local_600._12_4_ + local_580._12_4_ * fVar285);
      fStack_430 = fStack_5d0 * (local_600._16_4_ + local_580._16_4_ * fVar289);
      fStack_42c = fStack_5cc * (local_600._20_4_ + local_580._20_4_ * fVar293);
      fStack_428 = fStack_5c8 * (local_600._24_4_ + local_580._24_4_ * fVar297);
      local_420 = local_5e0 * (local_600._0_4_ + local_580._0_4_ * fVar310);
      fStack_41c = fStack_5dc * (local_600._4_4_ + local_580._4_4_ * fVar365);
      fStack_418 = fStack_5d8 * (local_600._8_4_ + local_580._8_4_ * fVar173);
      fStack_414 = fStack_5d4 * (local_600._12_4_ + local_580._12_4_ * fVar174);
      fStack_410 = fStack_5d0 * (local_600._16_4_ + local_580._16_4_ * fVar175);
      fStack_40c = fStack_5cc * (local_600._20_4_ + local_580._20_4_ * fVar176);
      fStack_408 = fStack_5c8 * (local_600._24_4_ + local_580._24_4_ * fVar177);
      fStack_404 = local_600._28_4_ + fStack_424;
      auVar235._8_4_ = 0x7f800000;
      auVar235._0_8_ = 0x7f8000007f800000;
      auVar235._12_4_ = 0x7f800000;
      auVar235._16_4_ = 0x7f800000;
      auVar235._20_4_ = 0x7f800000;
      auVar235._24_4_ = 0x7f800000;
      auVar235._28_4_ = 0x7f800000;
      local_940 = vblendvps_avx(auVar235,auVar46,auVar212);
      auVar236._8_4_ = 0xff800000;
      auVar236._0_8_ = 0xff800000ff800000;
      auVar236._12_4_ = 0xff800000;
      auVar236._16_4_ = 0xff800000;
      auVar236._20_4_ = 0xff800000;
      auVar236._24_4_ = 0xff800000;
      auVar236._28_4_ = 0xff800000;
      auVar167 = vblendvps_avx(auVar236,auVar47,auVar212);
      auVar15 = vmaxps_avx(local_5c0,local_460);
      auVar48._4_4_ = auVar15._4_4_ * 1.9073486e-06;
      auVar48._0_4_ = auVar15._0_4_ * 1.9073486e-06;
      auVar48._8_4_ = auVar15._8_4_ * 1.9073486e-06;
      auVar48._12_4_ = auVar15._12_4_ * 1.9073486e-06;
      auVar48._16_4_ = auVar15._16_4_ * 1.9073486e-06;
      auVar48._20_4_ = auVar15._20_4_ * 1.9073486e-06;
      auVar48._24_4_ = auVar15._24_4_ * 1.9073486e-06;
      auVar48._28_4_ = auVar15._28_4_;
      auVar15 = vcmpps_avx(local_9c0,auVar48,1);
      auVar213 = auVar212 & auVar15;
      if ((((((((auVar213 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar213 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar213 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar213 >> 0x7f,0) != '\0') ||
            (auVar213 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar213 >> 0xbf,0) != '\0') ||
          (auVar213 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar213[0x1f] < '\0') {
        auVar96 = vandps_avx(auVar15,auVar212);
        auVar182 = vpackssdw_avx(auVar96._0_16_,auVar96._16_16_);
        auVar15 = vcmpps_avx(auVar108,_DAT_01f7b000,2);
        auVar327._8_4_ = 0xff800000;
        auVar327._0_8_ = 0xff800000ff800000;
        auVar327._12_4_ = 0xff800000;
        auVar327._16_4_ = 0xff800000;
        auVar327._20_4_ = 0xff800000;
        auVar327._24_4_ = 0xff800000;
        auVar327._28_4_ = 0xff800000;
        auVar358._8_4_ = 0x7f800000;
        auVar358._0_8_ = 0x7f8000007f800000;
        auVar358._12_4_ = 0x7f800000;
        auVar358._16_4_ = 0x7f800000;
        auVar358._20_4_ = 0x7f800000;
        auVar358._24_4_ = 0x7f800000;
        auVar358._28_4_ = 0x7f800000;
        auVar108 = vblendvps_avx(auVar358,auVar327,auVar15);
        auVar261 = vpmovsxwd_avx(auVar182);
        auVar182 = vpunpckhwd_avx(auVar182,auVar182);
        auVar272._16_16_ = auVar182;
        auVar272._0_16_ = auVar261;
        local_940 = vblendvps_avx(local_940,auVar108,auVar272);
        auVar108 = vblendvps_avx(auVar327,auVar358,auVar15);
        auVar167 = vblendvps_avx(auVar167,auVar108,auVar272);
        auVar243._0_8_ = auVar96._0_8_ ^ 0xffffffffffffffff;
        auVar243._8_4_ = auVar96._8_4_ ^ 0xffffffff;
        auVar243._12_4_ = auVar96._12_4_ ^ 0xffffffff;
        auVar243._16_4_ = auVar96._16_4_ ^ 0xffffffff;
        auVar243._20_4_ = auVar96._20_4_ ^ 0xffffffff;
        auVar243._24_4_ = auVar96._24_4_ ^ 0xffffffff;
        auVar243._28_4_ = auVar96._28_4_ ^ 0xffffffff;
        auVar96 = vorps_avx(auVar15,auVar243);
        auVar96 = vandps_avx(auVar212,auVar96);
      }
    }
    auVar387 = ZEXT3264(local_960);
    auVar346 = ZEXT3264(local_b00);
    auVar108 = local_520 & auVar96;
    auVar273 = ZEXT3264(local_9a0);
    fVar310 = (float)local_8a0._0_4_;
    fVar365 = (float)local_8a0._4_4_;
    fVar173 = fStack_898;
    fVar174 = fStack_894;
    fVar175 = fStack_890;
    fVar176 = fStack_88c;
    fVar177 = fStack_888;
    fVar259 = fStack_884;
    if ((((((((auVar108 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar108 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar108 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar108 >> 0x7f,0) == '\0') &&
          (auVar108 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar108 >> 0xbf,0) == '\0') &&
        (auVar108 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar108[0x1f])
    {
      auVar332 = ZEXT3264(local_a20);
    }
    else {
      fStack_5c4 = auVar11._28_4_ + auVar197._28_4_;
      auVar387 = ZEXT464((uint)*(float *)(ray + k * 4 + 0x80));
      auVar182 = ZEXT416((uint)(*(float *)(ray + k * 4 + 0x80) - (float)local_8f0._0_4_));
      auVar182 = vshufps_avx(auVar182,auVar182,0);
      auVar237._16_16_ = auVar182;
      auVar237._0_16_ = auVar182;
      auVar15 = vminps_avx(auVar237,auVar167);
      auVar105._0_4_ =
           (float)local_a80._0_4_ * fVar353 +
           (float)local_6e0._0_4_ * fVar339 + (float)local_880._0_4_ * fVar366;
      auVar105._4_4_ =
           (float)local_a80._4_4_ * fVar359 +
           (float)local_6e0._4_4_ * fVar347 + (float)local_880._4_4_ * fVar371;
      auVar105._8_4_ = fStack_a78 * fVar360 + fStack_6d8 * fVar348 + fStack_878 * fVar373;
      auVar105._12_4_ = fStack_a74 * fVar361 + fStack_6d4 * fVar349 + fStack_874 * fVar375;
      auVar105._16_4_ = fStack_a70 * fVar362 + fStack_6d0 * fVar350 + fStack_870 * fVar377;
      auVar105._20_4_ = fStack_a6c * fVar363 + fStack_6cc * fVar351 + fStack_86c * fVar379;
      auVar105._24_4_ = fStack_a68 * fVar364 + fStack_6c8 * fVar352 + fStack_868 * fVar381;
      auVar105._28_4_ = fVar383 + auVar341._28_4_ + fVar383;
      auVar212 = vrcpps_avx(auVar105);
      fVar383 = auVar212._0_4_;
      fVar277 = auVar212._4_4_;
      auVar49._4_4_ = auVar105._4_4_ * fVar277;
      auVar49._0_4_ = auVar105._0_4_ * fVar383;
      fVar281 = auVar212._8_4_;
      auVar49._8_4_ = auVar105._8_4_ * fVar281;
      fVar285 = auVar212._12_4_;
      auVar49._12_4_ = auVar105._12_4_ * fVar285;
      fVar289 = auVar212._16_4_;
      auVar49._16_4_ = auVar105._16_4_ * fVar289;
      fVar293 = auVar212._20_4_;
      auVar49._20_4_ = auVar105._20_4_ * fVar293;
      fVar297 = auVar212._24_4_;
      auVar49._24_4_ = auVar105._24_4_ * fVar297;
      auVar49._28_4_ = auVar96._28_4_ + auVar182._12_4_;
      auVar331._8_4_ = 0x3f800000;
      auVar331._0_8_ = 0x3f8000003f800000;
      auVar331._12_4_ = 0x3f800000;
      auVar331._16_4_ = 0x3f800000;
      auVar331._20_4_ = 0x3f800000;
      auVar331._24_4_ = 0x3f800000;
      auVar331._28_4_ = 0x3f800000;
      auVar213 = vsubps_avx(auVar331,auVar49);
      auVar270._8_4_ = 0x7fffffff;
      auVar270._0_8_ = 0x7fffffff7fffffff;
      auVar270._12_4_ = 0x7fffffff;
      auVar270._16_4_ = 0x7fffffff;
      auVar270._20_4_ = 0x7fffffff;
      auVar270._24_4_ = 0x7fffffff;
      auVar270._28_4_ = 0x7fffffff;
      auVar108 = vandps_avx(auVar105,auVar270);
      auVar307._8_4_ = 0x219392ef;
      auVar307._0_8_ = 0x219392ef219392ef;
      auVar307._12_4_ = 0x219392ef;
      auVar307._16_4_ = 0x219392ef;
      auVar307._20_4_ = 0x219392ef;
      auVar307._24_4_ = 0x219392ef;
      auVar307._28_4_ = 0x219392ef;
      auVar11 = vcmpps_avx(auVar108,auVar307,1);
      auVar50._4_4_ =
           (fVar277 + fVar277 * auVar213._4_4_) *
           -(fVar282 * fVar359 + fVar347 * fVar246 + fVar333 * fVar371);
      auVar50._0_4_ =
           (fVar383 + fVar383 * auVar213._0_4_) *
           -(fVar256 * fVar353 + fVar339 * fVar315 + fVar328 * fVar366);
      auVar50._8_4_ =
           (fVar281 + fVar281 * auVar213._8_4_) *
           -(fVar294 * fVar360 + fVar348 * fVar252 + fVar334 * fVar373);
      auVar50._12_4_ =
           (fVar285 + fVar285 * auVar213._12_4_) *
           -(fVar224 * fVar361 + fVar349 * fVar222 + fVar335 * fVar375);
      auVar50._16_4_ =
           (fVar289 + fVar289 * auVar213._16_4_) *
           -(fVar255 * fVar362 + fVar350 * fVar253 + fVar336 * fVar377);
      auVar50._20_4_ =
           (fVar293 + fVar293 * auVar213._20_4_) *
           -(fVar291 * fVar363 + fVar351 * fVar287 + fVar337 * fVar379);
      auVar50._24_4_ =
           (fVar297 + fVar297 * auVar213._24_4_) *
           -(fVar323 * fVar364 + fVar352 * fVar322 + fVar338 * fVar381);
      auVar50._28_4_ = auVar212._28_4_ + auVar213._28_4_;
      auVar108 = vcmpps_avx(auVar105,ZEXT832(0) << 0x20,1);
      auVar108 = vorps_avx(auVar11,auVar108);
      auVar326._8_4_ = 0xff800000;
      auVar326._0_8_ = 0xff800000ff800000;
      auVar326._12_4_ = 0xff800000;
      auVar326._16_4_ = 0xff800000;
      auVar326._20_4_ = 0xff800000;
      auVar326._24_4_ = 0xff800000;
      auVar326._28_4_ = 0xff800000;
      auVar108 = vblendvps_avx(auVar50,auVar326,auVar108);
      auVar212 = vcmpps_avx(auVar105,ZEXT832(0) << 0x20,6);
      auVar11 = vorps_avx(auVar11,auVar212);
      auVar357._8_4_ = 0x7f800000;
      auVar357._0_8_ = 0x7f8000007f800000;
      auVar357._12_4_ = 0x7f800000;
      auVar357._16_4_ = 0x7f800000;
      auVar357._20_4_ = 0x7f800000;
      auVar357._24_4_ = 0x7f800000;
      auVar357._28_4_ = 0x7f800000;
      auVar11 = vblendvps_avx(auVar50,auVar357,auVar11);
      auVar212 = vmaxps_avx(local_3e0,local_940);
      auVar212 = vmaxps_avx(auVar212,auVar108);
      auVar15 = vminps_avx(auVar15,auVar11);
      auVar213 = ZEXT832(0) << 0x20;
      auVar108 = vsubps_avx(auVar213,auVar12);
      auVar11 = vsubps_avx(auVar213,auVar13);
      auVar51._4_4_ = auVar11._4_4_ * -fVar115;
      auVar51._0_4_ = auVar11._0_4_ * -fVar84;
      auVar51._8_4_ = auVar11._8_4_ * -fVar117;
      auVar51._12_4_ = auVar11._12_4_ * -fVar119;
      auVar51._16_4_ = auVar11._16_4_ * -fVar120;
      auVar51._20_4_ = auVar11._20_4_ * -fVar121;
      auVar51._24_4_ = auVar11._24_4_ * -fVar122;
      auVar51._28_4_ = auVar11._28_4_;
      auVar52._4_4_ = fVar278 * auVar108._4_4_;
      auVar52._0_4_ = fVar314 * auVar108._0_4_;
      auVar52._8_4_ = fVar290 * auVar108._8_4_;
      auVar52._12_4_ = fVar221 * auVar108._12_4_;
      auVar52._16_4_ = fVar251 * auVar108._16_4_;
      auVar52._20_4_ = fVar283 * auVar108._20_4_;
      auVar52._24_4_ = fVar389 * auVar108._24_4_;
      auVar52._28_4_ = auVar108._28_4_;
      auVar108 = vsubps_avx(auVar51,auVar52);
      auVar11 = vsubps_avx(auVar213,auVar14);
      auVar53._4_4_ = fVar372 * auVar11._4_4_;
      auVar53._0_4_ = fVar367 * auVar11._0_4_;
      auVar53._8_4_ = fVar374 * auVar11._8_4_;
      auVar53._12_4_ = fVar376 * auVar11._12_4_;
      auVar53._16_4_ = fVar378 * auVar11._16_4_;
      auVar53._20_4_ = fVar380 * auVar11._20_4_;
      uVar1 = auVar11._28_4_;
      auVar53._24_4_ = fVar382 * auVar11._24_4_;
      auVar53._28_4_ = uVar1;
      auVar12 = vsubps_avx(auVar108,auVar53);
      auVar54._4_4_ = (float)local_880._4_4_ * -fVar115;
      auVar54._0_4_ = (float)local_880._0_4_ * -fVar84;
      auVar54._8_4_ = fStack_878 * -fVar117;
      auVar54._12_4_ = fStack_874 * -fVar119;
      auVar54._16_4_ = fStack_870 * -fVar120;
      auVar54._20_4_ = fStack_86c * -fVar121;
      auVar54._24_4_ = fStack_868 * -fVar122;
      auVar54._28_4_ = local_a40._28_4_ ^ 0x80000000;
      auVar55._4_4_ = (float)local_6e0._4_4_ * fVar278;
      auVar55._0_4_ = (float)local_6e0._0_4_ * fVar314;
      auVar55._8_4_ = fStack_6d8 * fVar290;
      auVar55._12_4_ = fStack_6d4 * fVar221;
      auVar55._16_4_ = fStack_6d0 * fVar251;
      auVar55._20_4_ = fStack_6cc * fVar283;
      auVar55._24_4_ = fStack_6c8 * fVar389;
      auVar55._28_4_ = uVar1;
      auVar342._8_4_ = 0x3f800000;
      auVar342._0_8_ = 0x3f8000003f800000;
      auVar342._12_4_ = 0x3f800000;
      auVar342._16_4_ = 0x3f800000;
      auVar342._20_4_ = 0x3f800000;
      auVar342._24_4_ = 0x3f800000;
      auVar342._28_4_ = 0x3f800000;
      auVar108 = vsubps_avx(auVar54,auVar55);
      auVar56._4_4_ = (float)local_a80._4_4_ * fVar372;
      auVar56._0_4_ = (float)local_a80._0_4_ * fVar367;
      auVar56._8_4_ = fStack_a78 * fVar374;
      auVar56._12_4_ = fStack_a74 * fVar376;
      auVar56._16_4_ = fStack_a70 * fVar378;
      auVar56._20_4_ = fStack_a6c * fVar380;
      auVar56._24_4_ = fStack_a68 * fVar382;
      auVar56._28_4_ = uVar1;
      auVar13 = vsubps_avx(auVar108,auVar56);
      auVar108 = vrcpps_avx(auVar13);
      fVar314 = auVar108._0_4_;
      auVar238._0_4_ = auVar13._0_4_ * fVar314;
      fVar315 = auVar108._4_4_;
      auVar238._4_4_ = auVar13._4_4_ * fVar315;
      fVar256 = auVar108._8_4_;
      auVar238._8_4_ = auVar13._8_4_ * fVar256;
      fVar278 = auVar108._12_4_;
      auVar238._12_4_ = auVar13._12_4_ * fVar278;
      fVar246 = auVar108._16_4_;
      auVar238._16_4_ = auVar13._16_4_ * fVar246;
      fVar282 = auVar108._20_4_;
      auVar238._20_4_ = auVar13._20_4_ * fVar282;
      fVar290 = auVar108._24_4_;
      auVar238._24_4_ = auVar13._24_4_ * fVar290;
      auVar238._28_4_ = 0;
      auVar14 = vsubps_avx(auVar342,auVar238);
      auVar106._8_4_ = 0x7fffffff;
      auVar106._0_8_ = 0x7fffffff7fffffff;
      auVar106._12_4_ = 0x7fffffff;
      auVar106._16_4_ = 0x7fffffff;
      auVar106._20_4_ = 0x7fffffff;
      auVar106._24_4_ = 0x7fffffff;
      auVar106._28_4_ = 0x7fffffff;
      auVar108 = vandps_avx(auVar13,auVar106);
      auVar11 = vcmpps_avx(auVar108,auVar307,1);
      auVar57._4_4_ = (fVar315 + fVar315 * auVar14._4_4_) * -auVar12._4_4_;
      auVar57._0_4_ = (fVar314 + fVar314 * auVar14._0_4_) * -auVar12._0_4_;
      auVar57._8_4_ = (fVar256 + fVar256 * auVar14._8_4_) * -auVar12._8_4_;
      auVar57._12_4_ = (fVar278 + fVar278 * auVar14._12_4_) * -auVar12._12_4_;
      auVar57._16_4_ = (fVar246 + fVar246 * auVar14._16_4_) * -auVar12._16_4_;
      auVar57._20_4_ = (fVar282 + fVar282 * auVar14._20_4_) * -auVar12._20_4_;
      auVar57._24_4_ = (fVar290 + fVar290 * auVar14._24_4_) * -auVar12._24_4_;
      auVar57._28_4_ = auVar12._28_4_ ^ 0x80000000;
      auVar108 = vcmpps_avx(auVar13,ZEXT832(0) << 0x20,1);
      auVar108 = vorps_avx(auVar11,auVar108);
      auVar108 = vblendvps_avx(auVar57,auVar326,auVar108);
      local_700 = vmaxps_avx(auVar212,auVar108);
      auVar108 = vcmpps_avx(auVar13,ZEXT832(0) << 0x20,6);
      auVar108 = vorps_avx(auVar11,auVar108);
      auVar108 = vblendvps_avx(auVar57,auVar357,auVar108);
      auVar96 = vandps_avx(local_520,auVar96);
      local_480 = vminps_avx(auVar15,auVar108);
      auVar108 = vcmpps_avx(local_700,local_480,2);
      auVar11 = auVar96 & auVar108;
      if ((((((((auVar11 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar11 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar11 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar11 >> 0x7f,0) != '\0') ||
            (auVar11 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar11 >> 0xbf,0) != '\0') ||
          (auVar11 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar11[0x1f] < '\0') {
        auVar11 = vminps_avx(auVar269,auVar166);
        auVar12 = vminps_avx(local_640,local_660);
        auVar11 = vminps_avx(auVar11,auVar12);
        auVar11 = vsubps_avx(auVar11,local_2e0);
        auVar96 = vandps_avx(auVar108,auVar96);
        auVar72._4_4_ = fStack_43c;
        auVar72._0_4_ = local_440;
        auVar72._8_4_ = fStack_438;
        auVar72._12_4_ = fStack_434;
        auVar72._16_4_ = fStack_430;
        auVar72._20_4_ = fStack_42c;
        auVar72._24_4_ = fStack_428;
        auVar72._28_4_ = fStack_424;
        auVar108 = vminps_avx(auVar72,auVar342);
        auVar209 = SUB6428(ZEXT864(0),0) << 0x20;
        auVar108 = vmaxps_avx(auVar108,ZEXT832(0) << 0x20);
        local_1a0[0] = fVar83 + fVar123 * (auVar108._0_4_ + 0.0) * 0.125;
        local_1a0[1] = fVar114 + fVar154 * (auVar108._4_4_ + 1.0) * 0.125;
        local_1a0[2] = fVar116 + fVar155 * (auVar108._8_4_ + 2.0) * 0.125;
        local_1a0[3] = fVar118 + fVar156 * (auVar108._12_4_ + 3.0) * 0.125;
        fStack_190 = fVar83 + fVar123 * (auVar108._16_4_ + 4.0) * 0.125;
        fStack_18c = fVar114 + fVar154 * (auVar108._20_4_ + 5.0) * 0.125;
        fStack_188 = fVar116 + fVar155 * (auVar108._24_4_ + 6.0) * 0.125;
        fStack_184 = fVar118 + auVar108._28_4_ + 7.0;
        auVar73._4_4_ = fStack_41c;
        auVar73._0_4_ = local_420;
        auVar73._8_4_ = fStack_418;
        auVar73._12_4_ = fStack_414;
        auVar73._16_4_ = fStack_410;
        auVar73._20_4_ = fStack_40c;
        auVar73._24_4_ = fStack_408;
        auVar73._28_4_ = fStack_404;
        auVar108 = vminps_avx(auVar73,auVar342);
        auVar108 = vmaxps_avx(auVar108,ZEXT832(0) << 0x20);
        local_1c0[0] = fVar83 + fVar123 * (auVar108._0_4_ + 0.0) * 0.125;
        local_1c0[1] = fVar114 + fVar154 * (auVar108._4_4_ + 1.0) * 0.125;
        local_1c0[2] = fVar116 + fVar155 * (auVar108._8_4_ + 2.0) * 0.125;
        local_1c0[3] = fVar118 + fVar156 * (auVar108._12_4_ + 3.0) * 0.125;
        fStack_1b0 = fVar83 + fVar123 * (auVar108._16_4_ + 4.0) * 0.125;
        fStack_1ac = fVar114 + fVar154 * (auVar108._20_4_ + 5.0) * 0.125;
        fStack_1a8 = fVar116 + fVar155 * (auVar108._24_4_ + 6.0) * 0.125;
        fStack_1a4 = fVar118 + auVar108._28_4_ + 7.0;
        auVar58._4_4_ = auVar11._4_4_ * 0.99999976;
        auVar58._0_4_ = auVar11._0_4_ * 0.99999976;
        auVar58._8_4_ = auVar11._8_4_ * 0.99999976;
        auVar58._12_4_ = auVar11._12_4_ * 0.99999976;
        auVar58._16_4_ = auVar11._16_4_ * 0.99999976;
        auVar58._20_4_ = auVar11._20_4_ * 0.99999976;
        auVar58._24_4_ = auVar11._24_4_ * 0.99999976;
        auVar58._28_4_ = 0x3f7ffffc;
        auVar108 = vmaxps_avx(ZEXT832(0) << 0x20,auVar58);
        auVar59._4_4_ = auVar108._4_4_ * auVar108._4_4_;
        auVar59._0_4_ = auVar108._0_4_ * auVar108._0_4_;
        auVar59._8_4_ = auVar108._8_4_ * auVar108._8_4_;
        auVar59._12_4_ = auVar108._12_4_ * auVar108._12_4_;
        auVar59._16_4_ = auVar108._16_4_ * auVar108._16_4_;
        auVar59._20_4_ = auVar108._20_4_ * auVar108._20_4_;
        auVar59._24_4_ = auVar108._24_4_ * auVar108._24_4_;
        auVar59._28_4_ = auVar108._28_4_;
        local_ac0 = vsubps_avx(local_680,auVar59);
        auVar60._4_4_ = local_ac0._4_4_ * (float)local_6c0._4_4_;
        auVar60._0_4_ = local_ac0._0_4_ * (float)local_6c0._0_4_;
        auVar60._8_4_ = local_ac0._8_4_ * fStack_6b8;
        auVar60._12_4_ = local_ac0._12_4_ * fStack_6b4;
        auVar60._16_4_ = local_ac0._16_4_ * fStack_6b0;
        auVar60._20_4_ = local_ac0._20_4_ * fStack_6ac;
        auVar60._24_4_ = local_ac0._24_4_ * fStack_6a8;
        auVar60._28_4_ = auVar108._28_4_;
        auVar11 = vsubps_avx(local_6a0,auVar60);
        auVar108 = vcmpps_avx(auVar11,ZEXT832(0) << 0x20,5);
        if ((((((((auVar108 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar108 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar108 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar108 >> 0x7f,0) == '\0') &&
              (auVar108 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar108 >> 0xbf,0) == '\0') &&
            (auVar108 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar108[0x1f]) {
          auVar264 = ZEXT828(0) << 0x20;
          auVar232 = SUB6428(ZEXT864(0),0) << 0x20;
          auVar388 = SUB6428(ZEXT864(0),0) << 0x20;
          _local_b20 = ZEXT832(0) << 0x20;
          _local_c80 = local_b20._0_28_;
          auVar308._8_4_ = 0x7f800000;
          auVar308._0_8_ = 0x7f8000007f800000;
          auVar308._12_4_ = 0x7f800000;
          auVar308._16_4_ = 0x7f800000;
          auVar308._20_4_ = 0x7f800000;
          auVar308._24_4_ = 0x7f800000;
          auVar308._28_4_ = 0x7f800000;
          auVar343._8_4_ = 0xff800000;
          auVar343._0_8_ = 0xff800000ff800000;
          auVar343._12_4_ = 0xff800000;
          auVar343._16_4_ = 0xff800000;
          auVar343._20_4_ = 0xff800000;
          auVar343._24_4_ = 0xff800000;
          auVar343._28_4_ = 0xff800000;
          local_ac0 = auVar23;
        }
        else {
          auVar12 = vrcpps_avx(local_360);
          fVar314 = auVar12._0_4_;
          auVar214._0_4_ = local_360._0_4_ * fVar314;
          fVar315 = auVar12._4_4_;
          auVar214._4_4_ = local_360._4_4_ * fVar315;
          fVar256 = auVar12._8_4_;
          auVar214._8_4_ = local_360._8_4_ * fVar256;
          fVar278 = auVar12._12_4_;
          auVar214._12_4_ = local_360._12_4_ * fVar278;
          fVar246 = auVar12._16_4_;
          auVar214._16_4_ = local_360._16_4_ * fVar246;
          fVar282 = auVar12._20_4_;
          auVar214._20_4_ = local_360._20_4_ * fVar282;
          fVar290 = auVar12._24_4_;
          auVar214._24_4_ = local_360._24_4_ * fVar290;
          auVar214._28_4_ = 0;
          auVar14 = vsubps_avx(auVar342,auVar214);
          auVar13 = vsqrtps_avx(auVar11);
          fVar314 = fVar314 + fVar314 * auVar14._0_4_;
          fVar315 = fVar315 + fVar315 * auVar14._4_4_;
          fVar256 = fVar256 + fVar256 * auVar14._8_4_;
          fVar278 = fVar278 + fVar278 * auVar14._12_4_;
          fVar246 = fVar246 + fVar246 * auVar14._16_4_;
          fVar282 = fVar282 + fVar282 * auVar14._20_4_;
          fVar290 = fVar290 + fVar290 * auVar14._24_4_;
          auVar212 = vsubps_avx(local_340,auVar13);
          fVar255 = auVar212._0_4_ * fVar314;
          fVar283 = auVar212._4_4_ * fVar315;
          auVar61._4_4_ = fVar283;
          auVar61._0_4_ = fVar255;
          fVar287 = auVar212._8_4_ * fVar256;
          auVar61._8_4_ = fVar287;
          fVar291 = auVar212._12_4_ * fVar278;
          auVar61._12_4_ = fVar291;
          fVar389 = auVar212._16_4_ * fVar246;
          auVar61._16_4_ = fVar389;
          fVar322 = auVar212._20_4_ * fVar282;
          auVar61._20_4_ = fVar322;
          fVar323 = auVar212._24_4_ * fVar290;
          auVar61._24_4_ = fVar323;
          auVar61._28_4_ = fStack_864;
          auVar212 = vsubps_avx(auVar13,local_9e0);
          fVar314 = auVar212._0_4_ * fVar314;
          fVar315 = auVar212._4_4_ * fVar315;
          auVar62._4_4_ = fVar315;
          auVar62._0_4_ = fVar314;
          fVar256 = auVar212._8_4_ * fVar256;
          auVar62._8_4_ = fVar256;
          fVar278 = auVar212._12_4_ * fVar278;
          auVar62._12_4_ = fVar278;
          fVar246 = auVar212._16_4_ * fVar246;
          auVar62._16_4_ = fVar246;
          fVar282 = auVar212._20_4_ * fVar282;
          auVar62._20_4_ = fVar282;
          fVar290 = auVar212._24_4_ * fVar290;
          auVar62._24_4_ = fVar290;
          auVar62._28_4_ = fVar156;
          fVar252 = (fVar255 * local_580._0_4_ + local_600._0_4_) * local_5e0;
          fVar294 = (fVar283 * local_580._4_4_ + local_600._4_4_) * fStack_5dc;
          fVar221 = (fVar287 * local_580._8_4_ + local_600._8_4_) * fStack_5d8;
          fVar222 = (fVar291 * local_580._12_4_ + local_600._12_4_) * fStack_5d4;
          fVar224 = (fVar389 * local_580._16_4_ + local_600._16_4_) * fStack_5d0;
          fVar251 = (fVar322 * local_580._20_4_ + local_600._20_4_) * fStack_5cc;
          fVar253 = (fVar323 * local_580._24_4_ + local_600._24_4_) * fStack_5c8;
          auVar168._0_4_ = fVar258 + fVar252 * fVar313;
          auVar168._4_4_ = fVar276 + fVar294 * fVar244;
          auVar168._8_4_ = fVar280 + fVar221 * fVar250;
          auVar168._12_4_ = fVar284 + fVar222 * fVar220;
          auVar168._16_4_ = fVar288 + fVar224 * fVar249;
          auVar168._20_4_ = fVar292 + fVar251 * fVar279;
          auVar168._24_4_ = fVar296 + fVar253 * fVar18;
          auVar168._28_4_ = fVar298 + auVar12._28_4_ + auVar14._28_4_ + local_600._28_4_;
          auVar63._4_4_ = fVar283 * (float)local_a80._4_4_;
          auVar63._0_4_ = fVar255 * (float)local_a80._0_4_;
          auVar63._8_4_ = fVar287 * fStack_a78;
          auVar63._12_4_ = fVar291 * fStack_a74;
          auVar63._16_4_ = fVar389 * fStack_a70;
          auVar63._20_4_ = fVar322 * fStack_a6c;
          auVar63._24_4_ = fVar323 * fStack_a68;
          auVar63._28_4_ = auVar13._28_4_;
          local_980 = vsubps_avx(auVar63,auVar168);
          auVar239._0_4_ = (float)local_a60._0_4_ + fVar252 * fVar311;
          auVar239._4_4_ = local_a60._4_4_ + fVar294 * fVar223;
          auVar239._8_4_ = local_a60._8_4_ + fVar221 * fVar248;
          auVar239._12_4_ = local_a60._12_4_ + fVar222 * fVar254;
          auVar239._16_4_ = local_a60._16_4_ + fVar224 * fVar245;
          auVar239._20_4_ = local_a60._20_4_ + fVar251 * fVar257;
          auVar239._24_4_ = local_a60._24_4_ + fVar253 * fVar295;
          auVar239._28_4_ = local_a60._28_4_ + auVar13._28_4_;
          auVar64._4_4_ = (float)local_6e0._4_4_ * fVar283;
          auVar64._0_4_ = (float)local_6e0._0_4_ * fVar255;
          auVar64._8_4_ = fStack_6d8 * fVar287;
          auVar64._12_4_ = fStack_6d4 * fVar291;
          auVar64._16_4_ = fStack_6d0 * fVar389;
          auVar64._20_4_ = fStack_6cc * fVar322;
          auVar64._24_4_ = fStack_6c8 * fVar323;
          auVar64._28_4_ = 0x3e000000;
          auVar12 = vsubps_avx(auVar64,auVar239);
          _local_c80 = auVar12._0_28_;
          auVar215._0_4_ = local_300._0_4_ + fVar312 * fVar252;
          auVar215._4_4_ = local_300._4_4_ + fVar274 * fVar294;
          auVar215._8_4_ = local_300._8_4_ + fVar286 * fVar221;
          auVar215._12_4_ = local_300._12_4_ + fVar219 * fVar222;
          auVar215._16_4_ = local_300._16_4_ + fVar247 * fVar224;
          auVar215._20_4_ = local_300._20_4_ + fVar275 * fVar251;
          auVar215._24_4_ = local_300._24_4_ + fVar17 * fVar253;
          auVar215._28_4_ = local_300._28_4_ + auVar212._28_4_;
          auVar65._4_4_ = fVar283 * (float)local_880._4_4_;
          auVar65._0_4_ = fVar255 * (float)local_880._0_4_;
          auVar65._8_4_ = fVar287 * fStack_878;
          auVar65._12_4_ = fVar291 * fStack_874;
          auVar65._16_4_ = fVar389 * fStack_870;
          auVar65._20_4_ = fVar322 * fStack_86c;
          auVar65._24_4_ = fVar323 * fStack_868;
          auVar65._28_4_ = auVar239._28_4_;
          _local_b20 = vsubps_avx(auVar65,auVar215);
          fVar252 = (fVar314 * local_580._0_4_ + local_600._0_4_) * local_5e0;
          fVar294 = (fVar315 * local_580._4_4_ + local_600._4_4_) * fStack_5dc;
          fVar221 = (fVar256 * local_580._8_4_ + local_600._8_4_) * fStack_5d8;
          fVar222 = (fVar278 * local_580._12_4_ + local_600._12_4_) * fStack_5d4;
          fVar224 = (fVar246 * local_580._16_4_ + local_600._16_4_) * fStack_5d0;
          fVar251 = (fVar282 * local_580._20_4_ + local_600._20_4_) * fStack_5cc;
          fVar253 = (fVar290 * local_580._24_4_ + local_600._24_4_) * fStack_5c8;
          auVar216._0_4_ = fVar258 + fVar252 * fVar313;
          auVar216._4_4_ = fVar276 + fVar294 * fVar244;
          auVar216._8_4_ = fVar280 + fVar221 * fVar250;
          auVar216._12_4_ = fVar284 + fVar222 * fVar220;
          auVar216._16_4_ = fVar288 + fVar224 * fVar249;
          auVar216._20_4_ = fVar292 + fVar251 * fVar279;
          auVar216._24_4_ = fVar296 + fVar253 * fVar18;
          auVar216._28_4_ = fVar298 + local_b20._28_4_ + local_600._28_4_;
          auVar66._4_4_ = fVar315 * (float)local_a80._4_4_;
          auVar66._0_4_ = fVar314 * (float)local_a80._0_4_;
          auVar66._8_4_ = fVar256 * fStack_a78;
          auVar66._12_4_ = fVar278 * fStack_a74;
          auVar66._16_4_ = fVar246 * fStack_a70;
          auVar66._20_4_ = fVar282 * fStack_a6c;
          auVar66._24_4_ = fVar290 * fStack_a68;
          auVar66._28_4_ = 0x3e000000;
          auVar12 = vsubps_avx(auVar66,auVar216);
          auVar209 = auVar12._0_28_;
          auVar271._0_4_ = (float)local_a60._0_4_ + fVar252 * fVar311;
          auVar271._4_4_ = local_a60._4_4_ + fVar294 * fVar223;
          auVar271._8_4_ = local_a60._8_4_ + fVar221 * fVar248;
          auVar271._12_4_ = local_a60._12_4_ + fVar222 * fVar254;
          auVar271._16_4_ = local_a60._16_4_ + fVar224 * fVar245;
          auVar271._20_4_ = local_a60._20_4_ + fVar251 * fVar257;
          auVar271._24_4_ = local_a60._24_4_ + fVar253 * fVar295;
          auVar271._28_4_ = local_a60._28_4_ + 0.125;
          auVar67._4_4_ = (float)local_6e0._4_4_ * fVar315;
          auVar67._0_4_ = (float)local_6e0._0_4_ * fVar314;
          auVar67._8_4_ = fStack_6d8 * fVar256;
          auVar67._12_4_ = fStack_6d4 * fVar278;
          auVar67._16_4_ = fStack_6d0 * fVar246;
          auVar67._20_4_ = fStack_6cc * fVar282;
          auVar67._24_4_ = fStack_6c8 * fVar290;
          auVar67._28_4_ = fStack_a64;
          auVar12 = vsubps_avx(auVar67,auVar271);
          auVar264 = auVar12._0_28_;
          auVar240._0_4_ = local_300._0_4_ + fVar312 * fVar252;
          auVar240._4_4_ = local_300._4_4_ + fVar274 * fVar294;
          auVar240._8_4_ = local_300._8_4_ + fVar286 * fVar221;
          auVar240._12_4_ = local_300._12_4_ + fVar219 * fVar222;
          auVar240._16_4_ = local_300._16_4_ + fVar247 * fVar224;
          auVar240._20_4_ = local_300._20_4_ + fVar275 * fVar251;
          auVar240._24_4_ = local_300._24_4_ + fVar17 * fVar253;
          auVar240._28_4_ = local_300._28_4_ + auVar239._28_4_;
          auVar68._4_4_ = fVar315 * (float)local_880._4_4_;
          auVar68._0_4_ = fVar314 * (float)local_880._0_4_;
          auVar68._8_4_ = fVar256 * fStack_878;
          auVar68._12_4_ = fVar278 * fStack_874;
          auVar68._16_4_ = fVar246 * fStack_870;
          auVar68._20_4_ = fVar282 * fStack_86c;
          auVar68._24_4_ = fVar290 * fStack_868;
          auVar68._28_4_ = fStack_a64;
          auVar12 = vsubps_avx(auVar68,auVar240);
          auVar232 = auVar12._0_28_;
          auVar11 = vcmpps_avx(auVar11,ZEXT832(0) << 0x20,5);
          auVar309._8_4_ = 0x7f800000;
          auVar309._0_8_ = 0x7f8000007f800000;
          auVar309._12_4_ = 0x7f800000;
          auVar309._16_4_ = 0x7f800000;
          auVar309._20_4_ = 0x7f800000;
          auVar309._24_4_ = 0x7f800000;
          auVar309._28_4_ = 0x7f800000;
          auVar308 = vblendvps_avx(auVar309,auVar61,auVar11);
          auVar12 = vmaxps_avx(local_5c0,local_460);
          auVar69._4_4_ = auVar12._4_4_ * 1.9073486e-06;
          auVar69._0_4_ = auVar12._0_4_ * 1.9073486e-06;
          auVar69._8_4_ = auVar12._8_4_ * 1.9073486e-06;
          auVar69._12_4_ = auVar12._12_4_ * 1.9073486e-06;
          auVar69._16_4_ = auVar12._16_4_ * 1.9073486e-06;
          auVar69._20_4_ = auVar12._20_4_ * 1.9073486e-06;
          auVar69._24_4_ = auVar12._24_4_ * 1.9073486e-06;
          auVar69._28_4_ = auVar12._28_4_;
          auVar12 = vcmpps_avx(local_9c0,auVar69,1);
          auVar344._8_4_ = 0xff800000;
          auVar344._0_8_ = 0xff800000ff800000;
          auVar344._12_4_ = 0xff800000;
          auVar344._16_4_ = 0xff800000;
          auVar344._20_4_ = 0xff800000;
          auVar344._24_4_ = 0xff800000;
          auVar344._28_4_ = 0xff800000;
          auVar343 = vblendvps_avx(auVar344,auVar62,auVar11);
          auVar13 = auVar11 & auVar12;
          if ((((((((auVar13 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar13 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar13 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar13 >> 0x7f,0) != '\0') ||
                (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar13 >> 0xbf,0) != '\0') ||
              (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar13[0x1f] < '\0') {
            auVar108 = vandps_avx(auVar12,auVar11);
            auVar182 = vpackssdw_avx(auVar108._0_16_,auVar108._16_16_);
            auVar13 = vcmpps_avx(local_ac0,_DAT_01f7b000,2);
            auVar153._8_4_ = 0xff800000;
            auVar153._0_8_ = 0xff800000ff800000;
            auVar153._12_4_ = 0xff800000;
            auVar153._16_4_ = 0xff800000;
            auVar153._20_4_ = 0xff800000;
            auVar153._24_4_ = 0xff800000;
            auVar153._28_4_ = 0xff800000;
            auVar172._8_4_ = 0x7f800000;
            auVar172._0_8_ = 0x7f8000007f800000;
            auVar172._12_4_ = 0x7f800000;
            auVar172._16_4_ = 0x7f800000;
            auVar172._20_4_ = 0x7f800000;
            auVar172._24_4_ = 0x7f800000;
            auVar172._28_4_ = 0x7f800000;
            auVar12 = vblendvps_avx(auVar172,auVar153,auVar13);
            auVar261 = vpmovsxwd_avx(auVar182);
            auVar182 = vpunpckhwd_avx(auVar182,auVar182);
            auVar386._16_16_ = auVar182;
            auVar386._0_16_ = auVar261;
            auVar308 = vblendvps_avx(auVar308,auVar12,auVar386);
            auVar12 = vblendvps_avx(auVar153,auVar172,auVar13);
            auVar343 = vblendvps_avx(auVar343,auVar12,auVar386);
            auVar199._0_8_ = auVar108._0_8_ ^ 0xffffffffffffffff;
            auVar199._8_4_ = auVar108._8_4_ ^ 0xffffffff;
            auVar199._12_4_ = auVar108._12_4_ ^ 0xffffffff;
            auVar199._16_4_ = auVar108._16_4_ ^ 0xffffffff;
            auVar199._20_4_ = auVar108._20_4_ ^ 0xffffffff;
            auVar199._24_4_ = auVar108._24_4_ ^ 0xffffffff;
            auVar199._28_4_ = auVar108._28_4_ ^ 0xffffffff;
            auVar108 = vorps_avx(auVar13,auVar199);
            auVar108 = vandps_avx(auVar11,auVar108);
          }
          auVar388 = local_980._0_28_;
        }
        _local_4e0 = local_700;
        local_4c0 = vminps_avx(local_480,auVar308);
        _local_800 = vmaxps_avx(local_700,auVar343);
        _local_4a0 = _local_800;
        auVar11 = vcmpps_avx(local_700,local_4c0,2);
        local_640 = vandps_avx(auVar96,auVar11);
        auVar11 = vcmpps_avx(_local_800,local_480,2);
        local_840 = vandps_avx(auVar96,auVar11);
        auVar96 = vorps_avx(local_840,local_640);
        if ((((((((auVar96 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar96 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar96 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar96 >> 0x7f,0) != '\0') ||
              (auVar96 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar96 >> 0xbf,0) != '\0') ||
            (auVar96 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar96[0x1f] < '\0') {
          auStack_8b8 = auVar269._8_24_;
          auVar145._0_8_ = auVar108._0_8_ ^ 0xffffffffffffffff;
          auVar145._8_4_ = auVar108._8_4_ ^ 0xffffffff;
          auVar145._12_4_ = auVar108._12_4_ ^ 0xffffffff;
          auVar145._16_4_ = auVar108._16_4_ ^ 0xffffffff;
          auVar145._20_4_ = auVar108._20_4_ ^ 0xffffffff;
          auVar145._24_4_ = auVar108._24_4_ ^ 0xffffffff;
          fVar310 = auVar108._28_4_;
          auVar145._28_4_ = (uint)fVar310 ^ 0xffffffff;
          auVar109._0_4_ =
               (float)local_a80._0_4_ * auVar209._0_4_ +
               (float)local_6e0._0_4_ * auVar264._0_4_ + (float)local_880._0_4_ * auVar232._0_4_;
          auVar109._4_4_ =
               (float)local_a80._4_4_ * auVar209._4_4_ +
               (float)local_6e0._4_4_ * auVar264._4_4_ + (float)local_880._4_4_ * auVar232._4_4_;
          auVar109._8_4_ =
               fStack_a78 * auVar209._8_4_ +
               fStack_6d8 * auVar264._8_4_ + fStack_878 * auVar232._8_4_;
          auVar109._12_4_ =
               fStack_a74 * auVar209._12_4_ +
               fStack_6d4 * auVar264._12_4_ + fStack_874 * auVar232._12_4_;
          auVar109._16_4_ =
               fStack_a70 * auVar209._16_4_ +
               fStack_6d0 * auVar264._16_4_ + fStack_870 * auVar232._16_4_;
          auVar109._20_4_ =
               fStack_a6c * auVar209._20_4_ +
               fStack_6cc * auVar264._20_4_ + fStack_86c * auVar232._20_4_;
          auVar109._24_4_ =
               fStack_a68 * auVar209._24_4_ +
               fStack_6c8 * auVar264._24_4_ + fStack_868 * auVar232._24_4_;
          auVar109._28_4_ = fVar310 + local_840._28_4_ + auVar96._28_4_;
          auVar217._8_4_ = 0x7fffffff;
          auVar217._0_8_ = 0x7fffffff7fffffff;
          auVar217._12_4_ = 0x7fffffff;
          auVar217._16_4_ = 0x7fffffff;
          auVar217._20_4_ = 0x7fffffff;
          auVar217._24_4_ = 0x7fffffff;
          auVar217._28_4_ = 0x7fffffff;
          auVar96 = vandps_avx(auVar109,auVar217);
          auVar241._8_4_ = 0x3e99999a;
          auVar241._0_8_ = 0x3e99999a3e99999a;
          auVar241._12_4_ = 0x3e99999a;
          auVar241._16_4_ = 0x3e99999a;
          auVar241._20_4_ = 0x3e99999a;
          auVar241._24_4_ = 0x3e99999a;
          auVar241._28_4_ = 0x3e99999a;
          auVar96 = vcmpps_avx(auVar96,auVar241,1);
          local_680 = vorps_avx(auVar96,auVar145);
          auVar110._0_4_ =
               auVar388._0_4_ * (float)local_a80._0_4_ +
               (float)local_6e0._0_4_ * (float)local_c80._0_4_ +
               (float)local_880._0_4_ * (float)local_b20._0_4_;
          auVar110._4_4_ =
               auVar388._4_4_ * (float)local_a80._4_4_ +
               (float)local_6e0._4_4_ * (float)local_c80._4_4_ +
               (float)local_880._4_4_ * (float)local_b20._4_4_;
          auVar110._8_4_ =
               auVar388._8_4_ * fStack_a78 + fStack_6d8 * fStack_c78 + fStack_878 * fStack_b18;
          auVar110._12_4_ =
               auVar388._12_4_ * fStack_a74 + fStack_6d4 * fStack_c74 + fStack_874 * fStack_b14;
          auVar110._16_4_ =
               auVar388._16_4_ * fStack_a70 + fStack_6d0 * fStack_c70 + fStack_870 * fStack_b10;
          auVar110._20_4_ =
               auVar388._20_4_ * fStack_a6c + fStack_6cc * fStack_c6c + fStack_86c * fStack_b0c;
          auVar110._24_4_ =
               auVar388._24_4_ * fStack_a68 + fStack_6c8 * fStack_c68 + fStack_868 * fStack_b08;
          auVar110._28_4_ = local_680._28_4_ + local_640._28_4_ + fVar310;
          auVar96 = vandps_avx(auVar110,auVar217);
          auVar96 = vcmpps_avx(auVar96,auVar241,1);
          auVar96 = vorps_avx(auVar96,auVar145);
          auVar146._8_4_ = 3;
          auVar146._0_8_ = 0x300000003;
          auVar146._12_4_ = 3;
          auVar146._16_4_ = 3;
          auVar146._20_4_ = 3;
          auVar146._24_4_ = 3;
          auVar146._28_4_ = 3;
          auVar170._8_4_ = 2;
          auVar170._0_8_ = 0x200000002;
          auVar170._12_4_ = 2;
          auVar170._16_4_ = 2;
          auVar170._20_4_ = 2;
          auVar170._24_4_ = 2;
          auVar170._28_4_ = 2;
          auVar96 = vblendvps_avx(auVar170,auVar146,auVar96);
          local_6a0 = ZEXT432(local_ca8);
          _local_6c0 = vpshufd_avx(ZEXT416(local_ca8),0);
          auVar182 = vpcmpgtd_avx(auVar96._16_16_,_local_6c0);
          auVar261 = vpcmpgtd_avx(auVar96._0_16_,_local_6c0);
          auVar147._16_16_ = auVar182;
          auVar147._0_16_ = auVar261;
          local_660 = vblendps_avx(ZEXT1632(auVar261),auVar147,0xf0);
          auVar96 = vandnps_avx(local_660,local_640);
          local_820._4_4_ = local_700._4_4_ + (float)local_8a0._4_4_;
          local_820._0_4_ = local_700._0_4_ + (float)local_8a0._0_4_;
          fStack_818 = local_700._8_4_ + fStack_898;
          fStack_814 = local_700._12_4_ + fStack_894;
          fStack_810 = local_700._16_4_ + fStack_890;
          fStack_80c = local_700._20_4_ + fStack_88c;
          fStack_808 = local_700._24_4_ + fStack_888;
          fStack_804 = local_700._28_4_ + fStack_884;
          while( true ) {
            local_500 = auVar96;
            local_b80 = auVar5._0_4_;
            fStack_b7c = auVar5._4_4_;
            fStack_b78 = auVar5._8_4_;
            fStack_b74 = auVar5._12_4_;
            local_b60 = auVar3._0_4_;
            fStack_b5c = auVar3._4_4_;
            fStack_b58 = auVar3._8_4_;
            fStack_b54 = auVar3._12_4_;
            local_b70 = auVar4._0_4_;
            fStack_b6c = auVar4._4_4_;
            fStack_b68 = auVar4._8_4_;
            fStack_b64 = auVar4._12_4_;
            local_b90 = auVar2._0_4_;
            fStack_b8c = auVar2._4_4_;
            fStack_b88 = auVar2._8_4_;
            fStack_b84 = auVar2._12_4_;
            if ((((((((auVar96 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar96 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar96 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar96 >> 0x7f,0) == '\0') &&
                  (auVar96 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar96 >> 0xbf,0) == '\0') &&
                (auVar96 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar96[0x1f]) break;
            auVar148._8_4_ = 0x7f800000;
            auVar148._0_8_ = 0x7f8000007f800000;
            auVar148._12_4_ = 0x7f800000;
            auVar148._16_4_ = 0x7f800000;
            auVar148._20_4_ = 0x7f800000;
            auVar148._24_4_ = 0x7f800000;
            auVar148._28_4_ = 0x7f800000;
            auVar108 = vblendvps_avx(auVar148,local_700,auVar96);
            auVar11 = vshufps_avx(auVar108,auVar108,0xb1);
            auVar11 = vminps_avx(auVar108,auVar11);
            auVar12 = vshufpd_avx(auVar11,auVar11,5);
            auVar11 = vminps_avx(auVar11,auVar12);
            auVar12 = vperm2f128_avx(auVar11,auVar11,1);
            auVar11 = vminps_avx(auVar11,auVar12);
            auVar108 = vcmpps_avx(auVar108,auVar11,0);
            auVar11 = auVar96 & auVar108;
            if ((((((((auVar11 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar11 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar11 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar11 >> 0x7f,0) != '\0') ||
                  (auVar11 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar11 >> 0xbf,0) != '\0') ||
                (auVar11 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar11[0x1f] < '\0') {
              auVar96 = vandps_avx(auVar108,auVar96);
            }
            uVar75 = vmovmskps_avx(auVar96);
            uVar79 = 0;
            if (uVar75 != 0) {
              for (; (uVar75 >> uVar79 & 1) == 0; uVar79 = uVar79 + 1) {
              }
            }
            uVar77 = (ulong)uVar79;
            *(undefined4 *)(local_500 + uVar77 * 4) = 0;
            fVar310 = local_1a0[uVar77];
            uVar79 = *(uint *)(local_4e0 + uVar77 * 4);
            fVar311 = auVar126._0_4_;
            if ((float)local_a00._0_4_ < 0.0) {
              fVar311 = sqrtf((float)local_a00._0_4_);
            }
            auVar261 = vminps_avx(auVar3,auVar5);
            auVar182 = vmaxps_avx(auVar3,auVar5);
            auVar185 = vminps_avx(auVar4,auVar2);
            auVar88 = vminps_avx(auVar261,auVar185);
            auVar261 = vmaxps_avx(auVar4,auVar2);
            auVar185 = vmaxps_avx(auVar182,auVar261);
            auVar178._8_4_ = 0x7fffffff;
            auVar178._0_8_ = 0x7fffffff7fffffff;
            auVar178._12_4_ = 0x7fffffff;
            auVar182 = vandps_avx(auVar88,auVar178);
            auVar261 = vandps_avx(auVar185,auVar178);
            auVar182 = vmaxps_avx(auVar182,auVar261);
            auVar261 = vmovshdup_avx(auVar182);
            auVar261 = vmaxss_avx(auVar261,auVar182);
            auVar182 = vshufpd_avx(auVar182,auVar182,1);
            auVar182 = vmaxss_avx(auVar182,auVar261);
            local_a60._0_4_ = auVar182._0_4_ * 1.9073486e-06;
            local_ac0._0_4_ = fVar311 * 1.9073486e-06;
            local_9e0._0_16_ = vshufps_avx(auVar185,auVar185,0xff);
            auVar182 = vinsertps_avx(ZEXT416(uVar79),ZEXT416((uint)fVar310),0x10);
            auVar273 = ZEXT1664(auVar182);
            lVar76 = 5;
            do {
              do {
                bVar82 = lVar76 == 0;
                lVar76 = lVar76 + -1;
                if (bVar82) goto LAB_00a34059;
                auVar261 = auVar273._0_16_;
                auVar182 = vmovshdup_avx(auVar261);
                fVar248 = auVar182._0_4_;
                fVar314 = 1.0 - fVar248;
                auVar182 = vshufps_avx(auVar261,auVar261,0x55);
                fVar310 = auVar182._0_4_;
                fVar311 = auVar182._4_4_;
                fVar312 = auVar182._8_4_;
                fVar313 = auVar182._12_4_;
                auVar182 = vshufps_avx(ZEXT416((uint)fVar314),ZEXT416((uint)fVar314),0);
                fVar315 = auVar182._0_4_;
                fVar256 = auVar182._4_4_;
                fVar223 = auVar182._8_4_;
                fVar274 = auVar182._12_4_;
                fVar244 = local_b70 * fVar310 + local_b80 * fVar315;
                fVar278 = fStack_b6c * fVar311 + fStack_b7c * fVar256;
                fVar246 = fStack_b68 * fVar312 + fStack_b78 * fVar223;
                fVar282 = fStack_b64 * fVar313 + fStack_b74 * fVar274;
                auVar227._0_4_ =
                     fVar315 * (local_b80 * fVar310 + fVar315 * local_b60) + fVar310 * fVar244;
                auVar227._4_4_ =
                     fVar256 * (fStack_b7c * fVar311 + fVar256 * fStack_b5c) + fVar311 * fVar278;
                auVar227._8_4_ =
                     fVar223 * (fStack_b78 * fVar312 + fVar223 * fStack_b58) + fVar312 * fVar246;
                auVar227._12_4_ =
                     fVar274 * (fStack_b74 * fVar313 + fVar274 * fStack_b54) + fVar313 * fVar282;
                auVar179._0_4_ =
                     fVar315 * fVar244 + fVar310 * (fVar310 * local_b90 + local_b70 * fVar315);
                auVar179._4_4_ =
                     fVar256 * fVar278 + fVar311 * (fVar311 * fStack_b8c + fStack_b6c * fVar256);
                auVar179._8_4_ =
                     fVar223 * fVar246 + fVar312 * (fVar312 * fStack_b88 + fStack_b68 * fVar223);
                auVar179._12_4_ =
                     fVar274 * fVar282 + fVar313 * (fVar313 * fStack_b84 + fStack_b64 * fVar274);
                auVar182 = vshufps_avx(auVar261,auVar261,0);
                auVar128._0_4_ = auVar182._0_4_ * (float)local_9f0._0_4_ + 0.0;
                auVar128._4_4_ = auVar182._4_4_ * (float)local_9f0._4_4_ + 0.0;
                auVar128._8_4_ = auVar182._8_4_ * fStack_9e8 + 0.0;
                auVar128._12_4_ = auVar182._12_4_ * fStack_9e4 + 0.0;
                auVar87._0_4_ = fVar315 * auVar227._0_4_ + fVar310 * auVar179._0_4_;
                auVar87._4_4_ = fVar256 * auVar227._4_4_ + fVar311 * auVar179._4_4_;
                auVar87._8_4_ = fVar223 * auVar227._8_4_ + fVar312 * auVar179._8_4_;
                auVar87._12_4_ = fVar274 * auVar227._12_4_ + fVar313 * auVar179._12_4_;
                local_980._0_16_ = auVar87;
                auVar182 = vsubps_avx(auVar128,auVar87);
                _local_b20 = auVar182;
                auVar182 = vdpps_avx(auVar182,auVar182,0x7f);
                fVar310 = auVar182._0_4_;
                if (fVar310 < 0.0) {
                  local_ae0._0_16_ = auVar179;
                  fVar311 = sqrtf(fVar310);
                  auVar273 = ZEXT1664(auVar261);
                  auVar179 = local_ae0._0_16_;
                }
                else {
                  auVar185 = vsqrtss_avx(auVar182,auVar182);
                  fVar311 = auVar185._0_4_;
                }
                auVar185 = vsubps_avx(auVar179,auVar227);
                auVar300._0_4_ = auVar185._0_4_ * 3.0;
                auVar300._4_4_ = auVar185._4_4_ * 3.0;
                auVar300._8_4_ = auVar185._8_4_ * 3.0;
                auVar300._12_4_ = auVar185._12_4_ * 3.0;
                auVar185 = vshufps_avx(ZEXT416((uint)(fVar248 * 6.0)),ZEXT416((uint)(fVar248 * 6.0))
                                       ,0);
                auVar88 = ZEXT416((uint)((fVar314 - (fVar248 + fVar248)) * 6.0));
                auVar157 = vshufps_avx(auVar88,auVar88,0);
                auVar88 = ZEXT416((uint)((fVar248 - (fVar314 + fVar314)) * 6.0));
                auVar85 = vshufps_avx(auVar88,auVar88,0);
                auVar124 = vshufps_avx(ZEXT416((uint)(fVar314 * 6.0)),ZEXT416((uint)(fVar314 * 6.0))
                                       ,0);
                auVar88 = vdpps_avx(auVar300,auVar300,0x7f);
                auVar129._0_4_ =
                     auVar124._0_4_ * local_b60 +
                     auVar85._0_4_ * local_b80 +
                     auVar185._0_4_ * local_b90 + auVar157._0_4_ * local_b70;
                auVar129._4_4_ =
                     auVar124._4_4_ * fStack_b5c +
                     auVar85._4_4_ * fStack_b7c +
                     auVar185._4_4_ * fStack_b8c + auVar157._4_4_ * fStack_b6c;
                auVar129._8_4_ =
                     auVar124._8_4_ * fStack_b58 +
                     auVar85._8_4_ * fStack_b78 +
                     auVar185._8_4_ * fStack_b88 + auVar157._8_4_ * fStack_b68;
                auVar129._12_4_ =
                     auVar124._12_4_ * fStack_b54 +
                     auVar85._12_4_ * fStack_b74 +
                     auVar185._12_4_ * fStack_b84 + auVar157._12_4_ * fStack_b64;
                auVar185 = vblendps_avx(auVar88,_DAT_01f45a50,0xe);
                auVar157 = vrsqrtss_avx(auVar185,auVar185);
                fVar313 = auVar157._0_4_;
                fVar312 = auVar88._0_4_;
                auVar157 = vdpps_avx(auVar300,auVar129,0x7f);
                auVar85 = vshufps_avx(auVar88,auVar88,0);
                auVar130._0_4_ = auVar129._0_4_ * auVar85._0_4_;
                auVar130._4_4_ = auVar129._4_4_ * auVar85._4_4_;
                auVar130._8_4_ = auVar129._8_4_ * auVar85._8_4_;
                auVar130._12_4_ = auVar129._12_4_ * auVar85._12_4_;
                auVar157 = vshufps_avx(auVar157,auVar157,0);
                auVar201._0_4_ = auVar300._0_4_ * auVar157._0_4_;
                auVar201._4_4_ = auVar300._4_4_ * auVar157._4_4_;
                auVar201._8_4_ = auVar300._8_4_ * auVar157._8_4_;
                auVar201._12_4_ = auVar300._12_4_ * auVar157._12_4_;
                auVar124 = vsubps_avx(auVar130,auVar201);
                auVar157 = vrcpss_avx(auVar185,auVar185);
                auVar185 = vmaxss_avx(ZEXT416((uint)local_a60._0_4_),
                                      ZEXT416((uint)(auVar273._0_4_ * (float)local_ac0._0_4_)));
                auVar157 = ZEXT416((uint)(auVar157._0_4_ * (2.0 - fVar312 * auVar157._0_4_)));
                auVar157 = vshufps_avx(auVar157,auVar157,0);
                uVar77 = CONCAT44(auVar300._4_4_,auVar300._0_4_);
                auVar228._0_8_ = uVar77 ^ 0x8000000080000000;
                auVar228._8_4_ = -auVar300._8_4_;
                auVar228._12_4_ = -auVar300._12_4_;
                auVar85 = ZEXT416((uint)(fVar313 * 1.5 +
                                        fVar312 * -0.5 * fVar313 * fVar313 * fVar313));
                auVar85 = vshufps_avx(auVar85,auVar85,0);
                auVar180._0_4_ = auVar85._0_4_ * auVar124._0_4_ * auVar157._0_4_;
                auVar180._4_4_ = auVar85._4_4_ * auVar124._4_4_ * auVar157._4_4_;
                auVar180._8_4_ = auVar85._8_4_ * auVar124._8_4_ * auVar157._8_4_;
                auVar180._12_4_ = auVar85._12_4_ * auVar124._12_4_ * auVar157._12_4_;
                auVar262._0_4_ = auVar300._0_4_ * auVar85._0_4_;
                auVar262._4_4_ = auVar300._4_4_ * auVar85._4_4_;
                auVar262._8_4_ = auVar300._8_4_ * auVar85._8_4_;
                auVar262._12_4_ = auVar300._12_4_ * auVar85._12_4_;
                if (fVar312 < 0.0) {
                  local_ae0._0_16_ = auVar228;
                  local_920._0_16_ = auVar262;
                  local_a40._0_16_ = auVar180;
                  fVar312 = sqrtf(fVar312);
                  auVar180 = local_a40._0_16_;
                  auVar228 = local_ae0._0_16_;
                  auVar262 = local_920._0_16_;
                }
                else {
                  auVar88 = vsqrtss_avx(auVar88,auVar88);
                  fVar312 = auVar88._0_4_;
                }
                auVar88 = vdpps_avx(_local_b20,auVar262,0x7f);
                fVar311 = ((float)local_a60._0_4_ / fVar312) * (fVar311 + 1.0) +
                          auVar185._0_4_ + fVar311 * (float)local_a60._0_4_;
                auVar157 = vdpps_avx(auVar228,auVar262,0x7f);
                auVar85 = vdpps_avx(_local_b20,auVar180,0x7f);
                auVar124 = vdpps_avx(_local_9f0,auVar262,0x7f);
                auVar125 = vdpps_avx(_local_b20,auVar228,0x7f);
                fVar312 = auVar157._0_4_ + auVar85._0_4_;
                fVar313 = auVar88._0_4_;
                auVar89._0_4_ = fVar313 * fVar313;
                auVar89._4_4_ = auVar88._4_4_ * auVar88._4_4_;
                auVar89._8_4_ = auVar88._8_4_ * auVar88._8_4_;
                auVar89._12_4_ = auVar88._12_4_ * auVar88._12_4_;
                auVar85 = vsubps_avx(auVar182,auVar89);
                auVar157 = vdpps_avx(_local_b20,_local_9f0,0x7f);
                fVar314 = auVar125._0_4_ - fVar313 * fVar312;
                fVar315 = auVar157._0_4_ - fVar313 * auVar124._0_4_;
                auVar157 = vrsqrtss_avx(auVar85,auVar85);
                fVar256 = auVar85._0_4_;
                fVar313 = auVar157._0_4_;
                fVar313 = fVar313 * 1.5 + fVar256 * -0.5 * fVar313 * fVar313 * fVar313;
                if (fVar256 < 0.0) {
                  local_ae0._0_4_ = fVar311;
                  local_920._0_16_ = auVar124;
                  local_a40._0_16_ = ZEXT416((uint)fVar312);
                  local_7e0._0_4_ = fVar314;
                  local_940._0_4_ = fVar315;
                  local_9c0._0_4_ = fVar313;
                  fVar256 = sqrtf(fVar256);
                  fVar313 = (float)local_9c0._0_4_;
                  fVar314 = (float)local_7e0._0_4_;
                  fVar315 = (float)local_940._0_4_;
                  auVar124 = local_920._0_16_;
                  fVar311 = (float)local_ae0._0_4_;
                  auVar157 = local_a40._0_16_;
                }
                else {
                  auVar157 = vsqrtss_avx(auVar85,auVar85);
                  fVar256 = auVar157._0_4_;
                  auVar157 = ZEXT416((uint)fVar312);
                }
                auVar125 = vpermilps_avx(local_980._0_16_,0xff);
                auVar94 = vshufps_avx(auVar300,auVar300,0xff);
                fVar312 = fVar314 * fVar313 - auVar94._0_4_;
                auVar202._0_8_ = auVar124._0_8_ ^ 0x8000000080000000;
                auVar202._8_4_ = auVar124._8_4_ ^ 0x80000000;
                auVar202._12_4_ = auVar124._12_4_ ^ 0x80000000;
                auVar229._0_4_ = -fVar312;
                auVar229._4_4_ = 0x80000000;
                auVar229._8_4_ = 0x80000000;
                auVar229._12_4_ = 0x80000000;
                auVar85 = vinsertps_avx(auVar229,ZEXT416((uint)(fVar315 * fVar313)),0x1c);
                auVar124 = vmovsldup_avx(ZEXT416((uint)(auVar157._0_4_ * fVar315 * fVar313 -
                                                       auVar124._0_4_ * fVar312)));
                auVar85 = vdivps_avx(auVar85,auVar124);
                auVar157 = vinsertps_avx(auVar157,auVar202,0x10);
                auVar157 = vdivps_avx(auVar157,auVar124);
                auVar124 = vmovsldup_avx(auVar88);
                auVar90 = ZEXT416((uint)(fVar256 - auVar125._0_4_));
                auVar125 = vmovsldup_avx(auVar90);
                auVar158._0_4_ = auVar124._0_4_ * auVar85._0_4_ + auVar125._0_4_ * auVar157._0_4_;
                auVar158._4_4_ = auVar124._4_4_ * auVar85._4_4_ + auVar125._4_4_ * auVar157._4_4_;
                auVar158._8_4_ = auVar124._8_4_ * auVar85._8_4_ + auVar125._8_4_ * auVar157._8_4_;
                auVar158._12_4_ =
                     auVar124._12_4_ * auVar85._12_4_ + auVar125._12_4_ * auVar157._12_4_;
                auVar157 = vsubps_avx(auVar261,auVar158);
                auVar273 = ZEXT1664(auVar157);
                auVar159._8_4_ = 0x7fffffff;
                auVar159._0_8_ = 0x7fffffff7fffffff;
                auVar159._12_4_ = 0x7fffffff;
                auVar261 = vandps_avx(auVar88,auVar159);
              } while (fVar311 <= auVar261._0_4_);
              auVar181._8_4_ = 0x7fffffff;
              auVar181._0_8_ = 0x7fffffff7fffffff;
              auVar181._12_4_ = 0x7fffffff;
              auVar261 = vandps_avx(auVar90,auVar181);
            } while ((float)local_9e0._0_4_ * 1.9073486e-06 + auVar185._0_4_ + fVar311 <=
                     auVar261._0_4_);
            fVar311 = auVar157._0_4_ + (float)local_8f0._0_4_;
            if ((fVar299 <= fVar311) &&
               (fVar312 = *(float *)(ray + k * 4 + 0x80), fVar311 <= fVar312)) {
              auVar261 = vmovshdup_avx(auVar157);
              fVar313 = auVar261._0_4_;
              if ((0.0 <= fVar313) && (fVar313 <= 1.0)) {
                auVar182 = vrsqrtss_avx(auVar182,auVar182);
                fVar314 = auVar182._0_4_;
                pGVar7 = (context->scene->geometries).items[uVar74].ptr;
                if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                  auVar182 = ZEXT416((uint)(fVar314 * 1.5 +
                                           fVar310 * -0.5 * fVar314 * fVar314 * fVar314));
                  auVar182 = vshufps_avx(auVar182,auVar182,0);
                  auVar183._0_4_ = auVar182._0_4_ * (float)local_b20._0_4_;
                  auVar183._4_4_ = auVar182._4_4_ * (float)local_b20._4_4_;
                  auVar183._8_4_ = auVar182._8_4_ * fStack_b18;
                  auVar183._12_4_ = auVar182._12_4_ * fStack_b14;
                  auVar131._0_4_ = auVar300._0_4_ + auVar94._0_4_ * auVar183._0_4_;
                  auVar131._4_4_ = auVar300._4_4_ + auVar94._4_4_ * auVar183._4_4_;
                  auVar131._8_4_ = auVar300._8_4_ + auVar94._8_4_ * auVar183._8_4_;
                  auVar131._12_4_ = auVar300._12_4_ + auVar94._12_4_ * auVar183._12_4_;
                  auVar182 = vshufps_avx(auVar183,auVar183,0xc9);
                  auVar261 = vshufps_avx(auVar300,auVar300,0xc9);
                  auVar184._0_4_ = auVar261._0_4_ * auVar183._0_4_;
                  auVar184._4_4_ = auVar261._4_4_ * auVar183._4_4_;
                  auVar184._8_4_ = auVar261._8_4_ * auVar183._8_4_;
                  auVar184._12_4_ = auVar261._12_4_ * auVar183._12_4_;
                  auVar203._0_4_ = auVar300._0_4_ * auVar182._0_4_;
                  auVar203._4_4_ = auVar300._4_4_ * auVar182._4_4_;
                  auVar203._8_4_ = auVar300._8_4_ * auVar182._8_4_;
                  auVar203._12_4_ = auVar300._12_4_ * auVar182._12_4_;
                  auVar185 = vsubps_avx(auVar203,auVar184);
                  auVar182 = vshufps_avx(auVar185,auVar185,0xc9);
                  auVar261 = vshufps_avx(auVar131,auVar131,0xc9);
                  auVar204._0_4_ = auVar261._0_4_ * auVar182._0_4_;
                  auVar204._4_4_ = auVar261._4_4_ * auVar182._4_4_;
                  auVar204._8_4_ = auVar261._8_4_ * auVar182._8_4_;
                  auVar204._12_4_ = auVar261._12_4_ * auVar182._12_4_;
                  auVar182 = vshufps_avx(auVar185,auVar185,0xd2);
                  auVar132._0_4_ = auVar131._0_4_ * auVar182._0_4_;
                  auVar132._4_4_ = auVar131._4_4_ * auVar182._4_4_;
                  auVar132._8_4_ = auVar131._8_4_ * auVar182._8_4_;
                  auVar132._12_4_ = auVar131._12_4_ * auVar182._12_4_;
                  auVar182 = vsubps_avx(auVar204,auVar132);
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    *(float *)(ray + k * 4 + 0x80) = fVar311;
                    uVar1 = vextractps_avx(auVar182,1);
                    *(undefined4 *)(ray + k * 4 + 0xc0) = uVar1;
                    uVar1 = vextractps_avx(auVar182,2);
                    *(undefined4 *)(ray + k * 4 + 0xd0) = uVar1;
                    *(int *)(ray + k * 4 + 0xe0) = auVar182._0_4_;
                    *(float *)(ray + k * 4 + 0xf0) = fVar313;
                    *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                    *(int *)(ray + k * 4 + 0x110) = (int)local_8c0;
                    *(uint *)(ray + k * 4 + 0x120) = uVar74;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                  }
                  else {
                    local_770 = vshufps_avx(auVar157,auVar157,0x55);
                    auVar261 = vshufps_avx(auVar182,auVar182,0x55);
                    auStack_790 = vshufps_avx(auVar182,auVar182,0xaa);
                    local_780 = vshufps_avx(auVar182,auVar182,0);
                    local_7a0 = (RTCHitN  [16])auVar261;
                    local_760 = ZEXT816(0) << 0x20;
                    local_750 = local_7c0._0_8_;
                    uStack_748 = local_7c0._8_8_;
                    local_740 = local_7b0;
                    vcmpps_avx(ZEXT1632(local_7b0),ZEXT1632(local_7b0),0xf);
                    uStack_72c = context->user->instID[0];
                    local_730 = uStack_72c;
                    uStack_728 = uStack_72c;
                    uStack_724 = uStack_72c;
                    uVar79 = context->user->instPrimID[0];
                    auVar133._4_4_ = uVar79;
                    auVar133._0_4_ = uVar79;
                    auVar133._8_4_ = uVar79;
                    auVar133._12_4_ = uVar79;
                    auStack_720 = auVar133;
                    *(float *)(ray + k * 4 + 0x80) = fVar311;
                    local_860._0_16_ = *local_a88;
                    local_b50.valid = (int *)local_860;
                    local_b50.geometryUserPtr = pGVar7->userPtr;
                    local_b50.context = context->user;
                    local_b50.hit = local_7a0;
                    local_b50.N = 4;
                    auVar182 = *local_a88;
                    local_b50.ray = (RTCRayN *)ray;
                    if (pGVar7->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      (*pGVar7->intersectionFilterN)(&local_b50);
                      auVar332._8_56_ = extraout_var;
                      auVar332._0_8_ = extraout_XMM1_Qa;
                      auVar133 = auVar332._0_16_;
                      auVar182 = local_860._0_16_;
                    }
                    if (auVar182 == (undefined1  [16])0x0) {
                      auVar261 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                      auVar182 = vpcmpeqd_avx(auVar133,auVar133);
                      auVar261 = auVar261 ^ auVar182;
                    }
                    else {
                      p_Var8 = context->args->filter;
                      auVar185 = vpcmpeqd_avx(auVar261,auVar261);
                      if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var8)(&local_b50);
                        auVar185 = vpcmpeqd_avx(auVar185,auVar185);
                        auVar182 = local_860._0_16_;
                      }
                      auVar88 = vpcmpeqd_avx(auVar182,_DAT_01f45a50);
                      auVar261 = auVar88 ^ auVar185;
                      if (auVar182 != (undefined1  [16])0x0) {
                        auVar88 = auVar88 ^ auVar185;
                        auVar182 = vmaskmovps_avx(auVar88,*(undefined1 (*) [16])local_b50.hit);
                        *(undefined1 (*) [16])(local_b50.ray + 0xc0) = auVar182;
                        auVar182 = vmaskmovps_avx(auVar88,*(undefined1 (*) [16])
                                                           (local_b50.hit + 0x10));
                        *(undefined1 (*) [16])(local_b50.ray + 0xd0) = auVar182;
                        auVar182 = vmaskmovps_avx(auVar88,*(undefined1 (*) [16])
                                                           (local_b50.hit + 0x20));
                        *(undefined1 (*) [16])(local_b50.ray + 0xe0) = auVar182;
                        auVar182 = vmaskmovps_avx(auVar88,*(undefined1 (*) [16])
                                                           (local_b50.hit + 0x30));
                        *(undefined1 (*) [16])(local_b50.ray + 0xf0) = auVar182;
                        auVar182 = vmaskmovps_avx(auVar88,*(undefined1 (*) [16])
                                                           (local_b50.hit + 0x40));
                        *(undefined1 (*) [16])(local_b50.ray + 0x100) = auVar182;
                        auVar182 = vmaskmovps_avx(auVar88,*(undefined1 (*) [16])
                                                           (local_b50.hit + 0x50));
                        *(undefined1 (*) [16])(local_b50.ray + 0x110) = auVar182;
                        auVar182 = vmaskmovps_avx(auVar88,*(undefined1 (*) [16])
                                                           (local_b50.hit + 0x60));
                        *(undefined1 (*) [16])(local_b50.ray + 0x120) = auVar182;
                        auVar182 = vmaskmovps_avx(auVar88,*(undefined1 (*) [16])
                                                           (local_b50.hit + 0x70));
                        *(undefined1 (*) [16])(local_b50.ray + 0x130) = auVar182;
                        auVar182 = vmaskmovps_avx(auVar88,*(undefined1 (*) [16])
                                                           (local_b50.hit + 0x80));
                        *(undefined1 (*) [16])(local_b50.ray + 0x140) = auVar182;
                      }
                    }
                    auVar91._8_8_ = 0x100000001;
                    auVar91._0_8_ = 0x100000001;
                    if ((auVar91 & auVar261) == (undefined1  [16])0x0) {
                      *(float *)(ray + k * 4 + 0x80) = fVar312;
                    }
                  }
                }
              }
            }
LAB_00a34059:
            uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar320._4_4_ = uVar1;
            auVar320._0_4_ = uVar1;
            auVar320._8_4_ = uVar1;
            auVar320._12_4_ = uVar1;
            auVar320._16_4_ = uVar1;
            auVar320._20_4_ = uVar1;
            auVar320._24_4_ = uVar1;
            auVar320._28_4_ = uVar1;
            auVar387 = ZEXT3264(auVar320);
            auVar96 = vcmpps_avx(_local_820,auVar320,2);
            auVar96 = vandps_avx(auVar96,local_500);
          }
          auVar111._0_4_ = (float)local_8a0._0_4_ + (float)local_800._0_4_;
          auVar111._4_4_ = (float)local_8a0._4_4_ + (float)local_800._4_4_;
          auVar111._8_4_ = fStack_898 + fStack_7f8;
          auVar111._12_4_ = fStack_894 + fStack_7f4;
          auVar111._16_4_ = fStack_890 + fStack_7f0;
          auVar111._20_4_ = fStack_88c + fStack_7ec;
          auVar111._24_4_ = fStack_888 + fStack_7e8;
          auVar111._28_4_ = fStack_884 + fStack_7e4;
          auVar182 = vshufps_avx(auVar387._0_16_,auVar387._0_16_,0);
          auVar149._16_16_ = auVar182;
          auVar149._0_16_ = auVar182;
          auVar96 = vcmpps_avx(auVar111,auVar149,2);
          _local_820 = vandps_avx(auVar96,local_840);
          auVar112._8_4_ = 3;
          auVar112._0_8_ = 0x300000003;
          auVar112._12_4_ = 3;
          auVar112._16_4_ = 3;
          auVar112._20_4_ = 3;
          auVar112._24_4_ = 3;
          auVar112._28_4_ = 3;
          auVar150._8_4_ = 2;
          auVar150._0_8_ = 0x200000002;
          auVar150._12_4_ = 2;
          auVar150._16_4_ = 2;
          auVar150._20_4_ = 2;
          auVar150._24_4_ = 2;
          auVar150._28_4_ = 2;
          auVar96 = vblendvps_avx(auVar150,auVar112,local_680);
          auVar182 = vpcmpgtd_avx(auVar96._16_16_,_local_6c0);
          auVar261 = vpshufd_avx(local_6a0._0_16_,0);
          auVar261 = vpcmpgtd_avx(auVar96._0_16_,auVar261);
          auVar151._16_16_ = auVar182;
          auVar151._0_16_ = auVar261;
          local_840 = vblendps_avx(ZEXT1632(auVar261),auVar151,0xf0);
          local_860 = vandnps_avx(local_840,_local_820);
          local_700 = _local_4a0;
          local_800._4_4_ = (float)local_8a0._4_4_ + (float)local_4a0._4_4_;
          local_800._0_4_ = (float)local_8a0._0_4_ + (float)local_4a0._0_4_;
          fStack_7f8 = fStack_898 + fStack_498;
          fStack_7f4 = fStack_894 + fStack_494;
          fStack_7f0 = fStack_890 + fStack_490;
          fStack_7ec = fStack_88c + fStack_48c;
          fStack_7e8 = fStack_888 + fStack_488;
          fStack_7e4 = fStack_884 + fStack_484;
          auVar332 = ZEXT3264(local_a20);
          auVar346 = ZEXT3264(local_b00);
          auVar273 = ZEXT3264(local_9a0);
          while( true ) {
            if ((((((((local_860 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (local_860 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (local_860 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(local_860 >> 0x7f,0) == '\0') &&
                  (local_860 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(local_860 >> 0xbf,0) == '\0') &&
                (local_860 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < local_860[0x1f]) break;
            auVar152._8_4_ = 0x7f800000;
            auVar152._0_8_ = 0x7f8000007f800000;
            auVar152._12_4_ = 0x7f800000;
            auVar152._16_4_ = 0x7f800000;
            auVar152._20_4_ = 0x7f800000;
            auVar152._24_4_ = 0x7f800000;
            auVar152._28_4_ = 0x7f800000;
            auVar96 = vblendvps_avx(auVar152,local_700,local_860);
            auVar108 = vshufps_avx(auVar96,auVar96,0xb1);
            auVar108 = vminps_avx(auVar96,auVar108);
            auVar11 = vshufpd_avx(auVar108,auVar108,5);
            auVar108 = vminps_avx(auVar108,auVar11);
            auVar11 = vperm2f128_avx(auVar108,auVar108,1);
            auVar108 = vminps_avx(auVar108,auVar11);
            auVar108 = vcmpps_avx(auVar96,auVar108,0);
            auVar11 = local_860 & auVar108;
            auVar96 = local_860;
            if ((((((((auVar11 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar11 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar11 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar11 >> 0x7f,0) != '\0') ||
                  (auVar11 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar11 >> 0xbf,0) != '\0') ||
                (auVar11 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar11[0x1f] < '\0') {
              auVar96 = vandps_avx(auVar108,local_860);
            }
            uVar75 = vmovmskps_avx(auVar96);
            uVar79 = 0;
            if (uVar75 != 0) {
              for (; (uVar75 >> uVar79 & 1) == 0; uVar79 = uVar79 + 1) {
              }
            }
            uVar77 = (ulong)uVar79;
            *(undefined4 *)(local_860 + uVar77 * 4) = 0;
            fVar310 = local_1c0[uVar77];
            uVar79 = *(uint *)(local_480 + uVar77 * 4);
            fVar311 = auVar19._0_4_;
            if ((float)local_a00._0_4_ < 0.0) {
              fVar311 = sqrtf((float)local_a00._0_4_);
              auVar273 = ZEXT3264(local_9a0);
              auVar346 = ZEXT3264(local_b00);
              auVar332 = ZEXT3264(local_a20);
            }
            auVar261 = vminps_avx(auVar3,auVar5);
            auVar182 = vmaxps_avx(auVar3,auVar5);
            auVar185 = vminps_avx(auVar4,auVar2);
            auVar88 = vminps_avx(auVar261,auVar185);
            auVar261 = vmaxps_avx(auVar4,auVar2);
            auVar185 = vmaxps_avx(auVar182,auVar261);
            auVar186._8_4_ = 0x7fffffff;
            auVar186._0_8_ = 0x7fffffff7fffffff;
            auVar186._12_4_ = 0x7fffffff;
            auVar182 = vandps_avx(auVar88,auVar186);
            auVar261 = vandps_avx(auVar185,auVar186);
            auVar182 = vmaxps_avx(auVar182,auVar261);
            auVar261 = vmovshdup_avx(auVar182);
            auVar261 = vmaxss_avx(auVar261,auVar182);
            auVar182 = vshufpd_avx(auVar182,auVar182,1);
            auVar182 = vmaxss_avx(auVar182,auVar261);
            local_a60._0_4_ = auVar182._0_4_ * 1.9073486e-06;
            local_920._0_4_ = fVar311 * 1.9073486e-06;
            local_9e0._0_16_ = vshufps_avx(auVar185,auVar185,0xff);
            auVar182 = vinsertps_avx(ZEXT416(uVar79),ZEXT416((uint)fVar310),0x10);
            auVar387 = ZEXT1664(auVar182);
            lVar76 = 5;
            do {
              do {
                bVar82 = lVar76 == 0;
                lVar76 = lVar76 + -1;
                if (bVar82) goto LAB_00a34bd2;
                auVar261 = auVar387._0_16_;
                auVar182 = vmovshdup_avx(auVar261);
                fVar248 = auVar182._0_4_;
                fVar314 = 1.0 - fVar248;
                auVar182 = vshufps_avx(auVar261,auVar261,0x55);
                fVar310 = auVar182._0_4_;
                fVar311 = auVar182._4_4_;
                fVar312 = auVar182._8_4_;
                fVar313 = auVar182._12_4_;
                auVar182 = vshufps_avx(ZEXT416((uint)fVar314),ZEXT416((uint)fVar314),0);
                fVar315 = auVar182._0_4_;
                fVar256 = auVar182._4_4_;
                fVar223 = auVar182._8_4_;
                fVar274 = auVar182._12_4_;
                fVar244 = local_b70 * fVar310 + local_b80 * fVar315;
                fVar278 = fStack_b6c * fVar311 + fStack_b7c * fVar256;
                fVar246 = fStack_b68 * fVar312 + fStack_b78 * fVar223;
                fVar282 = fStack_b64 * fVar313 + fStack_b74 * fVar274;
                auVar230._0_4_ =
                     fVar315 * (local_b80 * fVar310 + fVar315 * local_b60) + fVar310 * fVar244;
                auVar230._4_4_ =
                     fVar256 * (fStack_b7c * fVar311 + fVar256 * fStack_b5c) + fVar311 * fVar278;
                auVar230._8_4_ =
                     fVar223 * (fStack_b78 * fVar312 + fVar223 * fStack_b58) + fVar312 * fVar246;
                auVar230._12_4_ =
                     fVar274 * (fStack_b74 * fVar313 + fVar274 * fStack_b54) + fVar313 * fVar282;
                auVar187._0_4_ =
                     fVar315 * fVar244 + fVar310 * (fVar310 * local_b90 + local_b70 * fVar315);
                auVar187._4_4_ =
                     fVar256 * fVar278 + fVar311 * (fVar311 * fStack_b8c + fStack_b6c * fVar256);
                auVar187._8_4_ =
                     fVar223 * fVar246 + fVar312 * (fVar312 * fStack_b88 + fStack_b68 * fVar223);
                auVar187._12_4_ =
                     fVar274 * fVar282 + fVar313 * (fVar313 * fStack_b84 + fStack_b64 * fVar274);
                auVar182 = vshufps_avx(auVar261,auVar261,0);
                auVar134._0_4_ = auVar182._0_4_ * (float)local_9f0._0_4_ + 0.0;
                auVar134._4_4_ = auVar182._4_4_ * (float)local_9f0._4_4_ + 0.0;
                auVar134._8_4_ = auVar182._8_4_ * fStack_9e8 + 0.0;
                auVar134._12_4_ = auVar182._12_4_ * fStack_9e4 + 0.0;
                auVar92._0_4_ = fVar315 * auVar230._0_4_ + fVar310 * auVar187._0_4_;
                auVar92._4_4_ = fVar256 * auVar230._4_4_ + fVar311 * auVar187._4_4_;
                auVar92._8_4_ = fVar223 * auVar230._8_4_ + fVar312 * auVar187._8_4_;
                auVar92._12_4_ = fVar274 * auVar230._12_4_ + fVar313 * auVar187._12_4_;
                local_980._0_16_ = auVar92;
                auVar182 = vsubps_avx(auVar134,auVar92);
                _local_b20 = auVar182;
                auVar182 = vdpps_avx(auVar182,auVar182,0x7f);
                fVar310 = auVar182._0_4_;
                if (fVar310 < 0.0) {
                  local_ac0._0_16_ = auVar230;
                  fVar311 = sqrtf(fVar310);
                  auVar387 = ZEXT1664(auVar261);
                  auVar230 = local_ac0._0_16_;
                }
                else {
                  auVar185 = vsqrtss_avx(auVar182,auVar182);
                  fVar311 = auVar185._0_4_;
                }
                auVar185 = vsubps_avx(auVar187,auVar230);
                auVar263._0_4_ = auVar185._0_4_ * 3.0;
                auVar263._4_4_ = auVar185._4_4_ * 3.0;
                auVar263._8_4_ = auVar185._8_4_ * 3.0;
                auVar263._12_4_ = auVar185._12_4_ * 3.0;
                auVar185 = vshufps_avx(ZEXT416((uint)(fVar248 * 6.0)),ZEXT416((uint)(fVar248 * 6.0))
                                       ,0);
                auVar88 = ZEXT416((uint)((fVar314 - (fVar248 + fVar248)) * 6.0));
                auVar157 = vshufps_avx(auVar88,auVar88,0);
                auVar88 = ZEXT416((uint)((fVar248 - (fVar314 + fVar314)) * 6.0));
                auVar85 = vshufps_avx(auVar88,auVar88,0);
                auVar124 = vshufps_avx(ZEXT416((uint)(fVar314 * 6.0)),ZEXT416((uint)(fVar314 * 6.0))
                                       ,0);
                auVar88 = vdpps_avx(auVar263,auVar263,0x7f);
                auVar135._0_4_ =
                     auVar124._0_4_ * local_b60 +
                     auVar85._0_4_ * local_b80 +
                     auVar185._0_4_ * local_b90 + auVar157._0_4_ * local_b70;
                auVar135._4_4_ =
                     auVar124._4_4_ * fStack_b5c +
                     auVar85._4_4_ * fStack_b7c +
                     auVar185._4_4_ * fStack_b8c + auVar157._4_4_ * fStack_b6c;
                auVar135._8_4_ =
                     auVar124._8_4_ * fStack_b58 +
                     auVar85._8_4_ * fStack_b78 +
                     auVar185._8_4_ * fStack_b88 + auVar157._8_4_ * fStack_b68;
                auVar135._12_4_ =
                     auVar124._12_4_ * fStack_b54 +
                     auVar85._12_4_ * fStack_b74 +
                     auVar185._12_4_ * fStack_b84 + auVar157._12_4_ * fStack_b64;
                auVar185 = vblendps_avx(auVar88,_DAT_01f45a50,0xe);
                auVar157 = vrsqrtss_avx(auVar185,auVar185);
                fVar313 = auVar157._0_4_;
                fVar312 = auVar88._0_4_;
                auVar157 = vdpps_avx(auVar263,auVar135,0x7f);
                auVar85 = vshufps_avx(auVar88,auVar88,0);
                auVar136._0_4_ = auVar135._0_4_ * auVar85._0_4_;
                auVar136._4_4_ = auVar135._4_4_ * auVar85._4_4_;
                auVar136._8_4_ = auVar135._8_4_ * auVar85._8_4_;
                auVar136._12_4_ = auVar135._12_4_ * auVar85._12_4_;
                auVar157 = vshufps_avx(auVar157,auVar157,0);
                auVar205._0_4_ = auVar263._0_4_ * auVar157._0_4_;
                auVar205._4_4_ = auVar263._4_4_ * auVar157._4_4_;
                auVar205._8_4_ = auVar263._8_4_ * auVar157._8_4_;
                auVar205._12_4_ = auVar263._12_4_ * auVar157._12_4_;
                auVar124 = vsubps_avx(auVar136,auVar205);
                auVar157 = vrcpss_avx(auVar185,auVar185);
                auVar185 = vmaxss_avx(ZEXT416((uint)local_a60._0_4_),
                                      ZEXT416((uint)(auVar387._0_4_ * (float)local_920._0_4_)));
                auVar157 = ZEXT416((uint)(auVar157._0_4_ * (2.0 - fVar312 * auVar157._0_4_)));
                auVar157 = vshufps_avx(auVar157,auVar157,0);
                uVar77 = CONCAT44(auVar263._4_4_,auVar263._0_4_);
                auVar316._0_8_ = uVar77 ^ 0x8000000080000000;
                auVar316._8_4_ = -auVar263._8_4_;
                auVar316._12_4_ = -auVar263._12_4_;
                auVar85 = ZEXT416((uint)(fVar313 * 1.5 +
                                        fVar312 * -0.5 * fVar313 * fVar313 * fVar313));
                auVar85 = vshufps_avx(auVar85,auVar85,0);
                auVar188._0_4_ = auVar85._0_4_ * auVar124._0_4_ * auVar157._0_4_;
                auVar188._4_4_ = auVar85._4_4_ * auVar124._4_4_ * auVar157._4_4_;
                auVar188._8_4_ = auVar85._8_4_ * auVar124._8_4_ * auVar157._8_4_;
                auVar188._12_4_ = auVar85._12_4_ * auVar124._12_4_ * auVar157._12_4_;
                local_ae0._0_4_ = auVar263._0_4_ * auVar85._0_4_;
                local_ae0._4_4_ = auVar263._4_4_ * auVar85._4_4_;
                local_ae0._8_4_ = auVar263._8_4_ * auVar85._8_4_;
                local_ae0._12_4_ = auVar263._12_4_ * auVar85._12_4_;
                if (fVar312 < 0.0) {
                  local_ac0._0_4_ = fVar311;
                  local_a40._0_16_ = auVar188;
                  fVar312 = sqrtf(fVar312);
                  auVar188 = local_a40._0_16_;
                }
                else {
                  auVar88 = vsqrtss_avx(auVar88,auVar88);
                  fVar312 = auVar88._0_4_;
                  local_ac0._0_4_ = fVar311;
                }
                auVar88 = vdpps_avx(_local_b20,local_ae0._0_16_,0x7f);
                fVar311 = ((float)local_a60._0_4_ / fVar312) * ((float)local_ac0._0_4_ + 1.0) +
                          auVar185._0_4_ + (float)local_ac0._0_4_ * (float)local_a60._0_4_;
                auVar157 = vdpps_avx(auVar316,local_ae0._0_16_,0x7f);
                auVar85 = vdpps_avx(_local_b20,auVar188,0x7f);
                auVar124 = vdpps_avx(_local_9f0,local_ae0._0_16_,0x7f);
                auVar125 = vdpps_avx(_local_b20,auVar316,0x7f);
                fVar312 = auVar157._0_4_ + auVar85._0_4_;
                fVar313 = auVar88._0_4_;
                auVar93._0_4_ = fVar313 * fVar313;
                auVar93._4_4_ = auVar88._4_4_ * auVar88._4_4_;
                auVar93._8_4_ = auVar88._8_4_ * auVar88._8_4_;
                auVar93._12_4_ = auVar88._12_4_ * auVar88._12_4_;
                auVar85 = vsubps_avx(auVar182,auVar93);
                local_ae0._0_16_ = ZEXT416((uint)fVar312);
                auVar157 = vdpps_avx(_local_b20,_local_9f0,0x7f);
                fVar314 = auVar125._0_4_ - fVar313 * fVar312;
                local_ac0._0_16_ = auVar88;
                fVar313 = auVar157._0_4_ - fVar313 * auVar124._0_4_;
                auVar88 = vrsqrtss_avx(auVar85,auVar85);
                fVar315 = auVar85._0_4_;
                fVar312 = auVar88._0_4_;
                fVar312 = fVar312 * 1.5 + fVar315 * -0.5 * fVar312 * fVar312 * fVar312;
                if (fVar315 < 0.0) {
                  local_a40._0_16_ = auVar124;
                  local_7e0._0_4_ = fVar314;
                  local_940._0_4_ = fVar313;
                  local_9c0._0_4_ = fVar312;
                  fVar315 = sqrtf(fVar315);
                  fVar312 = (float)local_9c0._0_4_;
                  fVar314 = (float)local_7e0._0_4_;
                  fVar313 = (float)local_940._0_4_;
                  auVar124 = local_a40._0_16_;
                }
                else {
                  auVar88 = vsqrtss_avx(auVar85,auVar85);
                  fVar315 = auVar88._0_4_;
                }
                auVar332 = ZEXT3264(local_a20);
                auVar346 = ZEXT3264(local_b00);
                auVar94 = vpermilps_avx(local_980._0_16_,0xff);
                auVar125 = vshufps_avx(auVar263,auVar263,0xff);
                fVar314 = fVar314 * fVar312 - auVar125._0_4_;
                auVar206._0_8_ = auVar124._0_8_ ^ 0x8000000080000000;
                auVar206._8_4_ = auVar124._8_4_ ^ 0x80000000;
                auVar206._12_4_ = auVar124._12_4_ ^ 0x80000000;
                auVar231._0_4_ = -fVar314;
                auVar231._4_4_ = 0x80000000;
                auVar231._8_4_ = 0x80000000;
                auVar231._12_4_ = 0x80000000;
                auVar88 = vinsertps_avx(auVar231,ZEXT416((uint)(fVar313 * fVar312)),0x1c);
                auVar85 = vmovsldup_avx(ZEXT416((uint)(local_ae0._0_4_ * fVar313 * fVar312 -
                                                      auVar124._0_4_ * fVar314)));
                auVar88 = vdivps_avx(auVar88,auVar85);
                auVar157 = vinsertps_avx(local_ae0._0_16_,auVar206,0x10);
                auVar157 = vdivps_avx(auVar157,auVar85);
                auVar85 = vmovsldup_avx(local_ac0._0_16_);
                auVar94 = ZEXT416((uint)(fVar315 - auVar94._0_4_));
                auVar124 = vmovsldup_avx(auVar94);
                auVar160._0_4_ = auVar85._0_4_ * auVar88._0_4_ + auVar124._0_4_ * auVar157._0_4_;
                auVar160._4_4_ = auVar85._4_4_ * auVar88._4_4_ + auVar124._4_4_ * auVar157._4_4_;
                auVar160._8_4_ = auVar85._8_4_ * auVar88._8_4_ + auVar124._8_4_ * auVar157._8_4_;
                auVar160._12_4_ =
                     auVar85._12_4_ * auVar88._12_4_ + auVar124._12_4_ * auVar157._12_4_;
                auVar88 = vsubps_avx(auVar261,auVar160);
                auVar387 = ZEXT1664(auVar88);
                auVar161._8_4_ = 0x7fffffff;
                auVar161._0_8_ = 0x7fffffff7fffffff;
                auVar161._12_4_ = 0x7fffffff;
                auVar261 = vandps_avx(local_ac0._0_16_,auVar161);
                auVar273 = ZEXT3264(local_9a0);
              } while (fVar311 <= auVar261._0_4_);
              auVar189._8_4_ = 0x7fffffff;
              auVar189._0_8_ = 0x7fffffff7fffffff;
              auVar189._12_4_ = 0x7fffffff;
              auVar261 = vandps_avx(auVar94,auVar189);
            } while ((float)local_9e0._0_4_ * 1.9073486e-06 + auVar185._0_4_ + fVar311 <=
                     auVar261._0_4_);
            fVar311 = auVar88._0_4_ + (float)local_8f0._0_4_;
            if ((fVar299 <= fVar311) &&
               (fVar312 = *(float *)(ray + k * 4 + 0x80), fVar311 <= fVar312)) {
              auVar261 = vmovshdup_avx(auVar88);
              fVar313 = auVar261._0_4_;
              if ((0.0 <= fVar313) && (fVar313 <= 1.0)) {
                auVar182 = vrsqrtss_avx(auVar182,auVar182);
                fVar314 = auVar182._0_4_;
                pGVar7 = (context->scene->geometries).items[uVar74].ptr;
                if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                  auVar182 = ZEXT416((uint)(fVar314 * 1.5 +
                                           fVar310 * -0.5 * fVar314 * fVar314 * fVar314));
                  auVar182 = vshufps_avx(auVar182,auVar182,0);
                  auVar190._0_4_ = auVar182._0_4_ * (float)local_b20._0_4_;
                  auVar190._4_4_ = auVar182._4_4_ * (float)local_b20._4_4_;
                  auVar190._8_4_ = auVar182._8_4_ * fStack_b18;
                  auVar190._12_4_ = auVar182._12_4_ * fStack_b14;
                  auVar137._0_4_ = auVar263._0_4_ + auVar125._0_4_ * auVar190._0_4_;
                  auVar137._4_4_ = auVar263._4_4_ + auVar125._4_4_ * auVar190._4_4_;
                  auVar137._8_4_ = auVar263._8_4_ + auVar125._8_4_ * auVar190._8_4_;
                  auVar137._12_4_ = auVar263._12_4_ + auVar125._12_4_ * auVar190._12_4_;
                  auVar182 = vshufps_avx(auVar190,auVar190,0xc9);
                  auVar261 = vshufps_avx(auVar263,auVar263,0xc9);
                  auVar191._0_4_ = auVar261._0_4_ * auVar190._0_4_;
                  auVar191._4_4_ = auVar261._4_4_ * auVar190._4_4_;
                  auVar191._8_4_ = auVar261._8_4_ * auVar190._8_4_;
                  auVar191._12_4_ = auVar261._12_4_ * auVar190._12_4_;
                  auVar207._0_4_ = auVar263._0_4_ * auVar182._0_4_;
                  auVar207._4_4_ = auVar263._4_4_ * auVar182._4_4_;
                  auVar207._8_4_ = auVar263._8_4_ * auVar182._8_4_;
                  auVar207._12_4_ = auVar263._12_4_ * auVar182._12_4_;
                  auVar185 = vsubps_avx(auVar207,auVar191);
                  auVar182 = vshufps_avx(auVar185,auVar185,0xc9);
                  auVar261 = vshufps_avx(auVar137,auVar137,0xc9);
                  auVar208._0_4_ = auVar261._0_4_ * auVar182._0_4_;
                  auVar208._4_4_ = auVar261._4_4_ * auVar182._4_4_;
                  auVar208._8_4_ = auVar261._8_4_ * auVar182._8_4_;
                  auVar208._12_4_ = auVar261._12_4_ * auVar182._12_4_;
                  auVar182 = vshufps_avx(auVar185,auVar185,0xd2);
                  auVar138._0_4_ = auVar137._0_4_ * auVar182._0_4_;
                  auVar138._4_4_ = auVar137._4_4_ * auVar182._4_4_;
                  auVar138._8_4_ = auVar137._8_4_ * auVar182._8_4_;
                  auVar138._12_4_ = auVar137._12_4_ * auVar182._12_4_;
                  auVar182 = vsubps_avx(auVar208,auVar138);
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    *(float *)(ray + k * 4 + 0x80) = fVar311;
                    uVar1 = vextractps_avx(auVar182,1);
                    *(undefined4 *)(ray + k * 4 + 0xc0) = uVar1;
                    uVar1 = vextractps_avx(auVar182,2);
                    *(undefined4 *)(ray + k * 4 + 0xd0) = uVar1;
                    *(int *)(ray + k * 4 + 0xe0) = auVar182._0_4_;
                    *(float *)(ray + k * 4 + 0xf0) = fVar313;
                    *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                    *(int *)(ray + k * 4 + 0x110) = (int)local_8c0;
                    *(uint *)(ray + k * 4 + 0x120) = uVar74;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                  }
                  else {
                    local_770 = vshufps_avx(auVar88,auVar88,0x55);
                    auVar261 = vshufps_avx(auVar182,auVar182,0x55);
                    auStack_790 = vshufps_avx(auVar182,auVar182,0xaa);
                    local_780 = vshufps_avx(auVar182,auVar182,0);
                    local_7a0 = (RTCHitN  [16])auVar261;
                    local_760 = ZEXT816(0) << 0x20;
                    local_750 = local_7c0._0_8_;
                    uStack_748 = local_7c0._8_8_;
                    local_740 = local_7b0;
                    vcmpps_avx(ZEXT1632(local_7b0),ZEXT1632(local_7b0),0xf);
                    uStack_72c = context->user->instID[0];
                    local_730 = uStack_72c;
                    uStack_728 = uStack_72c;
                    uStack_724 = uStack_72c;
                    uVar79 = context->user->instPrimID[0];
                    auVar139._4_4_ = uVar79;
                    auVar139._0_4_ = uVar79;
                    auVar139._8_4_ = uVar79;
                    auVar139._12_4_ = uVar79;
                    auStack_720 = auVar139;
                    *(float *)(ray + k * 4 + 0x80) = fVar311;
                    local_8e0 = *local_a88;
                    local_b50.valid = (int *)local_8e0;
                    local_b50.geometryUserPtr = pGVar7->userPtr;
                    local_b50.context = context->user;
                    local_b50.hit = local_7a0;
                    local_b50.N = 4;
                    local_b50.ray = (RTCRayN *)ray;
                    if (pGVar7->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      (*pGVar7->intersectionFilterN)(&local_b50);
                      auVar273._8_56_ = extraout_var_00;
                      auVar273._0_8_ = extraout_XMM1_Qa_00;
                      auVar139 = auVar273._0_16_;
                      auVar273 = ZEXT3264(local_9a0);
                      auVar346 = ZEXT3264(local_b00);
                      auVar332 = ZEXT3264(local_a20);
                    }
                    if (local_8e0 == (undefined1  [16])0x0) {
                      auVar182 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                      auVar261 = vpcmpeqd_avx(auVar139,auVar139);
                      auVar182 = auVar182 ^ auVar261;
                    }
                    else {
                      p_Var8 = context->args->filter;
                      auVar261 = vpcmpeqd_avx(auVar261,auVar261);
                      if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var8)(&local_b50);
                        auVar273 = ZEXT3264(local_9a0);
                        auVar346 = ZEXT3264(local_b00);
                        auVar332 = ZEXT3264(local_a20);
                        auVar261 = vpcmpeqd_avx(auVar261,auVar261);
                      }
                      auVar185 = vpcmpeqd_avx(local_8e0,_DAT_01f45a50);
                      auVar182 = auVar185 ^ auVar261;
                      if (local_8e0 != (undefined1  [16])0x0) {
                        auVar185 = auVar185 ^ auVar261;
                        auVar261 = vmaskmovps_avx(auVar185,*(undefined1 (*) [16])local_b50.hit);
                        *(undefined1 (*) [16])(local_b50.ray + 0xc0) = auVar261;
                        auVar261 = vmaskmovps_avx(auVar185,*(undefined1 (*) [16])
                                                            (local_b50.hit + 0x10));
                        *(undefined1 (*) [16])(local_b50.ray + 0xd0) = auVar261;
                        auVar261 = vmaskmovps_avx(auVar185,*(undefined1 (*) [16])
                                                            (local_b50.hit + 0x20));
                        *(undefined1 (*) [16])(local_b50.ray + 0xe0) = auVar261;
                        auVar261 = vmaskmovps_avx(auVar185,*(undefined1 (*) [16])
                                                            (local_b50.hit + 0x30));
                        *(undefined1 (*) [16])(local_b50.ray + 0xf0) = auVar261;
                        auVar261 = vmaskmovps_avx(auVar185,*(undefined1 (*) [16])
                                                            (local_b50.hit + 0x40));
                        *(undefined1 (*) [16])(local_b50.ray + 0x100) = auVar261;
                        auVar261 = vmaskmovps_avx(auVar185,*(undefined1 (*) [16])
                                                            (local_b50.hit + 0x50));
                        *(undefined1 (*) [16])(local_b50.ray + 0x110) = auVar261;
                        auVar261 = vmaskmovps_avx(auVar185,*(undefined1 (*) [16])
                                                            (local_b50.hit + 0x60));
                        *(undefined1 (*) [16])(local_b50.ray + 0x120) = auVar261;
                        auVar261 = vmaskmovps_avx(auVar185,*(undefined1 (*) [16])
                                                            (local_b50.hit + 0x70));
                        *(undefined1 (*) [16])(local_b50.ray + 0x130) = auVar261;
                        auVar261 = vmaskmovps_avx(auVar185,*(undefined1 (*) [16])
                                                            (local_b50.hit + 0x80));
                        *(undefined1 (*) [16])(local_b50.ray + 0x140) = auVar261;
                      }
                    }
                    auVar95._8_8_ = 0x100000001;
                    auVar95._0_8_ = 0x100000001;
                    if ((auVar95 & auVar182) == (undefined1  [16])0x0) {
                      *(float *)(ray + k * 4 + 0x80) = fVar312;
                    }
                  }
                }
              }
            }
LAB_00a34bd2:
            uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar321._4_4_ = uVar1;
            auVar321._0_4_ = uVar1;
            auVar321._8_4_ = uVar1;
            auVar321._12_4_ = uVar1;
            auVar321._16_4_ = uVar1;
            auVar321._20_4_ = uVar1;
            auVar321._24_4_ = uVar1;
            auVar321._28_4_ = uVar1;
            auVar387 = ZEXT3264(auVar321);
            auVar96 = vcmpps_avx(_local_800,auVar321,2);
            local_860 = vandps_avx(auVar96,local_860);
          }
          auVar96 = vandps_avx(local_660,local_640);
          auVar108 = vandps_avx(local_840,_local_820);
          auVar171._0_4_ = (float)local_8a0._0_4_ + local_4e0._0_4_;
          auVar171._4_4_ = (float)local_8a0._4_4_ + local_4e0._4_4_;
          auVar171._8_4_ = fStack_898 + local_4e0._8_4_;
          auVar171._12_4_ = fStack_894 + local_4e0._12_4_;
          auVar171._16_4_ = fStack_890 + local_4e0._16_4_;
          auVar171._20_4_ = fStack_88c + local_4e0._20_4_;
          auVar171._24_4_ = fStack_888 + local_4e0._24_4_;
          auVar171._28_4_ = fStack_884 + local_4e0._28_4_;
          auVar182 = vshufps_avx(auVar387._0_16_,auVar387._0_16_,0);
          auVar218._16_16_ = auVar182;
          auVar218._0_16_ = auVar182;
          auVar11 = vcmpps_avx(auVar171,auVar218,2);
          auVar96 = vandps_avx(auVar11,auVar96);
          auVar242._0_4_ = (float)local_8a0._0_4_ + local_4a0._0_4_;
          auVar242._4_4_ = (float)local_8a0._4_4_ + local_4a0._4_4_;
          auVar242._8_4_ = fStack_898 + local_4a0._8_4_;
          auVar242._12_4_ = fStack_894 + local_4a0._12_4_;
          auVar242._16_4_ = fStack_890 + local_4a0._16_4_;
          auVar242._20_4_ = fStack_88c + local_4a0._20_4_;
          auVar242._24_4_ = fStack_888 + local_4a0._24_4_;
          auVar242._28_4_ = fStack_884 + local_4a0._28_4_;
          auVar11 = vcmpps_avx(auVar242,auVar218,2);
          auVar108 = vandps_avx(auVar11,auVar108);
          auVar108 = vorps_avx(auVar96,auVar108);
          if ((((((((auVar108 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar108 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar108 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar108 >> 0x7f,0) != '\0') ||
                (auVar108 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar108 >> 0xbf,0) != '\0') ||
              (auVar108 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar108[0x1f] < '\0') {
            *(undefined1 (*) [32])(auStack_180 + uVar80 * 0x60) = auVar108;
            auVar96 = vblendvps_avx(_local_4a0,_local_4e0,auVar96);
            *(undefined1 (*) [32])(auStack_160 + uVar80 * 0x60) = auVar96;
            uVar77 = vmovlps_avx(local_610);
            (&uStack_140)[uVar80 * 0xc] = uVar77;
            auStack_138[uVar80 * 0x18] = local_ca8 + 1;
            uVar80 = (ulong)((int)uVar80 + 1);
          }
          auVar387 = ZEXT3264(local_960);
          fVar310 = (float)local_8a0._0_4_;
          fVar365 = (float)local_8a0._4_4_;
          fVar173 = fStack_898;
          fVar174 = fStack_894;
          fVar175 = fStack_890;
          fVar176 = fStack_88c;
          fVar177 = fStack_888;
          fVar259 = fStack_884;
          goto LAB_00a33644;
        }
      }
      auVar332 = ZEXT3264(local_a20);
      auVar387 = ZEXT3264(local_960);
      auVar346 = ZEXT3264(local_b00);
      auVar273 = ZEXT3264(local_9a0);
    }
LAB_00a33644:
    while( true ) {
      auVar268 = local_5a0;
      uVar79 = (uint)uVar80;
      if (uVar79 == 0) {
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar113._4_4_ = uVar1;
        auVar113._0_4_ = uVar1;
        auVar113._8_4_ = uVar1;
        auVar113._12_4_ = uVar1;
        auVar113._16_4_ = uVar1;
        auVar113._20_4_ = uVar1;
        auVar113._24_4_ = uVar1;
        auVar113._28_4_ = uVar1;
        auVar96 = vcmpps_avx(local_400,auVar113,2);
        uVar74 = vmovmskps_avx(auVar96);
        uVar74 = (uint)uVar81 & uVar74;
        goto LAB_00a324e5;
      }
      uVar80 = (ulong)(uVar79 - 1);
      lVar76 = uVar80 * 0x60;
      auVar96 = *(undefined1 (*) [32])(auStack_160 + lVar76);
      auVar107._0_4_ = fVar310 + auVar96._0_4_;
      auVar107._4_4_ = fVar365 + auVar96._4_4_;
      auVar107._8_4_ = fVar173 + auVar96._8_4_;
      auVar107._12_4_ = fVar174 + auVar96._12_4_;
      auVar107._16_4_ = fVar175 + auVar96._16_4_;
      auVar107._20_4_ = fVar176 + auVar96._20_4_;
      auVar107._24_4_ = fVar177 + auVar96._24_4_;
      auVar107._28_4_ = fVar259 + auVar96._28_4_;
      uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar198._4_4_ = uVar1;
      auVar198._0_4_ = uVar1;
      auVar198._8_4_ = uVar1;
      auVar198._12_4_ = uVar1;
      auVar198._16_4_ = uVar1;
      auVar198._20_4_ = uVar1;
      auVar198._24_4_ = uVar1;
      auVar198._28_4_ = uVar1;
      auVar11 = vcmpps_avx(auVar107,auVar198,2);
      auVar108 = vandps_avx(auVar11,*(undefined1 (*) [32])(auStack_180 + lVar76));
      _local_7a0 = auVar108;
      auVar11 = *(undefined1 (*) [32])(auStack_180 + lVar76) & auVar11;
      if ((((((((auVar11 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar11 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar11 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar11 >> 0x7f,0) != '\0') ||
            (auVar11 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar11 >> 0xbf,0) != '\0') ||
          (auVar11 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar11[0x1f] < '\0') break;
      uVar80 = (ulong)(uVar79 - 1);
    }
    auVar169._8_4_ = 0x7f800000;
    auVar169._0_8_ = 0x7f8000007f800000;
    auVar169._12_4_ = 0x7f800000;
    auVar169._16_4_ = 0x7f800000;
    auVar169._20_4_ = 0x7f800000;
    auVar169._24_4_ = 0x7f800000;
    auVar169._28_4_ = 0x7f800000;
    auVar96 = vblendvps_avx(auVar169,auVar96,auVar108);
    auVar11 = vshufps_avx(auVar96,auVar96,0xb1);
    auVar11 = vminps_avx(auVar96,auVar11);
    auVar12 = vshufpd_avx(auVar11,auVar11,5);
    auVar11 = vminps_avx(auVar11,auVar12);
    auVar12 = vperm2f128_avx(auVar11,auVar11,1);
    auVar11 = vminps_avx(auVar11,auVar12);
    auVar96 = vcmpps_avx(auVar96,auVar11,0);
    auVar11 = auVar108 & auVar96;
    if ((((((((auVar11 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar11 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar11 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar11 >> 0x7f,0) != '\0') ||
          (auVar11 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar11 >> 0xbf,0) != '\0') ||
        (auVar11 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar11[0x1f] < '\0')
    {
      auVar108 = vandps_avx(auVar96,auVar108);
    }
    auVar127._8_8_ = 0;
    auVar127._0_8_ = (&uStack_140)[uVar80 * 0xc];
    local_ca8 = auStack_138[uVar80 * 0x18];
    uVar78 = vmovmskps_avx(auVar108);
    uVar75 = 0;
    if (uVar78 != 0) {
      for (; (uVar78 >> uVar75 & 1) == 0; uVar75 = uVar75 + 1) {
      }
    }
    *(undefined4 *)(local_7a0 + (ulong)uVar75 * 4) = 0;
    *(undefined1 (*) [32])(auStack_180 + lVar76) = _local_7a0;
    uVar78 = uVar79 - 1;
    if ((((((((_local_7a0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (_local_7a0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (_local_7a0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(_local_7a0 >> 0x7f,0) != '\0') ||
          (_local_7a0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(_local_7a0 >> 0xbf,0) != '\0') ||
        (_local_7a0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_7a0[0x1f] < '\0') {
      uVar78 = uVar79;
    }
    auVar182 = vshufps_avx(auVar127,auVar127,0);
    auVar261 = vshufps_avx(auVar127,auVar127,0x55);
    auVar261 = vsubps_avx(auVar261,auVar182);
    local_4e0._4_4_ = auVar182._4_4_ + auVar261._4_4_ * 0.14285715;
    local_4e0._0_4_ = auVar182._0_4_ + auVar261._0_4_ * 0.0;
    fStack_4d8 = auVar182._8_4_ + auVar261._8_4_ * 0.2857143;
    fStack_4d4 = auVar182._12_4_ + auVar261._12_4_ * 0.42857146;
    fStack_4d0 = auVar182._0_4_ + auVar261._0_4_ * 0.5714286;
    fStack_4cc = auVar182._4_4_ + auVar261._4_4_ * 0.71428573;
    fStack_4c8 = auVar182._8_4_ + auVar261._8_4_ * 0.8571429;
    fStack_4c4 = auVar182._12_4_ + auVar261._12_4_;
    local_610._8_8_ = 0;
    local_610._0_8_ = *(ulong *)(local_4e0 + (ulong)uVar75 * 4);
    uVar80 = (ulong)uVar78;
    auVar345 = auVar346._0_32_;
  } while( true );
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }